

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::unShift(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this)

{
  uint *puVar1;
  uint uVar2;
  SPxOut *pSVar3;
  pointer pnVar4;
  pointer pnVar5;
  char cVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  ulong uVar16;
  fpclass_type fVar17;
  undefined8 *puVar18;
  Status **ppSVar19;
  int32_t iVar20;
  long lVar21;
  cpp_dec_float<100U,_int,_void> *pcVar22;
  long lVar23;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  Verbosity old_verbosity;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps;
  cpp_dec_float<100U,_int,_void> local_1e8;
  cpp_dec_float<100U,_int,_void> *local_190;
  cpp_dec_float<100U,_int,_void> local_188;
  cpp_dec_float<100U,_int,_void> local_138;
  cpp_dec_float<100U,_int,_void> local_e8;
  Status **local_90;
  Status **local_88;
  cpp_dec_float<100U,_int,_void> local_80;
  
  pSVar3 = this->spxout;
  if ((pSVar3 != (SPxOut *)0x0) &&
     (local_138.data._M_elems[0] = pSVar3->m_verbosity, 4 < (int)local_138.data._M_elems[0])) {
    local_188.data._M_elems[0] = 5;
    (*pSVar3->_vptr_SPxOut[2])();
    pSVar3 = this->spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar3->m_streams[pSVar3->m_verbosity],"DSHIFT07 = ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar3->m_streams[pSVar3->m_verbosity],"unshifting ...",0xe);
    cVar6 = (char)pSVar3->m_streams[pSVar3->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar3->m_streams[pSVar3->m_verbosity] + -0x18) +
                    cVar6);
    std::ostream::put(cVar6);
    std::ostream::flush();
    (*this->spxout->_vptr_SPxOut[2])();
  }
  if (this->initialized == true) {
    local_138.fpclass = cpp_dec_float_finite;
    local_138.prec_elem = 0x10;
    local_138.data._M_elems[0] = 0;
    local_138.data._M_elems[1] = 0;
    local_138.data._M_elems[2] = 0;
    local_138.data._M_elems[3] = 0;
    local_138.data._M_elems[4] = 0;
    local_138.data._M_elems[5] = 0;
    local_138.data._M_elems[6] = 0;
    local_138.data._M_elems[7] = 0;
    local_138.data._M_elems[8] = 0;
    local_138.data._M_elems[9] = 0;
    local_138.data._M_elems[10] = 0;
    local_138.data._M_elems[0xb] = 0;
    local_138.data._M_elems[0xc] = 0;
    local_138.data._M_elems[0xd] = 0;
    local_138.data._M_elems._56_5_ = 0;
    local_138.data._M_elems[0xf]._1_3_ = 0;
    local_138.exp = 0;
    local_138.neg = false;
    local_188.fpclass = cpp_dec_float_finite;
    local_188.prec_elem = 0x10;
    local_188.data._M_elems[0] = 0;
    local_188.data._M_elems[1] = 0;
    local_188.data._M_elems[2] = 0;
    local_188.data._M_elems[3] = 0;
    local_188.data._M_elems[4] = 0;
    local_188.data._M_elems[5] = 0;
    local_188.data._M_elems[6] = 0;
    local_188.data._M_elems[7] = 0;
    local_188.data._M_elems[8] = 0;
    local_188.data._M_elems[9] = 0;
    local_188.data._M_elems[10] = 0;
    local_188.data._M_elems[0xb] = 0;
    local_188.data._M_elems[0xc] = 0;
    local_188.data._M_elems[0xd] = 0;
    local_188.data._M_elems._56_5_ = 0;
    local_188.data._M_elems[0xf]._1_3_ = 0;
    local_188.exp = 0;
    local_188.neg = false;
    local_190 = &(this->theShift).m_backend;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(local_190,0);
    if (this->theType == ENTER) {
      entertol((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_80,this);
      uVar2 = (this->thecovectors->set).thenum;
      uVar16 = (ulong)uVar2;
      if (this->theRep == COLUMN) {
        if (0 < (int)uVar2) {
          lVar23 = uVar16 + 1;
          lVar21 = uVar16 * 0x50;
          do {
            local_e8.data._M_elems._0_8_ =
                 (this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).theBaseId.data[lVar23 + -2].super_DataKey;
            iVar15 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::number(&this->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ,(SPxId *)&local_e8);
            if ((int)local_e8.data._M_elems[0] < 0) {
              pnVar4 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .left.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_138.data._M_elems[0] = pnVar4[iVar15].m_backend.data._M_elems[0];
              puVar1 = pnVar4[iVar15].m_backend.data._M_elems + 0xc;
              uVar7 = *(undefined8 *)(puVar1 + 2);
              local_1e8.data._M_elems[0xc] = (uint)((ulong)*(undefined8 *)puVar1 >> 0x20);
              puVar1 = pnVar4[iVar15].m_backend.data._M_elems + 9;
              uVar8 = *(undefined8 *)puVar1;
              uVar9 = *(undefined8 *)(puVar1 + 2);
              local_1e8.data._M_elems[0xb] = (uint)((ulong)uVar9 >> 0x20);
              local_138.data._M_elems[0xc] = local_1e8.data._M_elems[0xb];
              puVar1 = pnVar4[iVar15].m_backend.data._M_elems + 5;
              uVar10 = *(undefined8 *)puVar1;
              uVar11 = *(undefined8 *)(puVar1 + 2);
              puVar1 = pnVar4[iVar15].m_backend.data._M_elems + 1;
              uVar12 = *(undefined8 *)puVar1;
              uVar13 = *(undefined8 *)(puVar1 + 2);
              local_138.exp = pnVar4[iVar15].m_backend.exp;
              local_138.fpclass = pnVar4[iVar15].m_backend.fpclass;
              local_138.prec_elem = pnVar4[iVar15].m_backend.prec_elem;
              local_138.neg =
                   (bool)((local_138.data._M_elems[0] != 0 ||
                          local_138.fpclass != cpp_dec_float_finite) ^ pnVar4[iVar15].m_backend.neg)
              ;
              local_138.data._M_elems[0xd] = local_1e8.data._M_elems[0xc];
              local_138.data._M_elems._56_5_ = SUB85(uVar7,0);
              local_138.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
              local_138.data._M_elems[9] = (uint)uVar8;
              local_138.data._M_elems[10] = (uint)((ulong)uVar8 >> 0x20);
              local_138.data._M_elems[0xb] = (uint)uVar9;
              local_138.data._M_elems[5] = (uint)uVar10;
              local_138.data._M_elems[6] = (uint)((ulong)uVar10 >> 0x20);
              local_138.data._M_elems[7] = (uint)uVar11;
              local_138.data._M_elems[8] = (uint)((ulong)uVar11 >> 0x20);
              local_138.data._M_elems[1] = (uint)uVar12;
              local_138.data._M_elems[2] = (uint)((ulong)uVar12 >> 0x20);
              local_138.data._M_elems[3] = (uint)uVar13;
              local_138.data._M_elems[4] = (uint)((ulong)uVar13 >> 0x20);
              pnVar4 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .right.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_188.data._M_elems[0] = pnVar4[iVar15].m_backend.data._M_elems[0];
              puVar1 = pnVar4[iVar15].m_backend.data._M_elems + 0xc;
              uVar7 = *(undefined8 *)(puVar1 + 2);
              local_1e8.data._M_elems[0xc] = (uint)((ulong)*(undefined8 *)puVar1 >> 0x20);
              local_1e8.data._M_elems[0xd] = (uint)uVar7;
              local_1e8.data._M_elems[0xe] = (uint)((ulong)uVar7 >> 0x20);
              puVar1 = pnVar4[iVar15].m_backend.data._M_elems + 9;
              uVar8 = *(undefined8 *)puVar1;
              uVar9 = *(undefined8 *)(puVar1 + 2);
              local_1e8.data._M_elems[8] = (uint)uVar8;
              local_1e8.data._M_elems[9] = (uint)((ulong)uVar8 >> 0x20);
              local_1e8.data._M_elems[10] = (uint)uVar9;
              local_1e8.data._M_elems[0xb] = (uint)((ulong)uVar9 >> 0x20);
              puVar1 = pnVar4[iVar15].m_backend.data._M_elems + 5;
              uVar8 = *(undefined8 *)puVar1;
              uVar9 = *(undefined8 *)(puVar1 + 2);
              local_1e8.data._M_elems[4] = (uint)uVar8;
              local_1e8.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
              local_1e8.data._M_elems[6] = (uint)uVar9;
              local_1e8.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
              puVar1 = pnVar4[iVar15].m_backend.data._M_elems + 1;
              uVar8 = *(undefined8 *)puVar1;
              uVar9 = *(undefined8 *)(puVar1 + 2);
              local_1e8.data._M_elems[0] = (uint)uVar8;
              local_1e8.data._M_elems[1] = (uint)((ulong)uVar8 >> 0x20);
              local_1e8.data._M_elems[2] = (uint)uVar9;
              local_1e8.data._M_elems[3] = (uint)((ulong)uVar9 >> 0x20);
              local_188.exp = pnVar4[iVar15].m_backend.exp;
              local_188.fpclass = pnVar4[iVar15].m_backend.fpclass;
              local_188.prec_elem = pnVar4[iVar15].m_backend.prec_elem;
              local_188.neg =
                   (bool)((local_188.data._M_elems[0] != 0 ||
                          local_188.fpclass != cpp_dec_float_finite) ^ pnVar4[iVar15].m_backend.neg)
              ;
              local_188.data._M_elems[0xd] = local_1e8.data._M_elems[0xc];
              local_188.data._M_elems._56_5_ = SUB85(uVar7,0);
              local_188.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
              local_188.data._M_elems[1] = local_1e8.data._M_elems[0];
              local_188.data._M_elems[2] = local_1e8.data._M_elems[1];
              local_188.data._M_elems[3] = local_1e8.data._M_elems[2];
              local_188.data._M_elems[4] = local_1e8.data._M_elems[3];
              local_188.data._M_elems[5] = local_1e8.data._M_elems[4];
              local_188.data._M_elems[6] = local_1e8.data._M_elems[5];
              local_188.data._M_elems[7] = local_1e8.data._M_elems[6];
              local_188.data._M_elems[8] = local_1e8.data._M_elems[7];
              local_188.data._M_elems[9] = local_1e8.data._M_elems[8];
              local_188.data._M_elems[10] = local_1e8.data._M_elems[9];
              local_188.data._M_elems[0xb] = local_1e8.data._M_elems[10];
              local_188.data._M_elems[0xc] = local_1e8.data._M_elems[0xb];
            }
            else {
              pnVar4 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .up.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar7 = *(undefined8 *)&pnVar4[iVar15].m_backend.data;
              uVar8 = *(undefined8 *)(pnVar4[iVar15].m_backend.data._M_elems + 2);
              puVar1 = pnVar4[iVar15].m_backend.data._M_elems + 4;
              uVar9 = *(undefined8 *)puVar1;
              uVar10 = *(undefined8 *)(puVar1 + 2);
              puVar1 = pnVar4[iVar15].m_backend.data._M_elems + 8;
              uVar11 = *(undefined8 *)puVar1;
              uVar12 = *(undefined8 *)(puVar1 + 2);
              puVar1 = pnVar4[iVar15].m_backend.data._M_elems + 0xc;
              uVar13 = *(undefined8 *)puVar1;
              uVar14 = *(undefined8 *)(puVar1 + 2);
              local_138.data._M_elems[0xc] = (uint)uVar13;
              local_138.data._M_elems[0xd] = (uint)((ulong)uVar13 >> 0x20);
              local_138.data._M_elems._56_5_ = SUB85(uVar14,0);
              local_138.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
              local_138.data._M_elems[8] = (uint)uVar11;
              local_138.data._M_elems[9] = (uint)((ulong)uVar11 >> 0x20);
              local_138.data._M_elems[10] = (uint)uVar12;
              local_138.data._M_elems[0xb] = (uint)((ulong)uVar12 >> 0x20);
              local_138.data._M_elems[4] = (uint)uVar9;
              local_138.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
              local_138.data._M_elems[6] = (uint)uVar10;
              local_138.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
              local_138.data._M_elems[0] = (uint)uVar7;
              local_138.data._M_elems[1] = (uint)((ulong)uVar7 >> 0x20);
              local_138.data._M_elems[2] = (uint)uVar8;
              local_138.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
              local_138.exp = pnVar4[iVar15].m_backend.exp;
              local_138.neg = pnVar4[iVar15].m_backend.neg;
              local_138.fpclass = pnVar4[iVar15].m_backend.fpclass;
              local_138.prec_elem = pnVar4[iVar15].m_backend.prec_elem;
              pnVar4 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .low.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar7 = *(undefined8 *)&pnVar4[iVar15].m_backend.data;
              uVar8 = *(undefined8 *)(pnVar4[iVar15].m_backend.data._M_elems + 2);
              puVar1 = pnVar4[iVar15].m_backend.data._M_elems + 4;
              uVar9 = *(undefined8 *)puVar1;
              uVar10 = *(undefined8 *)(puVar1 + 2);
              puVar1 = pnVar4[iVar15].m_backend.data._M_elems + 8;
              uVar11 = *(undefined8 *)puVar1;
              uVar12 = *(undefined8 *)(puVar1 + 2);
              puVar1 = pnVar4[iVar15].m_backend.data._M_elems + 0xc;
              uVar13 = *(undefined8 *)puVar1;
              uVar14 = *(undefined8 *)(puVar1 + 2);
              local_188.data._M_elems[0xc] = (uint)uVar13;
              local_188.data._M_elems[0xd] = (uint)((ulong)uVar13 >> 0x20);
              local_188.data._M_elems._56_5_ = SUB85(uVar14,0);
              local_188.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
              local_188.data._M_elems[8] = (uint)uVar11;
              local_188.data._M_elems[9] = (uint)((ulong)uVar11 >> 0x20);
              local_188.data._M_elems[10] = (uint)uVar12;
              local_188.data._M_elems[0xb] = (uint)((ulong)uVar12 >> 0x20);
              local_188.data._M_elems[4] = (uint)uVar9;
              local_188.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
              local_188.data._M_elems[6] = (uint)uVar10;
              local_188.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
              local_188.data._M_elems[0] = (uint)uVar7;
              local_188.data._M_elems[1] = (uint)((ulong)uVar7 >> 0x20);
              local_188.data._M_elems[2] = (uint)uVar8;
              local_188.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
              local_188.exp = pnVar4[iVar15].m_backend.exp;
              local_188.neg = pnVar4[iVar15].m_backend.neg;
              local_188.fpclass = pnVar4[iVar15].m_backend.fpclass;
              local_188.prec_elem = pnVar4[iVar15].m_backend.prec_elem;
            }
            if (((local_138.fpclass == cpp_dec_float_NaN) ||
                (local_188.fpclass == cpp_dec_float_NaN)) ||
               (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (&local_138,&local_188), iVar15 != 0)) {
              pnVar4 = (this->theFvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_1e8.data._M_elems[0xc] = local_138.data._M_elems[0xc];
              local_1e8.data._M_elems[0xd] = local_138.data._M_elems[0xd];
              local_1e8.data._M_elems[0xe] = local_138.data._M_elems[0xe];
              local_1e8.data._M_elems[0xf] =
                   (uint)(CONCAT35(local_138.data._M_elems[0xf]._1_3_,local_138.data._M_elems._56_5_
                                  ) >> 0x20);
              local_1e8.data._M_elems[8] = local_138.data._M_elems[8];
              local_1e8.data._M_elems[9] = local_138.data._M_elems[9];
              local_1e8.data._M_elems[10] = local_138.data._M_elems[10];
              local_1e8.data._M_elems[0xb] = local_138.data._M_elems[0xb];
              local_1e8.data._M_elems[4] = local_138.data._M_elems[4];
              local_1e8.data._M_elems[5] = local_138.data._M_elems[5];
              local_1e8.data._M_elems[6] = local_138.data._M_elems[6];
              local_1e8.data._M_elems[7] = local_138.data._M_elems[7];
              local_1e8.data._M_elems[0] = local_138.data._M_elems[0];
              local_1e8.data._M_elems[1] = local_138.data._M_elems[1];
              local_1e8.data._M_elems[2] = local_138.data._M_elems[2];
              local_1e8.data._M_elems[3] = local_138.data._M_elems[3];
              local_1e8.exp = local_138.exp;
              local_1e8.neg = local_138.neg;
              local_1e8.fpclass = local_138.fpclass;
              local_1e8.prec_elem = local_138.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (&local_1e8,&local_80);
              if (((*(int *)((long)(&pnVar4[0xffffffffffffffff].m_backend.data + 1) + lVar21 + 8U)
                    == 2) || (local_1e8.fpclass == cpp_dec_float_NaN)) ||
                 (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems +
                                      lVar21),&local_1e8), -1 < iVar15)) {
                pnVar4 = (this->theFvec->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(&pnVar4[0xffffffffffffffff].m_backend.data + 1) + lVar21 + 8U)
                      != 2) && (local_138.fpclass != cpp_dec_float_NaN)) &&
                   (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare((cpp_dec_float<100U,_int,_void> *)
                                     ((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems +
                                     lVar21),&local_138), 0 < iVar15)) {
                  pnVar4 = (this->theUBbound).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21);
                  local_1e8.fpclass = cpp_dec_float_finite;
                  local_1e8.prec_elem = 0x10;
                  local_1e8.data._M_elems[0] = 0;
                  local_1e8.data._M_elems[1] = 0;
                  local_1e8.data._M_elems[2] = 0;
                  local_1e8.data._M_elems[3] = 0;
                  local_1e8.data._M_elems[4] = 0;
                  local_1e8.data._M_elems[5] = 0;
                  local_1e8.data._M_elems[6] = 0;
                  local_1e8.data._M_elems[7] = 0;
                  local_1e8.data._M_elems[8] = 0;
                  local_1e8.data._M_elems[9] = 0;
                  local_1e8.data._M_elems[10] = 0;
                  local_1e8.data._M_elems[0xb] = 0;
                  local_1e8.data._M_elems[0xc] = 0;
                  local_1e8.data._M_elems[0xd] = 0;
                  local_1e8.data._M_elems[0xe] = 0;
                  local_1e8.data._M_elems[0xf] = 0;
                  local_1e8.exp = 0;
                  local_1e8.neg = false;
                  if ((cpp_dec_float<100U,_int,_void> *)puVar18 != &local_1e8) {
                    local_1e8.data._M_elems[0xc] = (uint)puVar18[6];
                    local_1e8.data._M_elems[0xd] = (uint)((ulong)puVar18[6] >> 0x20);
                    local_1e8.data._M_elems[0xe] = (uint)puVar18[7];
                    local_1e8.data._M_elems[0xf] = (uint)((ulong)puVar18[7] >> 0x20);
                    local_1e8.data._M_elems[8] = (uint)puVar18[4];
                    local_1e8.data._M_elems[9] = (uint)((ulong)puVar18[4] >> 0x20);
                    local_1e8.data._M_elems[10] = (uint)puVar18[5];
                    local_1e8.data._M_elems[0xb] = (uint)((ulong)puVar18[5] >> 0x20);
                    local_1e8.data._M_elems[4] = (uint)puVar18[2];
                    local_1e8.data._M_elems[5] = (uint)((ulong)puVar18[2] >> 0x20);
                    local_1e8.data._M_elems[6] = (uint)puVar18[3];
                    local_1e8.data._M_elems[7] = (uint)((ulong)puVar18[3] >> 0x20);
                    local_1e8.data._M_elems[0] = (uint)*puVar18;
                    local_1e8.data._M_elems[1] = (uint)((ulong)*puVar18 >> 0x20);
                    local_1e8.data._M_elems[2] = (uint)puVar18[1];
                    local_1e8.data._M_elems[3] = (uint)((ulong)puVar18[1] >> 0x20);
                    local_1e8.exp = *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21);
                    local_1e8.neg = *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21 + 4U);
                    local_1e8._72_8_ =
                         *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21 + 8U);
                  }
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            (&local_1e8,&local_138);
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                            (local_190,&local_1e8);
                }
              }
              else {
                pnVar4 = (this->theUBbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21 + 0x30);
                *puVar18 = CONCAT44(local_138.data._M_elems[0xd],local_138.data._M_elems[0xc]);
                puVar18[1] = CONCAT35(local_138.data._M_elems[0xf]._1_3_,
                                      local_138.data._M_elems._56_5_);
                puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21 + 0x20);
                *puVar18 = CONCAT44(local_138.data._M_elems[9],local_138.data._M_elems[8]);
                puVar18[1] = CONCAT44(local_138.data._M_elems[0xb],local_138.data._M_elems[10]);
                puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21 + 0x10);
                *puVar18 = CONCAT44(local_138.data._M_elems[5],local_138.data._M_elems[4]);
                puVar18[1] = CONCAT44(local_138.data._M_elems[7],local_138.data._M_elems[6]);
                puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21);
                *puVar18 = CONCAT44(local_138.data._M_elems[1],local_138.data._M_elems[0]);
                puVar18[1] = CONCAT44(local_138.data._M_elems[3],local_138.data._M_elems[2]);
                *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21) = local_138.exp;
                *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21 + 4U) = local_138.neg;
                *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21 + 8U) =
                     local_138._72_8_;
              }
              pnVar4 = (this->theFvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_1e8.data._M_elems[0xc] = local_188.data._M_elems[0xc];
              local_1e8.data._M_elems[0xd] = local_188.data._M_elems[0xd];
              local_1e8.data._M_elems[0xe] = local_188.data._M_elems[0xe];
              local_1e8.data._M_elems[0xf] =
                   (uint)(CONCAT35(local_188.data._M_elems[0xf]._1_3_,local_188.data._M_elems._56_5_
                                  ) >> 0x20);
              local_1e8.data._M_elems[8] = local_188.data._M_elems[8];
              local_1e8.data._M_elems[9] = local_188.data._M_elems[9];
              local_1e8.data._M_elems[10] = local_188.data._M_elems[10];
              local_1e8.data._M_elems[0xb] = local_188.data._M_elems[0xb];
              local_1e8.data._M_elems[4] = local_188.data._M_elems[4];
              local_1e8.data._M_elems[5] = local_188.data._M_elems[5];
              local_1e8.data._M_elems[6] = local_188.data._M_elems[6];
              local_1e8.data._M_elems[7] = local_188.data._M_elems[7];
              local_1e8.data._M_elems[0] = local_188.data._M_elems[0];
              local_1e8.data._M_elems[1] = local_188.data._M_elems[1];
              local_1e8.data._M_elems[2] = local_188.data._M_elems[2];
              local_1e8.data._M_elems[3] = local_188.data._M_elems[3];
              local_1e8.exp = local_188.exp;
              local_1e8.neg = local_188.neg;
              local_1e8.fpclass = local_188.fpclass;
              local_1e8.prec_elem = local_188.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_1e8,&local_80);
              if (((*(int *)((long)(&pnVar4[0xffffffffffffffff].m_backend.data + 1) + lVar21 + 8U)
                    == 2) || (local_1e8.fpclass == cpp_dec_float_NaN)) ||
                 (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems +
                                      lVar21),&local_1e8), iVar15 < 1)) {
                pnVar4 = (this->theFvec->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(&pnVar4[0xffffffffffffffff].m_backend.data + 1) + lVar21 + 8U)
                      != 2) && (local_188.fpclass != cpp_dec_float_NaN)) &&
                   (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare((cpp_dec_float<100U,_int,_void> *)
                                     ((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems +
                                     lVar21),&local_188), iVar15 < 0)) {
                  pnVar4 = (this->theLBbound).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21);
                  local_1e8.fpclass = cpp_dec_float_finite;
                  local_1e8.prec_elem = 0x10;
                  local_1e8.data._M_elems[0] = 0;
                  local_1e8.data._M_elems[1] = 0;
                  local_1e8.data._M_elems[2] = 0;
                  local_1e8.data._M_elems[3] = 0;
                  local_1e8.data._M_elems[4] = 0;
                  local_1e8.data._M_elems[5] = 0;
                  local_1e8.data._M_elems[6] = 0;
                  local_1e8.data._M_elems[7] = 0;
                  local_1e8.data._M_elems[8] = 0;
                  local_1e8.data._M_elems[9] = 0;
                  local_1e8.data._M_elems[10] = 0;
                  local_1e8.data._M_elems[0xb] = 0;
                  local_1e8.data._M_elems[0xc] = 0;
                  local_1e8.data._M_elems[0xd] = 0;
                  local_1e8.data._M_elems[0xe] = 0;
                  local_1e8.data._M_elems[0xf] = 0;
                  local_1e8.exp = 0;
                  local_1e8.neg = false;
                  if ((cpp_dec_float<100U,_int,_void> *)puVar18 != &local_1e8) {
                    local_1e8.data._M_elems[0xc] = (uint)puVar18[6];
                    local_1e8.data._M_elems[0xd] = (uint)((ulong)puVar18[6] >> 0x20);
                    local_1e8.data._M_elems[0xe] = (uint)puVar18[7];
                    local_1e8.data._M_elems[0xf] = (uint)((ulong)puVar18[7] >> 0x20);
                    local_1e8.data._M_elems[8] = (uint)puVar18[4];
                    local_1e8.data._M_elems[9] = (uint)((ulong)puVar18[4] >> 0x20);
                    local_1e8.data._M_elems[10] = (uint)puVar18[5];
                    local_1e8.data._M_elems[0xb] = (uint)((ulong)puVar18[5] >> 0x20);
                    local_1e8.data._M_elems[4] = (uint)puVar18[2];
                    local_1e8.data._M_elems[5] = (uint)((ulong)puVar18[2] >> 0x20);
                    local_1e8.data._M_elems[6] = (uint)puVar18[3];
                    local_1e8.data._M_elems[7] = (uint)((ulong)puVar18[3] >> 0x20);
                    local_1e8.data._M_elems[0] = (uint)*puVar18;
                    local_1e8.data._M_elems[1] = (uint)((ulong)*puVar18 >> 0x20);
                    local_1e8.data._M_elems[2] = (uint)puVar18[1];
                    local_1e8.data._M_elems[3] = (uint)((ulong)puVar18[1] >> 0x20);
                    local_1e8.exp = *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21);
                    local_1e8.neg = *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21 + 4U);
                    local_1e8._72_8_ =
                         *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21 + 8U);
                  }
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            (&local_1e8,&local_188);
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            (local_190,&local_1e8);
                }
              }
              else {
                pnVar4 = (this->theLBbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21 + 0x30);
                *puVar18 = CONCAT44(local_188.data._M_elems[0xd],local_188.data._M_elems[0xc]);
                puVar18[1] = CONCAT35(local_188.data._M_elems[0xf]._1_3_,
                                      local_188.data._M_elems._56_5_);
                puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21 + 0x20);
                *puVar18 = CONCAT44(local_188.data._M_elems[9],local_188.data._M_elems[8]);
                puVar18[1] = CONCAT44(local_188.data._M_elems[0xb],local_188.data._M_elems[10]);
                puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21 + 0x10);
                *puVar18 = CONCAT44(local_188.data._M_elems[5],local_188.data._M_elems[4]);
                puVar18[1] = CONCAT44(local_188.data._M_elems[7],local_188.data._M_elems[6]);
                puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21);
                *puVar18 = CONCAT44(local_188.data._M_elems[1],local_188.data._M_elems[0]);
                puVar18[1] = CONCAT44(local_188.data._M_elems[3],local_188.data._M_elems[2]);
                *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21) = local_188.exp;
                *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21 + 4U) = local_188.neg;
                *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21 + 8U) =
                     local_188._72_8_;
              }
            }
            else {
              pnVar4 = (this->theUBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21 + 8U) == 2) ||
                  (local_138.fpclass == cpp_dec_float_NaN)) ||
                 (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar4[-1].m_backend.data._M_elems + lVar21),&local_138
                                     ), iVar15 < 1)) {
                pnVar4 = (this->theLBbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21 + 8U) == 2) ||
                    (local_188.fpclass == cpp_dec_float_NaN)) ||
                   (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare((cpp_dec_float<100U,_int,_void> *)
                                     ((long)pnVar4[-1].m_backend.data._M_elems + lVar21),&local_188)
                   , -1 < iVar15)) goto LAB_0039933c;
                pcVar22 = (cpp_dec_float<100U,_int,_void> *)
                          ((long)(this->theLBbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar21);
                local_1e8.fpclass = cpp_dec_float_finite;
                local_1e8.prec_elem = 0x10;
                local_1e8.data._M_elems[0] = 0;
                local_1e8.data._M_elems[1] = 0;
                local_1e8.data._M_elems[2] = 0;
                local_1e8.data._M_elems[3] = 0;
                local_1e8.data._M_elems[4] = 0;
                local_1e8.data._M_elems[5] = 0;
                local_1e8.data._M_elems[6] = 0;
                local_1e8.data._M_elems[7] = 0;
                local_1e8.data._M_elems[8] = 0;
                local_1e8.data._M_elems[9] = 0;
                local_1e8.data._M_elems[10] = 0;
                local_1e8.data._M_elems[0xb] = 0;
                local_1e8.data._M_elems[0xc] = 0;
                local_1e8.data._M_elems[0xd] = 0;
                local_1e8.data._M_elems[0xe] = 0;
                local_1e8.data._M_elems[0xf] = 0;
                local_1e8.exp = 0;
                local_1e8.neg = false;
                if (pcVar22 != &local_1e8) {
                  local_1e8.data._M_elems[0xc] = local_188.data._M_elems[0xc];
                  local_1e8.data._M_elems[0xd] = local_188.data._M_elems[0xd];
                  local_1e8.data._M_elems[0xe] = local_188.data._M_elems[0xe];
                  local_1e8.data._M_elems[0xf] =
                       (uint)(CONCAT35(local_188.data._M_elems[0xf]._1_3_,
                                       local_188.data._M_elems._56_5_) >> 0x20);
                  local_1e8.data._M_elems[8] = local_188.data._M_elems[8];
                  local_1e8.data._M_elems[9] = local_188.data._M_elems[9];
                  local_1e8.data._M_elems[10] = local_188.data._M_elems[10];
                  local_1e8.data._M_elems[0xb] = local_188.data._M_elems[0xb];
                  local_1e8.data._M_elems[4] = local_188.data._M_elems[4];
                  local_1e8.data._M_elems[5] = local_188.data._M_elems[5];
                  local_1e8.data._M_elems[6] = local_188.data._M_elems[6];
                  local_1e8.data._M_elems[7] = local_188.data._M_elems[7];
                  local_1e8.data._M_elems[0] = local_188.data._M_elems[0];
                  local_1e8.data._M_elems[1] = local_188.data._M_elems[1];
                  local_1e8.data._M_elems[2] = local_188.data._M_elems[2];
                  local_1e8.data._M_elems[3] = local_188.data._M_elems[3];
                  local_1e8.exp = local_188.exp;
                  local_1e8.neg = local_188.neg;
                  local_1e8.fpclass = local_188.fpclass;
                  local_1e8.prec_elem = local_188.prec_elem;
                  goto LAB_0039932a;
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1e8,&local_188);
                if (local_1e8.data._M_elems[0] != 0 || local_1e8.fpclass != cpp_dec_float_finite) {
                  local_1e8.neg = (bool)(local_1e8.neg ^ 1);
                }
              }
              else {
                pnVar4 = (this->theUBbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21);
                local_1e8.fpclass = cpp_dec_float_finite;
                local_1e8.prec_elem = 0x10;
                local_1e8.data._M_elems[0] = 0;
                local_1e8.data._M_elems[1] = 0;
                local_1e8.data._M_elems[2] = 0;
                local_1e8.data._M_elems[3] = 0;
                local_1e8.data._M_elems[4] = 0;
                local_1e8.data._M_elems[5] = 0;
                local_1e8.data._M_elems[6] = 0;
                local_1e8.data._M_elems[7] = 0;
                local_1e8.data._M_elems[8] = 0;
                local_1e8.data._M_elems[9] = 0;
                local_1e8.data._M_elems[10] = 0;
                local_1e8.data._M_elems[0xb] = 0;
                local_1e8.data._M_elems[0xc] = 0;
                local_1e8.data._M_elems[0xd] = 0;
                local_1e8.data._M_elems[0xe] = 0;
                local_1e8.data._M_elems[0xf] = 0;
                local_1e8.exp = 0;
                local_1e8.neg = false;
                if ((cpp_dec_float<100U,_int,_void> *)puVar18 != &local_1e8) {
                  local_1e8.data._M_elems[0xc] = (uint)puVar18[6];
                  local_1e8.data._M_elems[0xd] = (uint)((ulong)puVar18[6] >> 0x20);
                  local_1e8.data._M_elems[0xe] = (uint)puVar18[7];
                  local_1e8.data._M_elems[0xf] = (uint)((ulong)puVar18[7] >> 0x20);
                  local_1e8.data._M_elems[8] = (uint)puVar18[4];
                  local_1e8.data._M_elems[9] = (uint)((ulong)puVar18[4] >> 0x20);
                  local_1e8.data._M_elems[10] = (uint)puVar18[5];
                  local_1e8.data._M_elems[0xb] = (uint)((ulong)puVar18[5] >> 0x20);
                  local_1e8.data._M_elems[4] = (uint)puVar18[2];
                  local_1e8.data._M_elems[5] = (uint)((ulong)puVar18[2] >> 0x20);
                  local_1e8.data._M_elems[6] = (uint)puVar18[3];
                  local_1e8.data._M_elems[7] = (uint)((ulong)puVar18[3] >> 0x20);
                  local_1e8.data._M_elems[0] = (uint)*puVar18;
                  local_1e8.data._M_elems[1] = (uint)((ulong)*puVar18 >> 0x20);
                  local_1e8.data._M_elems[2] = (uint)puVar18[1];
                  local_1e8.data._M_elems[3] = (uint)((ulong)puVar18[1] >> 0x20);
                  local_1e8.exp = *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21);
                  local_1e8.neg = *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21 + 4U);
                  local_1e8._72_8_ =
                       *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21 + 8U);
                }
                pcVar22 = &local_138;
LAB_0039932a:
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1e8,pcVar22);
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (local_190,&local_1e8);
            }
LAB_0039933c:
            lVar23 = lVar23 + -1;
            lVar21 = lVar21 + -0x50;
          } while (1 < lVar23);
        }
        lVar21 = (long)(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum;
        if (0 < lVar21) {
          lVar23 = lVar21 + 1;
          lVar21 = lVar21 * 0x50;
          do {
            if (this->theRep *
                (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data[lVar23 + -2] < 1) {
              pnVar4 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .left.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_138.data._M_elems[0] =
                   *(uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21);
              puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x20);
              uVar7 = puVar18[1];
              local_1e8.data._M_elems[0xc] = (uint)((ulong)*puVar18 >> 0x20);
              puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x2c);
              uVar8 = *puVar18;
              uVar9 = puVar18[1];
              local_1e8.data._M_elems[0xb] = (uint)((ulong)uVar9 >> 0x20);
              local_138.data._M_elems[0xc] = local_1e8.data._M_elems[0xb];
              puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x3c);
              uVar10 = *puVar18;
              uVar11 = puVar18[1];
              puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x4c);
              uVar12 = *puVar18;
              uVar13 = puVar18[1];
              local_138.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x10);
              local_138._72_8_ =
                   *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -8);
              local_138.neg =
                   (bool)((local_138.data._M_elems[0] != 0 ||
                          local_138.fpclass != cpp_dec_float_finite) ^
                         *(byte *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0xc));
              local_138.data._M_elems[0xd] = local_1e8.data._M_elems[0xc];
              local_138.data._M_elems._56_5_ = SUB85(uVar7,0);
              local_138.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
              local_138.data._M_elems[9] = (uint)uVar8;
              local_138.data._M_elems[10] = (uint)((ulong)uVar8 >> 0x20);
              local_138.data._M_elems[0xb] = (uint)uVar9;
              local_138.data._M_elems[5] = (uint)uVar10;
              local_138.data._M_elems[6] = (uint)((ulong)uVar10 >> 0x20);
              local_138.data._M_elems[7] = (uint)uVar11;
              local_138.data._M_elems[8] = (uint)((ulong)uVar11 >> 0x20);
              local_138.data._M_elems[1] = (uint)uVar12;
              local_138.data._M_elems[2] = (uint)((ulong)uVar12 >> 0x20);
              local_138.data._M_elems[3] = (uint)uVar13;
              local_138.data._M_elems[4] = (uint)((ulong)uVar13 >> 0x20);
              pnVar4 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .right.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_188.data._M_elems[0] =
                   *(uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21);
              puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x20);
              uVar7 = puVar18[1];
              local_1e8.data._M_elems[0xc] = (uint)((ulong)*puVar18 >> 0x20);
              local_1e8.data._M_elems[0xd] = (uint)uVar7;
              local_1e8.data._M_elems[0xe] = (uint)((ulong)uVar7 >> 0x20);
              puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x2c);
              uVar8 = *puVar18;
              uVar9 = puVar18[1];
              local_1e8.data._M_elems[8] = (uint)uVar8;
              local_1e8.data._M_elems[9] = (uint)((ulong)uVar8 >> 0x20);
              local_1e8.data._M_elems[10] = (uint)uVar9;
              local_1e8.data._M_elems[0xb] = (uint)((ulong)uVar9 >> 0x20);
              puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x3c);
              uVar8 = *puVar18;
              uVar9 = puVar18[1];
              local_1e8.data._M_elems[4] = (uint)uVar8;
              local_1e8.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
              local_1e8.data._M_elems[6] = (uint)uVar9;
              local_1e8.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
              puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x4c);
              uVar8 = *puVar18;
              uVar9 = puVar18[1];
              local_1e8.data._M_elems[0] = (uint)uVar8;
              local_1e8.data._M_elems[1] = (uint)((ulong)uVar8 >> 0x20);
              local_1e8.data._M_elems[2] = (uint)uVar9;
              local_1e8.data._M_elems[3] = (uint)((ulong)uVar9 >> 0x20);
              local_188.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x10);
              local_188._72_8_ =
                   *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -8);
              local_188.neg =
                   (bool)((local_188.data._M_elems[0] != 0 ||
                          local_188.fpclass != cpp_dec_float_finite) ^
                         *(byte *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0xc));
              local_188.data._M_elems[0xd] = local_1e8.data._M_elems[0xc];
              local_188.data._M_elems._56_5_ = SUB85(uVar7,0);
              local_188.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
              pnVar4 = (this->theURbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_188.data._M_elems[1] = local_1e8.data._M_elems[0];
              local_188.data._M_elems[2] = local_1e8.data._M_elems[1];
              local_188.data._M_elems[3] = local_1e8.data._M_elems[2];
              local_188.data._M_elems[4] = local_1e8.data._M_elems[3];
              local_188.data._M_elems[5] = local_1e8.data._M_elems[4];
              local_188.data._M_elems[6] = local_1e8.data._M_elems[5];
              local_188.data._M_elems[7] = local_1e8.data._M_elems[6];
              local_188.data._M_elems[8] = local_1e8.data._M_elems[7];
              local_188.data._M_elems[9] = local_1e8.data._M_elems[8];
              local_188.data._M_elems[10] = local_1e8.data._M_elems[9];
              local_188.data._M_elems[0xb] = local_1e8.data._M_elems[10];
              local_188.data._M_elems[0xc] = local_1e8.data._M_elems[0xb];
              if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -8) != 2) &&
                  (local_138.fpclass != cpp_dec_float_NaN)) &&
                 (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar4[-1].m_backend.data._M_elems + lVar21),&local_138
                                     ), 0 < iVar15)) {
                pnVar4 = (this->theURbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21);
                local_1e8.fpclass = cpp_dec_float_finite;
                local_1e8.prec_elem = 0x10;
                local_1e8.data._M_elems[0] = 0;
                local_1e8.data._M_elems[1] = 0;
                local_1e8.data._M_elems[2] = 0;
                local_1e8.data._M_elems[3] = 0;
                local_1e8.data._M_elems[4] = 0;
                local_1e8.data._M_elems[5] = 0;
                local_1e8.data._M_elems[6] = 0;
                local_1e8.data._M_elems[7] = 0;
                local_1e8.data._M_elems[8] = 0;
                local_1e8.data._M_elems[9] = 0;
                local_1e8.data._M_elems[10] = 0;
                local_1e8.data._M_elems[0xb] = 0;
                local_1e8.data._M_elems[0xc] = 0;
                local_1e8.data._M_elems[0xd] = 0;
                local_1e8.data._M_elems[0xe] = 0;
                local_1e8.data._M_elems[0xf] = 0;
                local_1e8.exp = 0;
                local_1e8.neg = false;
                if ((cpp_dec_float<100U,_int,_void> *)puVar18 != &local_1e8) {
                  uVar7 = *puVar18;
                  uVar8 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x48);
                  uVar9 = *(undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar21);
                  uVar10 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x38)
                  ;
                  uVar11 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x30)
                  ;
                  uVar12 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x28)
                  ;
                  uVar13 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x20)
                  ;
                  uVar14 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x18)
                  ;
                  local_1e8.data._M_elems[0xc] = (uint)uVar13;
                  local_1e8.data._M_elems[0xd] = (uint)((ulong)uVar13 >> 0x20);
                  local_1e8.data._M_elems[0xe] = (uint)uVar14;
                  local_1e8.data._M_elems[0xf] = (uint)((ulong)uVar14 >> 0x20);
                  local_1e8.data._M_elems[8] = (uint)uVar11;
                  local_1e8.data._M_elems[9] = (uint)((ulong)uVar11 >> 0x20);
                  local_1e8.data._M_elems[10] = (uint)uVar12;
                  local_1e8.data._M_elems[0xb] = (uint)((ulong)uVar12 >> 0x20);
                  local_1e8.data._M_elems[4] = (uint)uVar9;
                  local_1e8.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
                  local_1e8.data._M_elems[6] = (uint)uVar10;
                  local_1e8.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
                  local_1e8.data._M_elems[0] = (uint)uVar7;
                  local_1e8.data._M_elems[1] = (uint)((ulong)uVar7 >> 0x20);
                  local_1e8.data._M_elems[2] = (uint)uVar8;
                  local_1e8.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
                  local_1e8.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x10)
                  ;
                  local_1e8.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0xc)
                  ;
                  local_1e8._72_8_ =
                       *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -8);
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1e8,&local_138);
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (local_190,&local_1e8);
              }
              if (((local_188.fpclass != cpp_dec_float_NaN) &&
                  (pnVar4 = (this->theLRbound).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                  *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -8) != 2)) &&
                 (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     (&local_188,
                                      (cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar4[-1].m_backend.data._M_elems + lVar21)),
                 0 < iVar15)) {
                pcVar22 = (cpp_dec_float<100U,_int,_void> *)
                          ((long)(this->theLRbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar21);
                local_1e8.fpclass = cpp_dec_float_finite;
                local_1e8.prec_elem = 0x10;
                local_1e8.data._M_elems[0] = 0;
                local_1e8.data._M_elems[1] = 0;
                local_1e8.data._M_elems[2] = 0;
                local_1e8.data._M_elems[3] = 0;
                local_1e8.data._M_elems[4] = 0;
                local_1e8.data._M_elems[5] = 0;
                local_1e8.data._M_elems[6] = 0;
                local_1e8.data._M_elems[7] = 0;
                local_1e8.data._M_elems[8] = 0;
                local_1e8.data._M_elems[9] = 0;
                local_1e8.data._M_elems[10] = 0;
                local_1e8.data._M_elems[0xb] = 0;
                local_1e8.data._M_elems[0xc] = 0;
                local_1e8.data._M_elems[0xd] = 0;
                local_1e8.data._M_elems[0xe] = 0;
                local_1e8.data._M_elems[0xf] = 0;
                local_1e8.exp = 0;
                local_1e8.neg = false;
                if (pcVar22 == &local_1e8) {
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            (&local_1e8,&local_188);
                  if (local_1e8.data._M_elems[0] != 0 || local_1e8.fpclass != cpp_dec_float_finite)
                  {
                    local_1e8.neg = (bool)(local_1e8.neg ^ 1);
                  }
                }
                else {
                  local_1e8.data._M_elems[0xc] = local_188.data._M_elems[0xc];
                  local_1e8.data._M_elems[0xd] = local_188.data._M_elems[0xd];
                  local_1e8.data._M_elems[0xe] = local_188.data._M_elems[0xe];
                  local_1e8.data._M_elems[0xf] =
                       (uint)(CONCAT35(local_188.data._M_elems[0xf]._1_3_,
                                       local_188.data._M_elems._56_5_) >> 0x20);
                  local_1e8.data._M_elems[8] = local_188.data._M_elems[8];
                  local_1e8.data._M_elems[9] = local_188.data._M_elems[9];
                  local_1e8.data._M_elems[10] = local_188.data._M_elems[10];
                  local_1e8.data._M_elems[0xb] = local_188.data._M_elems[0xb];
                  local_1e8.data._M_elems[4] = local_188.data._M_elems[4];
                  local_1e8.data._M_elems[5] = local_188.data._M_elems[5];
                  local_1e8.data._M_elems[6] = local_188.data._M_elems[6];
                  local_1e8.data._M_elems[7] = local_188.data._M_elems[7];
                  local_1e8.data._M_elems[0] = local_188.data._M_elems[0];
                  local_1e8.data._M_elems[1] = local_188.data._M_elems[1];
                  local_1e8.data._M_elems[2] = local_188.data._M_elems[2];
                  local_1e8.data._M_elems[3] = local_188.data._M_elems[3];
                  local_1e8.exp = local_188.exp;
                  local_1e8.neg = local_188.neg;
                  local_1e8.fpclass = local_188.fpclass;
                  local_1e8.prec_elem = local_188.prec_elem;
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            (&local_1e8,pcVar22);
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (local_190,&local_1e8);
              }
            }
            lVar23 = lVar23 + -1;
            lVar21 = lVar21 + -0x50;
          } while (1 < lVar23);
        }
        lVar21 = (long)(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum;
        if (0 < lVar21) {
          lVar23 = lVar21 + 1;
          lVar21 = lVar21 * 0x50;
          do {
            if (this->theRep *
                (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data[lVar23 + -2] < 1) {
              pnVar4 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .up.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21);
              uVar7 = *puVar18;
              uVar8 = puVar18[1];
              puVar18 = (undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar21);
              uVar9 = *puVar18;
              uVar10 = puVar18[1];
              puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x30);
              uVar11 = *puVar18;
              uVar12 = puVar18[1];
              puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x20);
              uVar13 = *puVar18;
              uVar14 = puVar18[1];
              local_138.data._M_elems[0xc] = (uint)uVar13;
              local_138.data._M_elems[0xd] = (uint)((ulong)uVar13 >> 0x20);
              local_138.data._M_elems._56_5_ = SUB85(uVar14,0);
              local_138.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
              local_138.data._M_elems[8] = (uint)uVar11;
              local_138.data._M_elems[9] = (uint)((ulong)uVar11 >> 0x20);
              local_138.data._M_elems[10] = (uint)uVar12;
              local_138.data._M_elems[0xb] = (uint)((ulong)uVar12 >> 0x20);
              local_138.data._M_elems[4] = (uint)uVar9;
              local_138.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
              local_138.data._M_elems[6] = (uint)uVar10;
              local_138.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
              local_138.data._M_elems[0] = (uint)uVar7;
              local_138.data._M_elems[1] = (uint)((ulong)uVar7 >> 0x20);
              local_138.data._M_elems[2] = (uint)uVar8;
              local_138.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
              local_138.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x10);
              local_138.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0xc);
              local_138._72_8_ =
                   *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -8);
              pnVar4 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .low.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21);
              uVar7 = *puVar18;
              uVar8 = puVar18[1];
              puVar18 = (undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar21);
              uVar9 = *puVar18;
              uVar10 = puVar18[1];
              puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x30);
              uVar11 = *puVar18;
              uVar12 = puVar18[1];
              puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x20);
              uVar13 = *puVar18;
              uVar14 = puVar18[1];
              local_188.data._M_elems[0xc] = (uint)uVar13;
              local_188.data._M_elems[0xd] = (uint)((ulong)uVar13 >> 0x20);
              local_188.data._M_elems._56_5_ = SUB85(uVar14,0);
              local_188.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
              local_188.data._M_elems[8] = (uint)uVar11;
              local_188.data._M_elems[9] = (uint)((ulong)uVar11 >> 0x20);
              local_188.data._M_elems[10] = (uint)uVar12;
              local_188.data._M_elems[0xb] = (uint)((ulong)uVar12 >> 0x20);
              local_188.data._M_elems[4] = (uint)uVar9;
              local_188.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
              local_188.data._M_elems[6] = (uint)uVar10;
              local_188.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
              local_188.data._M_elems[0] = (uint)uVar7;
              local_188.data._M_elems[1] = (uint)((ulong)uVar7 >> 0x20);
              local_188.data._M_elems[2] = (uint)uVar8;
              local_188.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
              local_188.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x10);
              local_188.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0xc);
              local_188._72_8_ =
                   *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -8);
              pnVar4 = (this->theUCbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -8) != 2) &&
                  (local_138.fpclass != cpp_dec_float_NaN)) &&
                 (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar4[-1].m_backend.data._M_elems + lVar21),&local_138
                                     ), 0 < iVar15)) {
                pnVar4 = (this->theUCbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21);
                local_1e8.fpclass = cpp_dec_float_finite;
                local_1e8.prec_elem = 0x10;
                local_1e8.data._M_elems[0] = 0;
                local_1e8.data._M_elems[1] = 0;
                local_1e8.data._M_elems[2] = 0;
                local_1e8.data._M_elems[3] = 0;
                local_1e8.data._M_elems[4] = 0;
                local_1e8.data._M_elems[5] = 0;
                local_1e8.data._M_elems[6] = 0;
                local_1e8.data._M_elems[7] = 0;
                local_1e8.data._M_elems[8] = 0;
                local_1e8.data._M_elems[9] = 0;
                local_1e8.data._M_elems[10] = 0;
                local_1e8.data._M_elems[0xb] = 0;
                local_1e8.data._M_elems[0xc] = 0;
                local_1e8.data._M_elems[0xd] = 0;
                local_1e8.data._M_elems[0xe] = 0;
                local_1e8.data._M_elems[0xf] = 0;
                local_1e8.exp = 0;
                local_1e8.neg = false;
                if ((cpp_dec_float<100U,_int,_void> *)puVar18 != &local_1e8) {
                  uVar7 = *puVar18;
                  uVar8 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x48);
                  uVar9 = *(undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar21);
                  uVar10 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x38)
                  ;
                  uVar11 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x30)
                  ;
                  uVar12 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x28)
                  ;
                  uVar13 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x20)
                  ;
                  uVar14 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x18)
                  ;
                  local_1e8.data._M_elems[0xc] = (uint)uVar13;
                  local_1e8.data._M_elems[0xd] = (uint)((ulong)uVar13 >> 0x20);
                  local_1e8.data._M_elems[0xe] = (uint)uVar14;
                  local_1e8.data._M_elems[0xf] = (uint)((ulong)uVar14 >> 0x20);
                  local_1e8.data._M_elems[8] = (uint)uVar11;
                  local_1e8.data._M_elems[9] = (uint)((ulong)uVar11 >> 0x20);
                  local_1e8.data._M_elems[10] = (uint)uVar12;
                  local_1e8.data._M_elems[0xb] = (uint)((ulong)uVar12 >> 0x20);
                  local_1e8.data._M_elems[4] = (uint)uVar9;
                  local_1e8.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
                  local_1e8.data._M_elems[6] = (uint)uVar10;
                  local_1e8.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
                  local_1e8.data._M_elems[0] = (uint)uVar7;
                  local_1e8.data._M_elems[1] = (uint)((ulong)uVar7 >> 0x20);
                  local_1e8.data._M_elems[2] = (uint)uVar8;
                  local_1e8.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
                  local_1e8.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x10)
                  ;
                  local_1e8.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0xc)
                  ;
                  local_1e8._72_8_ =
                       *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -8);
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1e8,&local_138);
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (local_190,&local_1e8);
              }
              if (((local_188.fpclass != cpp_dec_float_NaN) &&
                  (pnVar4 = (this->theLCbound).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                  *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -8) != 2)) &&
                 (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     (&local_188,
                                      (cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar4[-1].m_backend.data._M_elems + lVar21)),
                 0 < iVar15)) {
                pcVar22 = (cpp_dec_float<100U,_int,_void> *)
                          ((long)(this->theLCbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar21);
                local_1e8.fpclass = cpp_dec_float_finite;
                local_1e8.prec_elem = 0x10;
                local_1e8.data._M_elems[0] = 0;
                local_1e8.data._M_elems[1] = 0;
                local_1e8.data._M_elems[2] = 0;
                local_1e8.data._M_elems[3] = 0;
                local_1e8.data._M_elems[4] = 0;
                local_1e8.data._M_elems[5] = 0;
                local_1e8.data._M_elems[6] = 0;
                local_1e8.data._M_elems[7] = 0;
                local_1e8.data._M_elems[8] = 0;
                local_1e8.data._M_elems[9] = 0;
                local_1e8.data._M_elems[10] = 0;
                local_1e8.data._M_elems[0xb] = 0;
                local_1e8.data._M_elems[0xc] = 0;
                local_1e8.data._M_elems[0xd] = 0;
                local_1e8.data._M_elems[0xe] = 0;
                local_1e8.data._M_elems[0xf] = 0;
                local_1e8.exp = 0;
                local_1e8.neg = false;
                if (pcVar22 == &local_1e8) {
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            (&local_1e8,&local_188);
                  if (local_1e8.data._M_elems[0] != 0 || local_1e8.fpclass != cpp_dec_float_finite)
                  {
                    local_1e8.neg = (bool)(local_1e8.neg ^ 1);
                  }
                }
                else {
                  local_1e8.data._M_elems[0xc] = local_188.data._M_elems[0xc];
                  local_1e8.data._M_elems[0xd] = local_188.data._M_elems[0xd];
                  local_1e8.data._M_elems[0xe] = local_188.data._M_elems[0xe];
                  local_1e8.data._M_elems[0xf] =
                       (uint)(CONCAT35(local_188.data._M_elems[0xf]._1_3_,
                                       local_188.data._M_elems._56_5_) >> 0x20);
                  local_1e8.data._M_elems[8] = local_188.data._M_elems[8];
                  local_1e8.data._M_elems[9] = local_188.data._M_elems[9];
                  local_1e8.data._M_elems[10] = local_188.data._M_elems[10];
                  local_1e8.data._M_elems[0xb] = local_188.data._M_elems[0xb];
                  local_1e8.data._M_elems[4] = local_188.data._M_elems[4];
                  local_1e8.data._M_elems[5] = local_188.data._M_elems[5];
                  local_1e8.data._M_elems[6] = local_188.data._M_elems[6];
                  local_1e8.data._M_elems[7] = local_188.data._M_elems[7];
                  local_1e8.data._M_elems[0] = local_188.data._M_elems[0];
                  local_1e8.data._M_elems[1] = local_188.data._M_elems[1];
                  local_1e8.data._M_elems[2] = local_188.data._M_elems[2];
                  local_1e8.data._M_elems[3] = local_188.data._M_elems[3];
                  local_1e8.exp = local_188.exp;
                  local_1e8.neg = local_188.neg;
                  local_1e8.fpclass = local_188.fpclass;
                  local_1e8.prec_elem = local_188.prec_elem;
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            (&local_1e8,pcVar22);
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (local_190,&local_1e8);
              }
            }
            lVar23 = lVar23 + -1;
            lVar21 = lVar21 + -0x50;
          } while (1 < lVar23);
        }
      }
      else {
        if (0 < (int)uVar2) {
          lVar23 = uVar16 + 1;
          local_88 = &(this->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.colstat.data;
          local_90 = &(this->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.rowstat.data;
          lVar21 = uVar16 * 0x50;
          do {
            local_e8.data._M_elems._0_8_ =
                 (this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).theBaseId.data[lVar23 + -2].super_DataKey;
            iVar15 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::number(&this->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ,(SPxId *)&local_e8);
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(&local_188,0)
            ;
            local_138.data._M_elems[0] = local_188.data._M_elems[0];
            local_138.data._M_elems[1] = local_188.data._M_elems[1];
            local_138.data._M_elems[2] = local_188.data._M_elems[2];
            local_138.data._M_elems[3] = local_188.data._M_elems[3];
            local_138.data._M_elems[4] = local_188.data._M_elems[4];
            local_138.data._M_elems[5] = local_188.data._M_elems[5];
            local_138.data._M_elems[6] = local_188.data._M_elems[6];
            local_138.data._M_elems[7] = local_188.data._M_elems[7];
            local_138.data._M_elems[8] = local_188.data._M_elems[8];
            local_138.data._M_elems[9] = local_188.data._M_elems[9];
            local_138.data._M_elems[10] = local_188.data._M_elems[10];
            local_138.data._M_elems[0xb] = local_188.data._M_elems[0xb];
            local_138.data._M_elems[0xc] = local_188.data._M_elems[0xc];
            local_138.data._M_elems[0xd] = local_188.data._M_elems[0xd];
            local_138.data._M_elems._56_5_ = local_188.data._M_elems._56_5_;
            local_138.data._M_elems[0xf]._1_3_ = local_188.data._M_elems[0xf]._1_3_;
            local_138.exp = local_188.exp;
            local_138.neg = local_188.neg;
            local_138.fpclass = local_188.fpclass;
            local_138.prec_elem = local_188.prec_elem;
            ppSVar19 = local_88;
            if ((int)local_e8.data._M_elems[0] < 0) {
              ppSVar19 = local_90;
            }
            clearDualBounds(this,(*ppSVar19)[iVar15],
                            (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_138,
                            (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_188);
            pnVar4 = (this->theUBbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (((*(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21 + 8U) == 2) ||
                (pnVar5 = (this->theLBbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                *(int *)((long)(&pnVar5[-1].m_backend.data + 1) + lVar21 + 8U) == 2)) ||
               (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   ((cpp_dec_float<100U,_int,_void> *)
                                    ((long)pnVar4[-1].m_backend.data._M_elems + lVar21),
                                    (cpp_dec_float<100U,_int,_void> *)
                                    ((long)pnVar5[-1].m_backend.data._M_elems + lVar21)),
               iVar15 != 0)) {
              pnVar4 = (this->theUBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21 + 8U) == 2) ||
                  (local_138.fpclass == cpp_dec_float_NaN)) ||
                 (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar4[-1].m_backend.data._M_elems + lVar21),&local_138
                                     ), iVar15 < 1)) {
                pnVar4 = (this->theUBbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21);
                local_1e8.fpclass = cpp_dec_float_finite;
                local_1e8.prec_elem = 0x10;
                local_1e8.data._M_elems[0] = 0;
                local_1e8.data._M_elems[1] = 0;
                local_1e8.data._M_elems[2] = 0;
                local_1e8.data._M_elems[3] = 0;
                local_1e8.data._M_elems[4] = 0;
                local_1e8.data._M_elems[5] = 0;
                local_1e8.data._M_elems[6] = 0;
                local_1e8.data._M_elems[7] = 0;
                local_1e8.data._M_elems[8] = 0;
                local_1e8.data._M_elems[9] = 0;
                local_1e8.data._M_elems[10] = 0;
                local_1e8.data._M_elems[0xb] = 0;
                local_1e8.data._M_elems[0xc] = 0;
                local_1e8.data._M_elems[0xd] = 0;
                local_1e8.data._M_elems[0xe] = 0;
                local_1e8.data._M_elems[0xf] = 0;
                local_1e8.exp = 0;
                local_1e8.neg = false;
                if ((cpp_dec_float<100U,_int,_void> *)puVar18 != &local_1e8) {
                  local_1e8.data._M_elems[0xc] = (uint)puVar18[6];
                  local_1e8.data._M_elems[0xd] = (uint)((ulong)puVar18[6] >> 0x20);
                  local_1e8.data._M_elems[0xe] = (uint)puVar18[7];
                  local_1e8.data._M_elems[0xf] = (uint)((ulong)puVar18[7] >> 0x20);
                  local_1e8.data._M_elems[8] = (uint)puVar18[4];
                  local_1e8.data._M_elems[9] = (uint)((ulong)puVar18[4] >> 0x20);
                  local_1e8.data._M_elems[10] = (uint)puVar18[5];
                  local_1e8.data._M_elems[0xb] = (uint)((ulong)puVar18[5] >> 0x20);
                  local_1e8.data._M_elems[4] = (uint)puVar18[2];
                  local_1e8.data._M_elems[5] = (uint)((ulong)puVar18[2] >> 0x20);
                  local_1e8.data._M_elems[6] = (uint)puVar18[3];
                  local_1e8.data._M_elems[7] = (uint)((ulong)puVar18[3] >> 0x20);
                  local_1e8.data._M_elems[0] = (uint)*puVar18;
                  local_1e8.data._M_elems[1] = (uint)((ulong)*puVar18 >> 0x20);
                  local_1e8.data._M_elems[2] = (uint)puVar18[1];
                  local_1e8.data._M_elems[3] = (uint)((ulong)puVar18[1] >> 0x20);
                  local_1e8.exp = *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21);
                  local_1e8.neg = *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21 + 4U);
                  local_1e8._72_8_ =
                       *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21 + 8U);
                }
                pcVar22 = &local_138;
LAB_0039ae9f:
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1e8,pcVar22);
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (local_190,&local_1e8);
              }
              else {
                pnVar4 = (this->theUBbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21);
                local_1e8.fpclass = cpp_dec_float_finite;
                local_1e8.prec_elem = 0x10;
                local_1e8.data._M_elems[0] = 0;
                local_1e8.data._M_elems[1] = 0;
                local_1e8.data._M_elems[2] = 0;
                local_1e8.data._M_elems[3] = 0;
                local_1e8.data._M_elems[4] = 0;
                local_1e8.data._M_elems[5] = 0;
                local_1e8.data._M_elems[6] = 0;
                local_1e8.data._M_elems[7] = 0;
                local_1e8.data._M_elems[8] = 0;
                local_1e8.data._M_elems[9] = 0;
                local_1e8.data._M_elems[10] = 0;
                local_1e8.data._M_elems[0xb] = 0;
                local_1e8.data._M_elems[0xc] = 0;
                local_1e8.data._M_elems[0xd] = 0;
                local_1e8.data._M_elems[0xe] = 0;
                local_1e8.data._M_elems[0xf] = 0;
                local_1e8.exp = 0;
                local_1e8.neg = false;
                if ((cpp_dec_float<100U,_int,_void> *)puVar18 != &local_1e8) {
                  local_1e8.data._M_elems[0xc] = (uint)puVar18[6];
                  local_1e8.data._M_elems[0xd] = (uint)((ulong)puVar18[6] >> 0x20);
                  local_1e8.data._M_elems[0xe] = (uint)puVar18[7];
                  local_1e8.data._M_elems[0xf] = (uint)((ulong)puVar18[7] >> 0x20);
                  local_1e8.data._M_elems[8] = (uint)puVar18[4];
                  local_1e8.data._M_elems[9] = (uint)((ulong)puVar18[4] >> 0x20);
                  local_1e8.data._M_elems[10] = (uint)puVar18[5];
                  local_1e8.data._M_elems[0xb] = (uint)((ulong)puVar18[5] >> 0x20);
                  local_1e8.data._M_elems[4] = (uint)puVar18[2];
                  local_1e8.data._M_elems[5] = (uint)((ulong)puVar18[2] >> 0x20);
                  local_1e8.data._M_elems[6] = (uint)puVar18[3];
                  local_1e8.data._M_elems[7] = (uint)((ulong)puVar18[3] >> 0x20);
                  local_1e8.data._M_elems[0] = (uint)*puVar18;
                  local_1e8.data._M_elems[1] = (uint)((ulong)*puVar18 >> 0x20);
                  local_1e8.data._M_elems[2] = (uint)puVar18[1];
                  local_1e8.data._M_elems[3] = (uint)((ulong)puVar18[1] >> 0x20);
                  local_1e8.exp = *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21);
                  local_1e8.neg = *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21 + 4U);
                  local_1e8._72_8_ =
                       *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21 + 8U);
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1e8,&local_138);
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (local_190,&local_1e8);
              }
            }
            else {
              pnVar4 = (this->theFvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_1e8.data._M_elems[0xc] = local_138.data._M_elems[0xc];
              local_1e8.data._M_elems[0xd] = local_138.data._M_elems[0xd];
              local_1e8.data._M_elems[0xe] = local_138.data._M_elems[0xe];
              local_1e8.data._M_elems[0xf] =
                   (uint)(CONCAT35(local_138.data._M_elems[0xf]._1_3_,local_138.data._M_elems._56_5_
                                  ) >> 0x20);
              local_1e8.data._M_elems[8] = local_138.data._M_elems[8];
              local_1e8.data._M_elems[9] = local_138.data._M_elems[9];
              local_1e8.data._M_elems[10] = local_138.data._M_elems[10];
              local_1e8.data._M_elems[0xb] = local_138.data._M_elems[0xb];
              local_1e8.data._M_elems[4] = local_138.data._M_elems[4];
              local_1e8.data._M_elems[5] = local_138.data._M_elems[5];
              local_1e8.data._M_elems[6] = local_138.data._M_elems[6];
              local_1e8.data._M_elems[7] = local_138.data._M_elems[7];
              local_1e8.data._M_elems[0] = local_138.data._M_elems[0];
              local_1e8.data._M_elems[1] = local_138.data._M_elems[1];
              local_1e8.data._M_elems[2] = local_138.data._M_elems[2];
              local_1e8.data._M_elems[3] = local_138.data._M_elems[3];
              local_1e8.exp = local_138.exp;
              local_1e8.neg = local_138.neg;
              local_1e8.fpclass = local_138.fpclass;
              local_1e8.prec_elem = local_138.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_1e8,&local_80);
              if (((*(int *)((long)(&pnVar4[0xffffffffffffffff].m_backend.data + 1) + lVar21 + 8U)
                    == 2) || (local_1e8.fpclass == cpp_dec_float_NaN)) ||
                 (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems +
                                      lVar21),&local_1e8), -1 < iVar15)) {
                pnVar4 = (this->theFvec->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(&pnVar4[0xffffffffffffffff].m_backend.data + 1) + lVar21 + 8U)
                      != 2) && (local_138.fpclass != cpp_dec_float_NaN)) &&
                   (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare((cpp_dec_float<100U,_int,_void> *)
                                     ((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems +
                                     lVar21),&local_138), 0 < iVar15)) {
                  pnVar4 = (this->theUBbound).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21);
                  local_1e8.fpclass = cpp_dec_float_finite;
                  local_1e8.prec_elem = 0x10;
                  local_1e8.data._M_elems[0] = 0;
                  local_1e8.data._M_elems[1] = 0;
                  local_1e8.data._M_elems[2] = 0;
                  local_1e8.data._M_elems[3] = 0;
                  local_1e8.data._M_elems[4] = 0;
                  local_1e8.data._M_elems[5] = 0;
                  local_1e8.data._M_elems[6] = 0;
                  local_1e8.data._M_elems[7] = 0;
                  local_1e8.data._M_elems[8] = 0;
                  local_1e8.data._M_elems[9] = 0;
                  local_1e8.data._M_elems[10] = 0;
                  local_1e8.data._M_elems[0xb] = 0;
                  local_1e8.data._M_elems[0xc] = 0;
                  local_1e8.data._M_elems[0xd] = 0;
                  local_1e8.data._M_elems[0xe] = 0;
                  local_1e8.data._M_elems[0xf] = 0;
                  local_1e8.exp = 0;
                  local_1e8.neg = false;
                  if ((cpp_dec_float<100U,_int,_void> *)puVar18 != &local_1e8) {
                    local_1e8.data._M_elems[0xc] = (uint)puVar18[6];
                    local_1e8.data._M_elems[0xd] = (uint)((ulong)puVar18[6] >> 0x20);
                    local_1e8.data._M_elems[0xe] = (uint)puVar18[7];
                    local_1e8.data._M_elems[0xf] = (uint)((ulong)puVar18[7] >> 0x20);
                    local_1e8.data._M_elems[8] = (uint)puVar18[4];
                    local_1e8.data._M_elems[9] = (uint)((ulong)puVar18[4] >> 0x20);
                    local_1e8.data._M_elems[10] = (uint)puVar18[5];
                    local_1e8.data._M_elems[0xb] = (uint)((ulong)puVar18[5] >> 0x20);
                    local_1e8.data._M_elems[4] = (uint)puVar18[2];
                    local_1e8.data._M_elems[5] = (uint)((ulong)puVar18[2] >> 0x20);
                    local_1e8.data._M_elems[6] = (uint)puVar18[3];
                    local_1e8.data._M_elems[7] = (uint)((ulong)puVar18[3] >> 0x20);
                    local_1e8.data._M_elems[0] = (uint)*puVar18;
                    local_1e8.data._M_elems[1] = (uint)((ulong)*puVar18 >> 0x20);
                    local_1e8.data._M_elems[2] = (uint)puVar18[1];
                    local_1e8.data._M_elems[3] = (uint)((ulong)puVar18[1] >> 0x20);
                    local_1e8.exp = *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21);
                    local_1e8.neg = *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21 + 4U);
                    local_1e8._72_8_ =
                         *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21 + 8U);
                  }
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            (&local_1e8,&local_138);
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                            (local_190,&local_1e8);
                }
              }
              else {
                pnVar4 = (this->theUBbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21 + 0x30);
                *puVar18 = CONCAT44(local_138.data._M_elems[0xd],local_138.data._M_elems[0xc]);
                puVar18[1] = CONCAT35(local_138.data._M_elems[0xf]._1_3_,
                                      local_138.data._M_elems._56_5_);
                puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21 + 0x20);
                *puVar18 = CONCAT44(local_138.data._M_elems[9],local_138.data._M_elems[8]);
                puVar18[1] = CONCAT44(local_138.data._M_elems[0xb],local_138.data._M_elems[10]);
                puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21 + 0x10);
                *puVar18 = CONCAT44(local_138.data._M_elems[5],local_138.data._M_elems[4]);
                puVar18[1] = CONCAT44(local_138.data._M_elems[7],local_138.data._M_elems[6]);
                puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21);
                *puVar18 = CONCAT44(local_138.data._M_elems[1],local_138.data._M_elems[0]);
                puVar18[1] = CONCAT44(local_138.data._M_elems[3],local_138.data._M_elems[2]);
                *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21) = local_138.exp;
                *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21 + 4U) = local_138.neg;
                *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21 + 8U) =
                     local_138._72_8_;
              }
              pnVar4 = (this->theFvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_1e8.data._M_elems[0xc] = local_188.data._M_elems[0xc];
              local_1e8.data._M_elems[0xd] = local_188.data._M_elems[0xd];
              local_1e8.data._M_elems[0xe] = local_188.data._M_elems[0xe];
              local_1e8.data._M_elems[0xf] =
                   (uint)(CONCAT35(local_188.data._M_elems[0xf]._1_3_,local_188.data._M_elems._56_5_
                                  ) >> 0x20);
              local_1e8.data._M_elems[8] = local_188.data._M_elems[8];
              local_1e8.data._M_elems[9] = local_188.data._M_elems[9];
              local_1e8.data._M_elems[10] = local_188.data._M_elems[10];
              local_1e8.data._M_elems[0xb] = local_188.data._M_elems[0xb];
              local_1e8.data._M_elems[4] = local_188.data._M_elems[4];
              local_1e8.data._M_elems[5] = local_188.data._M_elems[5];
              local_1e8.data._M_elems[6] = local_188.data._M_elems[6];
              local_1e8.data._M_elems[7] = local_188.data._M_elems[7];
              local_1e8.data._M_elems[0] = local_188.data._M_elems[0];
              local_1e8.data._M_elems[1] = local_188.data._M_elems[1];
              local_1e8.data._M_elems[2] = local_188.data._M_elems[2];
              local_1e8.data._M_elems[3] = local_188.data._M_elems[3];
              local_1e8.exp = local_188.exp;
              local_1e8.neg = local_188.neg;
              local_1e8.fpclass = local_188.fpclass;
              local_1e8.prec_elem = local_188.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (&local_1e8,&local_80);
              if (((*(int *)((long)(&pnVar4[0xffffffffffffffff].m_backend.data + 1) + lVar21 + 8U)
                    == 2) || (local_1e8.fpclass == cpp_dec_float_NaN)) ||
                 (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems +
                                      lVar21),&local_1e8), iVar15 < 1)) {
                pnVar4 = (this->theFvec->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(&pnVar4[0xffffffffffffffff].m_backend.data + 1) + lVar21 + 8U)
                      != 2) && (local_188.fpclass != cpp_dec_float_NaN)) &&
                   (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare((cpp_dec_float<100U,_int,_void> *)
                                     ((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems +
                                     lVar21),&local_188), iVar15 < 0)) {
                  pnVar4 = (this->theLBbound).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21);
                  local_1e8.fpclass = cpp_dec_float_finite;
                  local_1e8.prec_elem = 0x10;
                  local_1e8.data._M_elems[0] = 0;
                  local_1e8.data._M_elems[1] = 0;
                  local_1e8.data._M_elems[2] = 0;
                  local_1e8.data._M_elems[3] = 0;
                  local_1e8.data._M_elems[4] = 0;
                  local_1e8.data._M_elems[5] = 0;
                  local_1e8.data._M_elems[6] = 0;
                  local_1e8.data._M_elems[7] = 0;
                  local_1e8.data._M_elems[8] = 0;
                  local_1e8.data._M_elems[9] = 0;
                  local_1e8.data._M_elems[10] = 0;
                  local_1e8.data._M_elems[0xb] = 0;
                  local_1e8.data._M_elems[0xc] = 0;
                  local_1e8.data._M_elems[0xd] = 0;
                  local_1e8.data._M_elems[0xe] = 0;
                  local_1e8.data._M_elems[0xf] = 0;
                  local_1e8.exp = 0;
                  local_1e8.neg = false;
                  if ((cpp_dec_float<100U,_int,_void> *)puVar18 != &local_1e8) {
                    local_1e8.data._M_elems[0xc] = (uint)puVar18[6];
                    local_1e8.data._M_elems[0xd] = (uint)((ulong)puVar18[6] >> 0x20);
                    local_1e8.data._M_elems[0xe] = (uint)puVar18[7];
                    local_1e8.data._M_elems[0xf] = (uint)((ulong)puVar18[7] >> 0x20);
                    local_1e8.data._M_elems[8] = (uint)puVar18[4];
                    local_1e8.data._M_elems[9] = (uint)((ulong)puVar18[4] >> 0x20);
                    local_1e8.data._M_elems[10] = (uint)puVar18[5];
                    local_1e8.data._M_elems[0xb] = (uint)((ulong)puVar18[5] >> 0x20);
                    local_1e8.data._M_elems[4] = (uint)puVar18[2];
                    local_1e8.data._M_elems[5] = (uint)((ulong)puVar18[2] >> 0x20);
                    local_1e8.data._M_elems[6] = (uint)puVar18[3];
                    local_1e8.data._M_elems[7] = (uint)((ulong)puVar18[3] >> 0x20);
                    local_1e8.data._M_elems[0] = (uint)*puVar18;
                    local_1e8.data._M_elems[1] = (uint)((ulong)*puVar18 >> 0x20);
                    local_1e8.data._M_elems[2] = (uint)puVar18[1];
                    local_1e8.data._M_elems[3] = (uint)((ulong)puVar18[1] >> 0x20);
                    local_1e8.exp = *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21);
                    local_1e8.neg = *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21 + 4U);
                    local_1e8._72_8_ =
                         *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21 + 8U);
                  }
                  pcVar22 = &local_188;
                  goto LAB_0039ae9f;
                }
              }
              else {
                pnVar4 = (this->theLBbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21 + 0x30);
                *puVar18 = CONCAT44(local_188.data._M_elems[0xd],local_188.data._M_elems[0xc]);
                puVar18[1] = CONCAT35(local_188.data._M_elems[0xf]._1_3_,
                                      local_188.data._M_elems._56_5_);
                puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21 + 0x20);
                *puVar18 = CONCAT44(local_188.data._M_elems[9],local_188.data._M_elems[8]);
                puVar18[1] = CONCAT44(local_188.data._M_elems[0xb],local_188.data._M_elems[10]);
                puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21 + 0x10);
                *puVar18 = CONCAT44(local_188.data._M_elems[5],local_188.data._M_elems[4]);
                puVar18[1] = CONCAT44(local_188.data._M_elems[7],local_188.data._M_elems[6]);
                puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21);
                *puVar18 = CONCAT44(local_188.data._M_elems[1],local_188.data._M_elems[0]);
                puVar18[1] = CONCAT44(local_188.data._M_elems[3],local_188.data._M_elems[2]);
                *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21) = local_188.exp;
                *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21 + 4U) = local_188.neg;
                *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21 + 8U) =
                     local_188._72_8_;
              }
            }
            lVar23 = lVar23 + -1;
            lVar21 = lVar21 + -0x50;
          } while (1 < lVar23);
        }
        lVar21 = (long)(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum;
        if (0 < lVar21) {
          lVar23 = lVar21 + 1;
          lVar21 = lVar21 * 0x50;
          do {
            if (this->theRep *
                (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data[lVar23 + -2] < 1) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                        (&local_188,0);
              local_138.data._M_elems[0] = local_188.data._M_elems[0];
              local_138.data._M_elems[1] = local_188.data._M_elems[1];
              local_138.data._M_elems[2] = local_188.data._M_elems[2];
              local_138.data._M_elems[3] = local_188.data._M_elems[3];
              local_138.data._M_elems[4] = local_188.data._M_elems[4];
              local_138.data._M_elems[5] = local_188.data._M_elems[5];
              local_138.data._M_elems[6] = local_188.data._M_elems[6];
              local_138.data._M_elems[7] = local_188.data._M_elems[7];
              local_138.data._M_elems[8] = local_188.data._M_elems[8];
              local_138.data._M_elems[9] = local_188.data._M_elems[9];
              local_138.data._M_elems[10] = local_188.data._M_elems[10];
              local_138.data._M_elems[0xb] = local_188.data._M_elems[0xb];
              local_138.data._M_elems[0xc] = local_188.data._M_elems[0xc];
              local_138.data._M_elems[0xd] = local_188.data._M_elems[0xd];
              local_138.data._M_elems._56_5_ = local_188.data._M_elems._56_5_;
              local_138.data._M_elems[0xf]._1_3_ = local_188.data._M_elems[0xf]._1_3_;
              local_138.exp = local_188.exp;
              local_138.neg = local_188.neg;
              local_138.fpclass = local_188.fpclass;
              local_138.prec_elem = local_188.prec_elem;
              clearDualBounds(this,(this->
                                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).thedesc.rowstat.data[lVar23 + -2],
                              (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_138,
                              (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_188);
              pnVar4 = (this->theURbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21 + 8U) != 2) &&
                  (local_138.fpclass != cpp_dec_float_NaN)) &&
                 (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar4[-1].m_backend.data._M_elems + lVar21),&local_138
                                     ), 0 < iVar15)) {
                pnVar4 = (this->theURbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21);
                local_1e8.fpclass = cpp_dec_float_finite;
                local_1e8.prec_elem = 0x10;
                local_1e8.data._M_elems[0] = 0;
                local_1e8.data._M_elems[1] = 0;
                local_1e8.data._M_elems[2] = 0;
                local_1e8.data._M_elems[3] = 0;
                local_1e8.data._M_elems[4] = 0;
                local_1e8.data._M_elems[5] = 0;
                local_1e8.data._M_elems[6] = 0;
                local_1e8.data._M_elems[7] = 0;
                local_1e8.data._M_elems[8] = 0;
                local_1e8.data._M_elems[9] = 0;
                local_1e8.data._M_elems[10] = 0;
                local_1e8.data._M_elems[0xb] = 0;
                local_1e8.data._M_elems[0xc] = 0;
                local_1e8.data._M_elems[0xd] = 0;
                local_1e8.data._M_elems[0xe] = 0;
                local_1e8.data._M_elems[0xf] = 0;
                local_1e8.exp = 0;
                local_1e8.neg = false;
                if ((cpp_dec_float<100U,_int,_void> *)puVar18 != &local_1e8) {
                  local_1e8.data._M_elems[0xc] = (uint)puVar18[6];
                  local_1e8.data._M_elems[0xd] = (uint)((ulong)puVar18[6] >> 0x20);
                  local_1e8.data._M_elems[0xe] = (uint)puVar18[7];
                  local_1e8.data._M_elems[0xf] = (uint)((ulong)puVar18[7] >> 0x20);
                  local_1e8.data._M_elems[8] = (uint)puVar18[4];
                  local_1e8.data._M_elems[9] = (uint)((ulong)puVar18[4] >> 0x20);
                  local_1e8.data._M_elems[10] = (uint)puVar18[5];
                  local_1e8.data._M_elems[0xb] = (uint)((ulong)puVar18[5] >> 0x20);
                  local_1e8.data._M_elems[4] = (uint)puVar18[2];
                  local_1e8.data._M_elems[5] = (uint)((ulong)puVar18[2] >> 0x20);
                  local_1e8.data._M_elems[6] = (uint)puVar18[3];
                  local_1e8.data._M_elems[7] = (uint)((ulong)puVar18[3] >> 0x20);
                  local_1e8.data._M_elems[0] = (uint)*puVar18;
                  local_1e8.data._M_elems[1] = (uint)((ulong)*puVar18 >> 0x20);
                  local_1e8.data._M_elems[2] = (uint)puVar18[1];
                  local_1e8.data._M_elems[3] = (uint)((ulong)puVar18[1] >> 0x20);
                  local_1e8.exp = *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21);
                  local_1e8.neg = *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21 + 4U);
                  local_1e8._72_8_ =
                       *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21 + 8U);
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1e8,&local_138);
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (local_190,&local_1e8);
              }
              if (((local_188.fpclass != cpp_dec_float_NaN) &&
                  (pnVar4 = (this->theLRbound).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                  *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21 + 8U) != 2)) &&
                 (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     (&local_188,
                                      (cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar4[-1].m_backend.data._M_elems + lVar21)),
                 0 < iVar15)) {
                pcVar22 = (cpp_dec_float<100U,_int,_void> *)
                          ((long)(this->theLRbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar21);
                local_1e8.fpclass = cpp_dec_float_finite;
                local_1e8.prec_elem = 0x10;
                local_1e8.data._M_elems[0] = 0;
                local_1e8.data._M_elems[1] = 0;
                local_1e8.data._M_elems[2] = 0;
                local_1e8.data._M_elems[3] = 0;
                local_1e8.data._M_elems[4] = 0;
                local_1e8.data._M_elems[5] = 0;
                local_1e8.data._M_elems[6] = 0;
                local_1e8.data._M_elems[7] = 0;
                local_1e8.data._M_elems[8] = 0;
                local_1e8.data._M_elems[9] = 0;
                local_1e8.data._M_elems[10] = 0;
                local_1e8.data._M_elems[0xb] = 0;
                local_1e8.data._M_elems[0xc] = 0;
                local_1e8.data._M_elems[0xd] = 0;
                local_1e8.data._M_elems[0xe] = 0;
                local_1e8.data._M_elems[0xf] = 0;
                local_1e8.exp = 0;
                local_1e8.neg = false;
                if (pcVar22 == &local_1e8) {
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            (&local_1e8,&local_188);
                  if (local_1e8.data._M_elems[0] != 0 || local_1e8.fpclass != cpp_dec_float_finite)
                  {
                    local_1e8.neg = (bool)(local_1e8.neg ^ 1);
                  }
                }
                else {
                  local_1e8.data._M_elems[0xc] = local_188.data._M_elems[0xc];
                  local_1e8.data._M_elems[0xd] = local_188.data._M_elems[0xd];
                  local_1e8.data._M_elems[0xe] = local_188.data._M_elems[0xe];
                  local_1e8.data._M_elems[0xf] =
                       (uint)(CONCAT35(local_188.data._M_elems[0xf]._1_3_,
                                       local_188.data._M_elems._56_5_) >> 0x20);
                  local_1e8.data._M_elems[8] = local_188.data._M_elems[8];
                  local_1e8.data._M_elems[9] = local_188.data._M_elems[9];
                  local_1e8.data._M_elems[10] = local_188.data._M_elems[10];
                  local_1e8.data._M_elems[0xb] = local_188.data._M_elems[0xb];
                  local_1e8.data._M_elems[4] = local_188.data._M_elems[4];
                  local_1e8.data._M_elems[5] = local_188.data._M_elems[5];
                  local_1e8.data._M_elems[6] = local_188.data._M_elems[6];
                  local_1e8.data._M_elems[7] = local_188.data._M_elems[7];
                  local_1e8.data._M_elems[0] = local_188.data._M_elems[0];
                  local_1e8.data._M_elems[1] = local_188.data._M_elems[1];
                  local_1e8.data._M_elems[2] = local_188.data._M_elems[2];
                  local_1e8.data._M_elems[3] = local_188.data._M_elems[3];
                  local_1e8.exp = local_188.exp;
                  local_1e8.neg = local_188.neg;
                  local_1e8.fpclass = local_188.fpclass;
                  local_1e8.prec_elem = local_188.prec_elem;
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            (&local_1e8,pcVar22);
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (local_190,&local_1e8);
              }
            }
            lVar23 = lVar23 + -1;
            lVar21 = lVar21 + -0x50;
          } while (1 < lVar23);
        }
        lVar21 = (long)(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum;
        if (0 < lVar21) {
          lVar23 = lVar21 + 1;
          lVar21 = lVar21 * 0x50;
          do {
            if (this->theRep *
                (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data[lVar23 + -2] < 1) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                        (&local_188,0);
              local_138.data._M_elems[0] = local_188.data._M_elems[0];
              local_138.data._M_elems[1] = local_188.data._M_elems[1];
              local_138.data._M_elems[2] = local_188.data._M_elems[2];
              local_138.data._M_elems[3] = local_188.data._M_elems[3];
              local_138.data._M_elems[4] = local_188.data._M_elems[4];
              local_138.data._M_elems[5] = local_188.data._M_elems[5];
              local_138.data._M_elems[6] = local_188.data._M_elems[6];
              local_138.data._M_elems[7] = local_188.data._M_elems[7];
              local_138.data._M_elems[8] = local_188.data._M_elems[8];
              local_138.data._M_elems[9] = local_188.data._M_elems[9];
              local_138.data._M_elems[10] = local_188.data._M_elems[10];
              local_138.data._M_elems[0xb] = local_188.data._M_elems[0xb];
              local_138.data._M_elems[0xc] = local_188.data._M_elems[0xc];
              local_138.data._M_elems[0xd] = local_188.data._M_elems[0xd];
              local_138.data._M_elems._56_5_ = local_188.data._M_elems._56_5_;
              local_138.data._M_elems[0xf]._1_3_ = local_188.data._M_elems[0xf]._1_3_;
              local_138.exp = local_188.exp;
              local_138.neg = local_188.neg;
              local_138.fpclass = local_188.fpclass;
              local_138.prec_elem = local_188.prec_elem;
              clearDualBounds(this,(this->
                                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).thedesc.colstat.data[lVar23 + -2],
                              (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_138,
                              (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_188);
              pnVar4 = (this->theUCbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21 + 8U) != 2) &&
                  (local_138.fpclass != cpp_dec_float_NaN)) &&
                 (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar4[-1].m_backend.data._M_elems + lVar21),&local_138
                                     ), 0 < iVar15)) {
                pnVar4 = (this->theUCbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21);
                local_1e8.fpclass = cpp_dec_float_finite;
                local_1e8.prec_elem = 0x10;
                local_1e8.data._M_elems[0] = 0;
                local_1e8.data._M_elems[1] = 0;
                local_1e8.data._M_elems[2] = 0;
                local_1e8.data._M_elems[3] = 0;
                local_1e8.data._M_elems[4] = 0;
                local_1e8.data._M_elems[5] = 0;
                local_1e8.data._M_elems[6] = 0;
                local_1e8.data._M_elems[7] = 0;
                local_1e8.data._M_elems[8] = 0;
                local_1e8.data._M_elems[9] = 0;
                local_1e8.data._M_elems[10] = 0;
                local_1e8.data._M_elems[0xb] = 0;
                local_1e8.data._M_elems[0xc] = 0;
                local_1e8.data._M_elems[0xd] = 0;
                local_1e8.data._M_elems[0xe] = 0;
                local_1e8.data._M_elems[0xf] = 0;
                local_1e8.exp = 0;
                local_1e8.neg = false;
                if ((cpp_dec_float<100U,_int,_void> *)puVar18 != &local_1e8) {
                  local_1e8.data._M_elems[0xc] = (uint)puVar18[6];
                  local_1e8.data._M_elems[0xd] = (uint)((ulong)puVar18[6] >> 0x20);
                  local_1e8.data._M_elems[0xe] = (uint)puVar18[7];
                  local_1e8.data._M_elems[0xf] = (uint)((ulong)puVar18[7] >> 0x20);
                  local_1e8.data._M_elems[8] = (uint)puVar18[4];
                  local_1e8.data._M_elems[9] = (uint)((ulong)puVar18[4] >> 0x20);
                  local_1e8.data._M_elems[10] = (uint)puVar18[5];
                  local_1e8.data._M_elems[0xb] = (uint)((ulong)puVar18[5] >> 0x20);
                  local_1e8.data._M_elems[4] = (uint)puVar18[2];
                  local_1e8.data._M_elems[5] = (uint)((ulong)puVar18[2] >> 0x20);
                  local_1e8.data._M_elems[6] = (uint)puVar18[3];
                  local_1e8.data._M_elems[7] = (uint)((ulong)puVar18[3] >> 0x20);
                  local_1e8.data._M_elems[0] = (uint)*puVar18;
                  local_1e8.data._M_elems[1] = (uint)((ulong)*puVar18 >> 0x20);
                  local_1e8.data._M_elems[2] = (uint)puVar18[1];
                  local_1e8.data._M_elems[3] = (uint)((ulong)puVar18[1] >> 0x20);
                  local_1e8.exp = *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21);
                  local_1e8.neg = *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21 + 4U);
                  local_1e8._72_8_ =
                       *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21 + 8U);
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1e8,&local_138);
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (local_190,&local_1e8);
              }
              if (((local_188.fpclass != cpp_dec_float_NaN) &&
                  (pnVar4 = (this->theLCbound).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                  *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar21 + 8U) != 2)) &&
                 (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     (&local_188,
                                      (cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar4[-1].m_backend.data._M_elems + lVar21)),
                 0 < iVar15)) {
                pcVar22 = (cpp_dec_float<100U,_int,_void> *)
                          ((long)(this->theLCbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar21);
                local_1e8.fpclass = cpp_dec_float_finite;
                local_1e8.prec_elem = 0x10;
                local_1e8.data._M_elems[0] = 0;
                local_1e8.data._M_elems[1] = 0;
                local_1e8.data._M_elems[2] = 0;
                local_1e8.data._M_elems[3] = 0;
                local_1e8.data._M_elems[4] = 0;
                local_1e8.data._M_elems[5] = 0;
                local_1e8.data._M_elems[6] = 0;
                local_1e8.data._M_elems[7] = 0;
                local_1e8.data._M_elems[8] = 0;
                local_1e8.data._M_elems[9] = 0;
                local_1e8.data._M_elems[10] = 0;
                local_1e8.data._M_elems[0xb] = 0;
                local_1e8.data._M_elems[0xc] = 0;
                local_1e8.data._M_elems[0xd] = 0;
                local_1e8.data._M_elems[0xe] = 0;
                local_1e8.data._M_elems[0xf] = 0;
                local_1e8.exp = 0;
                local_1e8.neg = false;
                if (pcVar22 == &local_1e8) {
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            (&local_1e8,&local_188);
                  if (local_1e8.data._M_elems[0] != 0 || local_1e8.fpclass != cpp_dec_float_finite)
                  {
                    local_1e8.neg = (bool)(local_1e8.neg ^ 1);
                  }
                }
                else {
                  local_1e8.data._M_elems[0xc] = local_188.data._M_elems[0xc];
                  local_1e8.data._M_elems[0xd] = local_188.data._M_elems[0xd];
                  local_1e8.data._M_elems[0xe] = local_188.data._M_elems[0xe];
                  local_1e8.data._M_elems[0xf] =
                       (uint)(CONCAT35(local_188.data._M_elems[0xf]._1_3_,
                                       local_188.data._M_elems._56_5_) >> 0x20);
                  local_1e8.data._M_elems[8] = local_188.data._M_elems[8];
                  local_1e8.data._M_elems[9] = local_188.data._M_elems[9];
                  local_1e8.data._M_elems[10] = local_188.data._M_elems[10];
                  local_1e8.data._M_elems[0xb] = local_188.data._M_elems[0xb];
                  local_1e8.data._M_elems[4] = local_188.data._M_elems[4];
                  local_1e8.data._M_elems[5] = local_188.data._M_elems[5];
                  local_1e8.data._M_elems[6] = local_188.data._M_elems[6];
                  local_1e8.data._M_elems[7] = local_188.data._M_elems[7];
                  local_1e8.data._M_elems[0] = local_188.data._M_elems[0];
                  local_1e8.data._M_elems[1] = local_188.data._M_elems[1];
                  local_1e8.data._M_elems[2] = local_188.data._M_elems[2];
                  local_1e8.data._M_elems[3] = local_188.data._M_elems[3];
                  local_1e8.exp = local_188.exp;
                  local_1e8.neg = local_188.neg;
                  local_1e8.fpclass = local_188.fpclass;
                  local_1e8.prec_elem = local_188.prec_elem;
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            (&local_1e8,pcVar22);
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (local_190,&local_1e8);
              }
            }
            lVar23 = lVar23 + -1;
            lVar21 = lVar21 + -0x50;
          } while (1 < lVar23);
        }
      }
    }
    else {
      leavetol((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_80,this);
      uVar2 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum;
      uVar16 = (ulong)uVar2;
      if (this->theRep == COLUMN) {
        if (0 < (int)uVar2) {
          lVar21 = uVar16 + 1;
          lVar23 = uVar16 * 0x50;
          do {
            pnVar4 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .object.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar23);
            uVar7 = *puVar18;
            uVar8 = puVar18[1];
            puVar18 = (undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar23);
            uVar9 = *puVar18;
            uVar10 = puVar18[1];
            puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x30);
            uVar11 = *puVar18;
            uVar12 = puVar18[1];
            puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x20);
            uVar13 = *puVar18;
            uVar14 = puVar18[1];
            local_188.data._M_elems[0xc] = (uint)uVar13;
            local_188.data._M_elems[0xd] = (uint)((ulong)uVar13 >> 0x20);
            local_188.data._M_elems._56_5_ = SUB85(uVar14,0);
            local_188.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
            local_188.data._M_elems[8] = (uint)uVar11;
            local_188.data._M_elems[9] = (uint)((ulong)uVar11 >> 0x20);
            local_188.data._M_elems[10] = (uint)uVar12;
            local_188.data._M_elems[0xb] = (uint)((ulong)uVar12 >> 0x20);
            local_188.data._M_elems[4] = (uint)uVar9;
            local_188.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
            local_188.data._M_elems[6] = (uint)uVar10;
            local_188.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
            local_188.data._M_elems[0] = (uint)uVar7;
            local_188.data._M_elems[1] = (uint)((ulong)uVar7 >> 0x20);
            local_188.data._M_elems[2] = (uint)uVar8;
            local_188.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
            local_188.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x10);
            local_188.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0xc);
            local_188.fpclass =
                 *(fpclass_type *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -8);
            local_188.prec_elem =
                 *(int32_t *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -4);
            local_138.prec_elem = local_188.prec_elem;
            local_138.fpclass = local_188.fpclass;
            local_138.data._M_elems[0] = local_188.data._M_elems[0];
            local_138.data._M_elems[1] = local_188.data._M_elems[1];
            local_138.data._M_elems[2] = local_188.data._M_elems[2];
            local_138.data._M_elems[3] = local_188.data._M_elems[3];
            local_138.data._M_elems[4] = local_188.data._M_elems[4];
            local_138.data._M_elems[5] = local_188.data._M_elems[5];
            local_138.data._M_elems[6] = local_188.data._M_elems[6];
            local_138.data._M_elems[7] = local_188.data._M_elems[7];
            local_138.data._M_elems[8] = local_188.data._M_elems[8];
            local_138.data._M_elems[9] = local_188.data._M_elems[9];
            local_138.data._M_elems[10] = local_188.data._M_elems[10];
            local_138.data._M_elems[0xb] = local_188.data._M_elems[0xb];
            local_138.data._M_elems[0xc] = local_188.data._M_elems[0xc];
            local_138.data._M_elems[0xd] = local_188.data._M_elems[0xd];
            local_138.data._M_elems._56_5_ = local_188.data._M_elems._56_5_;
            local_138.data._M_elems[0xf]._1_3_ = local_188.data._M_elems[0xf]._1_3_;
            local_138.exp = local_188.exp;
            local_138.neg = local_188.neg;
            clearDualBounds(this,(this->
                                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).thedesc.rowstat.data[lVar21 + -2],
                            (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_138,
                            (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_188);
            if (this->theRep *
                (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data[lVar21 + -2] < 1) {
              pnVar4 = (this->theCoPvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_1e8.data._M_elems[0xc] = local_138.data._M_elems[0xc];
              local_1e8.data._M_elems[0xd] = local_138.data._M_elems[0xd];
              local_1e8.data._M_elems[0xe] = local_138.data._M_elems[0xe];
              local_1e8.data._M_elems[0xf] =
                   (uint)(CONCAT35(local_138.data._M_elems[0xf]._1_3_,local_138.data._M_elems._56_5_
                                  ) >> 0x20);
              local_1e8.data._M_elems[8] = local_138.data._M_elems[8];
              local_1e8.data._M_elems[9] = local_138.data._M_elems[9];
              local_1e8.data._M_elems[10] = local_138.data._M_elems[10];
              local_1e8.data._M_elems[0xb] = local_138.data._M_elems[0xb];
              local_1e8.data._M_elems[4] = local_138.data._M_elems[4];
              local_1e8.data._M_elems[5] = local_138.data._M_elems[5];
              local_1e8.data._M_elems[6] = local_138.data._M_elems[6];
              local_1e8.data._M_elems[7] = local_138.data._M_elems[7];
              local_1e8.data._M_elems[0] = local_138.data._M_elems[0];
              local_1e8.data._M_elems[1] = local_138.data._M_elems[1];
              local_1e8.data._M_elems[2] = local_138.data._M_elems[2];
              local_1e8.data._M_elems[3] = local_138.data._M_elems[3];
              local_1e8.exp = local_138.exp;
              local_1e8.neg = local_138.neg;
              local_1e8.fpclass = local_138.fpclass;
              local_1e8.prec_elem = local_138.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (&local_1e8,&local_80);
              if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -8) == 2) ||
                  (local_1e8.fpclass == cpp_dec_float_NaN)) ||
                 (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems +
                                      lVar23),&local_1e8), -1 < iVar15)) {
                pnVar4 = (this->theURbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar23);
                local_1e8.fpclass = cpp_dec_float_finite;
                local_1e8.prec_elem = 0x10;
                local_1e8.data._M_elems[0] = 0;
                local_1e8.data._M_elems[1] = 0;
                local_1e8.data._M_elems[2] = 0;
                local_1e8.data._M_elems[3] = 0;
                local_1e8.data._M_elems[4] = 0;
                local_1e8.data._M_elems[5] = 0;
                local_1e8.data._M_elems[6] = 0;
                local_1e8.data._M_elems[7] = 0;
                local_1e8.data._M_elems[8] = 0;
                local_1e8.data._M_elems[9] = 0;
                local_1e8.data._M_elems[10] = 0;
                local_1e8.data._M_elems[0xb] = 0;
                local_1e8.data._M_elems[0xc] = 0;
                local_1e8.data._M_elems[0xd] = 0;
                local_1e8.data._M_elems[0xe] = 0;
                local_1e8.data._M_elems[0xf] = 0;
                local_1e8.exp = 0;
                local_1e8.neg = false;
                if ((cpp_dec_float<100U,_int,_void> *)puVar18 != &local_1e8) {
                  uVar7 = *puVar18;
                  uVar8 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x48);
                  uVar9 = *(undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar23);
                  uVar10 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x38)
                  ;
                  uVar11 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x30)
                  ;
                  uVar12 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x28)
                  ;
                  uVar13 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x20)
                  ;
                  uVar14 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x18)
                  ;
                  local_1e8.data._M_elems[0xc] = (uint)uVar13;
                  local_1e8.data._M_elems[0xd] = (uint)((ulong)uVar13 >> 0x20);
                  local_1e8.data._M_elems[0xe] = (uint)uVar14;
                  local_1e8.data._M_elems[0xf] = (uint)((ulong)uVar14 >> 0x20);
                  local_1e8.data._M_elems[8] = (uint)uVar11;
                  local_1e8.data._M_elems[9] = (uint)((ulong)uVar11 >> 0x20);
                  local_1e8.data._M_elems[10] = (uint)uVar12;
                  local_1e8.data._M_elems[0xb] = (uint)((ulong)uVar12 >> 0x20);
                  local_1e8.data._M_elems[4] = (uint)uVar9;
                  local_1e8.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
                  local_1e8.data._M_elems[6] = (uint)uVar10;
                  local_1e8.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
                  local_1e8.data._M_elems[0] = (uint)uVar7;
                  local_1e8.data._M_elems[1] = (uint)((ulong)uVar7 >> 0x20);
                  local_1e8.data._M_elems[2] = (uint)uVar8;
                  local_1e8.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
                  local_1e8.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x10)
                  ;
                  local_1e8.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0xc)
                  ;
                  local_1e8._72_8_ =
                       *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -8);
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1e8,&local_138);
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (local_190,&local_1e8);
              }
              else {
                pnVar4 = (this->theURbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x20);
                *puVar18 = CONCAT44(local_138.data._M_elems[0xd],local_138.data._M_elems[0xc]);
                puVar18[1] = CONCAT35(local_138.data._M_elems[0xf]._1_3_,
                                      local_138.data._M_elems._56_5_);
                puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x30);
                *puVar18 = CONCAT44(local_138.data._M_elems[9],local_138.data._M_elems[8]);
                puVar18[1] = CONCAT44(local_138.data._M_elems[0xb],local_138.data._M_elems[10]);
                puVar18 = (undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar23);
                *puVar18 = CONCAT44(local_138.data._M_elems[5],local_138.data._M_elems[4]);
                puVar18[1] = CONCAT44(local_138.data._M_elems[7],local_138.data._M_elems[6]);
                puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar23);
                *puVar18 = CONCAT44(local_138.data._M_elems[1],local_138.data._M_elems[0]);
                puVar18[1] = CONCAT44(local_138.data._M_elems[3],local_138.data._M_elems[2]);
                *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x10) = local_138.exp;
                *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0xc) = local_138.neg;
                *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -8) =
                     local_138._72_8_;
                if (((local_138.fpclass != cpp_dec_float_NaN) &&
                    (local_188.fpclass != cpp_dec_float_NaN)) &&
                   (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare(&local_138,&local_188), iVar15 == 0)) {
                  pnVar4 = (this->theLRbound).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x20)
                  ;
                  *puVar18 = CONCAT44(local_188.data._M_elems[0xd],local_188.data._M_elems[0xc]);
                  puVar18[1] = CONCAT35(local_188.data._M_elems[0xf]._1_3_,
                                        local_188.data._M_elems._56_5_);
                  puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x30)
                  ;
                  *puVar18 = CONCAT44(local_188.data._M_elems[9],local_188.data._M_elems[8]);
                  puVar18[1] = CONCAT44(local_188.data._M_elems[0xb],local_188.data._M_elems[10]);
                  puVar18 = (undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar23);
                  *puVar18 = CONCAT44(local_188.data._M_elems[5],local_188.data._M_elems[4]);
                  puVar18[1] = CONCAT44(local_188.data._M_elems[7],local_188.data._M_elems[6]);
                  puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar23);
                  *puVar18 = CONCAT44(local_188.data._M_elems[1],local_188.data._M_elems[0]);
                  puVar18[1] = CONCAT44(local_188.data._M_elems[3],local_188.data._M_elems[2]);
                  *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x10) = local_188.exp
                  ;
                  *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0xc) = local_188.neg
                  ;
                  *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -8) =
                       local_188._72_8_;
                }
              }
              pnVar4 = (this->theCoPvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_1e8.data._M_elems[0xc] = local_188.data._M_elems[0xc];
              local_1e8.data._M_elems[0xd] = local_188.data._M_elems[0xd];
              local_1e8.data._M_elems[0xe] = local_188.data._M_elems[0xe];
              local_1e8.data._M_elems[0xf] =
                   (uint)(CONCAT35(local_188.data._M_elems[0xf]._1_3_,local_188.data._M_elems._56_5_
                                  ) >> 0x20);
              local_1e8.data._M_elems[8] = local_188.data._M_elems[8];
              local_1e8.data._M_elems[9] = local_188.data._M_elems[9];
              local_1e8.data._M_elems[10] = local_188.data._M_elems[10];
              local_1e8.data._M_elems[0xb] = local_188.data._M_elems[0xb];
              local_1e8.data._M_elems[4] = local_188.data._M_elems[4];
              local_1e8.data._M_elems[5] = local_188.data._M_elems[5];
              local_1e8.data._M_elems[6] = local_188.data._M_elems[6];
              local_1e8.data._M_elems[7] = local_188.data._M_elems[7];
              local_1e8.data._M_elems[0] = local_188.data._M_elems[0];
              local_1e8.data._M_elems[1] = local_188.data._M_elems[1];
              local_1e8.data._M_elems[2] = local_188.data._M_elems[2];
              local_1e8.data._M_elems[3] = local_188.data._M_elems[3];
              local_1e8.exp = local_188.exp;
              local_1e8.neg = local_188.neg;
              local_1e8.fpclass = local_188.fpclass;
              local_1e8.prec_elem = local_188.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_1e8,&local_80);
              if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -8) == 2) ||
                  (local_1e8.fpclass == cpp_dec_float_NaN)) ||
                 (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems +
                                      lVar23),&local_1e8), iVar15 < 1)) {
                pcVar22 = (cpp_dec_float<100U,_int,_void> *)
                          ((long)(this->theLRbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar23);
                if (pcVar22 == &local_1e8) goto LAB_0039867f;
LAB_003989eb:
                local_1e8.data._M_elems[0xc] = local_188.data._M_elems[0xc];
                local_1e8.data._M_elems[0xd] = local_188.data._M_elems[0xd];
                local_1e8.data._M_elems[0xe] = local_188.data._M_elems[0xe];
                local_1e8.data._M_elems[0xf] =
                     (uint)(CONCAT35(local_188.data._M_elems[0xf]._1_3_,
                                     local_188.data._M_elems._56_5_) >> 0x20);
                local_1e8.data._M_elems[8] = local_188.data._M_elems[8];
                local_1e8.data._M_elems[9] = local_188.data._M_elems[9];
                local_1e8.data._M_elems[10] = local_188.data._M_elems[10];
                local_1e8.data._M_elems[0xb] = local_188.data._M_elems[0xb];
                local_1e8.data._M_elems[4] = local_188.data._M_elems[4];
                local_1e8.data._M_elems[5] = local_188.data._M_elems[5];
                local_1e8.data._M_elems[6] = local_188.data._M_elems[6];
                local_1e8.data._M_elems[7] = local_188.data._M_elems[7];
                local_1e8.data._M_elems[0] = local_188.data._M_elems[0];
                local_1e8.data._M_elems[1] = local_188.data._M_elems[1];
                local_1e8.data._M_elems[2] = local_188.data._M_elems[2];
                local_1e8.data._M_elems[3] = local_188.data._M_elems[3];
                local_1e8.exp = local_188.exp;
                local_1e8.neg = local_188.neg;
                local_1e8.fpclass = local_188.fpclass;
                local_1e8.prec_elem = local_188.prec_elem;
                goto LAB_00398a3e;
              }
              pnVar4 = (this->theLRbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x20);
              *puVar18 = CONCAT44(local_188.data._M_elems[0xd],local_188.data._M_elems[0xc]);
              puVar18[1] = CONCAT35(local_188.data._M_elems[0xf]._1_3_,
                                    local_188.data._M_elems._56_5_);
              puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x30);
              *puVar18 = CONCAT44(local_188.data._M_elems[9],local_188.data._M_elems[8]);
              puVar18[1] = CONCAT44(local_188.data._M_elems[0xb],local_188.data._M_elems[10]);
              puVar18 = (undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar23);
              *puVar18 = CONCAT44(local_188.data._M_elems[5],local_188.data._M_elems[4]);
              puVar18[1] = CONCAT44(local_188.data._M_elems[7],local_188.data._M_elems[6]);
              puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar23);
              *puVar18 = CONCAT44(local_188.data._M_elems[1],local_188.data._M_elems[0]);
              puVar18[1] = CONCAT44(local_188.data._M_elems[3],local_188.data._M_elems[2]);
              *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x10) = local_188.exp;
              *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0xc) = local_188.neg;
              *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -8) =
                   local_188._72_8_;
              if (((local_138.fpclass != cpp_dec_float_NaN) &&
                  (local_188.fpclass != cpp_dec_float_NaN)) &&
                 (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     (&local_138,&local_188), iVar15 == 0)) {
                pnVar4 = (this->theURbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x20);
                *puVar18 = CONCAT44(local_138.data._M_elems[0xd],local_138.data._M_elems[0xc]);
                puVar18[1] = CONCAT35(local_138.data._M_elems[0xf]._1_3_,
                                      local_138.data._M_elems._56_5_);
                puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x30);
                *puVar18 = CONCAT44(local_138.data._M_elems[9],local_138.data._M_elems[8]);
                puVar18[1] = CONCAT44(local_138.data._M_elems[0xb],local_138.data._M_elems[10]);
                puVar18 = (undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar23);
                *puVar18 = CONCAT44(local_138.data._M_elems[5],local_138.data._M_elems[4]);
                puVar18[1] = CONCAT44(local_138.data._M_elems[7],local_138.data._M_elems[6]);
                puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar23);
                *puVar18 = CONCAT44(local_138.data._M_elems[1],local_138.data._M_elems[0]);
                puVar18[1] = CONCAT44(local_138.data._M_elems[3],local_138.data._M_elems[2]);
                *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x10) = local_138.exp;
                *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0xc) = local_138.neg;
                *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -8) =
                     local_138._72_8_;
              }
            }
            else {
              pnVar4 = (this->theURbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -8) == 2) ||
                  (local_138.fpclass == cpp_dec_float_NaN)) ||
                 (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar4[-1].m_backend.data._M_elems + lVar23),&local_138
                                     ), iVar15 < 1)) {
                pnVar4 = (this->theLRbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -8) == 2) ||
                    (local_188.fpclass == cpp_dec_float_NaN)) ||
                   (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare((cpp_dec_float<100U,_int,_void> *)
                                     ((long)pnVar4[-1].m_backend.data._M_elems + lVar23),&local_188)
                   , -1 < iVar15)) goto LAB_00398a50;
                pcVar22 = (cpp_dec_float<100U,_int,_void> *)
                          ((long)(this->theLRbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar23);
                if (pcVar22 != &local_1e8) goto LAB_003989eb;
LAB_0039867f:
                local_1e8.neg = false;
                local_1e8.exp = 0;
                local_1e8.data._M_elems[0xe] = 0;
                local_1e8.data._M_elems[0xd] = 0;
                local_1e8.data._M_elems[0xc] = 0;
                local_1e8.data._M_elems[0xb] = 0;
                local_1e8.data._M_elems[10] = 0;
                local_1e8.data._M_elems[9] = 0;
                local_1e8.data._M_elems[8] = 0;
                local_1e8.data._M_elems[7] = 0;
                local_1e8.data._M_elems[6] = 0;
                local_1e8.data._M_elems[5] = 0;
                local_1e8.data._M_elems[4] = 0;
                local_1e8.data._M_elems[3] = 0;
                local_1e8.data._M_elems[2] = 0;
                local_1e8.data._M_elems[1] = 0;
                local_1e8.data._M_elems[0] = 0;
                local_1e8.data._M_elems[0xf] = 0;
                local_1e8.fpclass = cpp_dec_float_finite;
                local_1e8.prec_elem = 0x10;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1e8,&local_188);
                if (local_1e8.data._M_elems[0] != 0 || local_1e8.fpclass != cpp_dec_float_finite) {
                  local_1e8.neg = (bool)(local_1e8.neg ^ 1);
                }
              }
              else {
                pnVar4 = (this->theURbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar23);
                local_1e8.fpclass = cpp_dec_float_finite;
                local_1e8.prec_elem = 0x10;
                local_1e8.data._M_elems[0] = 0;
                local_1e8.data._M_elems[1] = 0;
                local_1e8.data._M_elems[2] = 0;
                local_1e8.data._M_elems[3] = 0;
                local_1e8.data._M_elems[4] = 0;
                local_1e8.data._M_elems[5] = 0;
                local_1e8.data._M_elems[6] = 0;
                local_1e8.data._M_elems[7] = 0;
                local_1e8.data._M_elems[8] = 0;
                local_1e8.data._M_elems[9] = 0;
                local_1e8.data._M_elems[10] = 0;
                local_1e8.data._M_elems[0xb] = 0;
                local_1e8.data._M_elems[0xc] = 0;
                local_1e8.data._M_elems[0xd] = 0;
                local_1e8.data._M_elems[0xe] = 0;
                local_1e8.data._M_elems[0xf] = 0;
                local_1e8.exp = 0;
                local_1e8.neg = false;
                pcVar22 = &local_138;
                if ((cpp_dec_float<100U,_int,_void> *)puVar18 != &local_1e8) {
                  uVar7 = *puVar18;
                  uVar8 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x48);
                  uVar9 = *(undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar23);
                  uVar10 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x38)
                  ;
                  uVar11 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x30)
                  ;
                  uVar12 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x28)
                  ;
                  uVar13 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x20)
                  ;
                  uVar14 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x18)
                  ;
                  local_1e8.data._M_elems[0xc] = (uint)uVar13;
                  local_1e8.data._M_elems[0xd] = (uint)((ulong)uVar13 >> 0x20);
                  local_1e8.data._M_elems[0xe] = (uint)uVar14;
                  local_1e8.data._M_elems[0xf] = (uint)((ulong)uVar14 >> 0x20);
                  local_1e8.data._M_elems[8] = (uint)uVar11;
                  local_1e8.data._M_elems[9] = (uint)((ulong)uVar11 >> 0x20);
                  local_1e8.data._M_elems[10] = (uint)uVar12;
                  local_1e8.data._M_elems[0xb] = (uint)((ulong)uVar12 >> 0x20);
                  local_1e8.data._M_elems[4] = (uint)uVar9;
                  local_1e8.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
                  local_1e8.data._M_elems[6] = (uint)uVar10;
                  local_1e8.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
                  local_1e8.data._M_elems[0] = (uint)uVar7;
                  local_1e8.data._M_elems[1] = (uint)((ulong)uVar7 >> 0x20);
                  local_1e8.data._M_elems[2] = (uint)uVar8;
                  local_1e8.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
                  local_1e8.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x10)
                  ;
                  local_1e8.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0xc)
                  ;
                  local_1e8._72_8_ =
                       *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -8);
                }
LAB_00398a3e:
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1e8,pcVar22);
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (local_190,&local_1e8);
            }
LAB_00398a50:
            lVar21 = lVar21 + -1;
            lVar23 = lVar23 + -0x50;
          } while (1 < lVar21);
        }
        lVar21 = (long)(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum;
        if (0 < lVar21) {
          lVar23 = lVar21 + 1;
          lVar21 = lVar21 * 0x50;
          do {
            pnVar4 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .object.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_188.data._M_elems[0] =
                 *(uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21);
            puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x20);
            uVar7 = puVar18[1];
            local_1e8.data._M_elems[0xc] = (uint)((ulong)*puVar18 >> 0x20);
            local_1e8.data._M_elems[0xd] = (uint)uVar7;
            local_1e8.data._M_elems[0xe] = (uint)((ulong)uVar7 >> 0x20);
            puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x2c);
            uVar8 = *puVar18;
            uVar9 = puVar18[1];
            local_1e8.data._M_elems[8] = (uint)uVar8;
            local_1e8.data._M_elems[9] = (uint)((ulong)uVar8 >> 0x20);
            local_1e8.data._M_elems[10] = (uint)uVar9;
            local_1e8.data._M_elems[0xb] = (uint)((ulong)uVar9 >> 0x20);
            puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x3c);
            uVar8 = *puVar18;
            uVar9 = puVar18[1];
            local_1e8.data._M_elems[4] = (uint)uVar8;
            local_1e8.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
            local_1e8.data._M_elems[6] = (uint)uVar9;
            local_1e8.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
            puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x4c);
            uVar8 = *puVar18;
            uVar9 = puVar18[1];
            local_1e8.data._M_elems[0] = (uint)uVar8;
            local_1e8.data._M_elems[1] = (uint)((ulong)uVar8 >> 0x20);
            local_1e8.data._M_elems[2] = (uint)uVar9;
            local_1e8.data._M_elems[3] = (uint)((ulong)uVar9 >> 0x20);
            local_188.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x10);
            local_188.fpclass =
                 *(fpclass_type *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -8);
            local_188.prec_elem =
                 *(int32_t *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -4);
            local_188.neg =
                 (bool)((local_188.data._M_elems[0] != 0 ||
                        local_188.fpclass != cpp_dec_float_finite) ^
                       *(byte *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0xc));
            local_188.data._M_elems[0xd] = local_1e8.data._M_elems[0xc];
            local_188.data._M_elems._56_5_ = SUB85(uVar7,0);
            local_188.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
            local_138.data._M_elems[3] = local_1e8.data._M_elems[2];
            local_138.data._M_elems[4] = local_1e8.data._M_elems[3];
            local_138.data._M_elems[5] = local_1e8.data._M_elems[4];
            local_138.data._M_elems[6] = local_1e8.data._M_elems[5];
            local_138.data._M_elems[7] = local_1e8.data._M_elems[6];
            local_138.data._M_elems[8] = local_1e8.data._M_elems[7];
            local_138.data._M_elems[9] = local_1e8.data._M_elems[8];
            local_138.data._M_elems[10] = local_1e8.data._M_elems[9];
            local_138.data._M_elems[0xb] = local_1e8.data._M_elems[10];
            local_138.data._M_elems[0xc] = local_1e8.data._M_elems[0xb];
            local_138.data._M_elems[0xd] = local_1e8.data._M_elems[0xc];
            local_138.prec_elem = local_188.prec_elem;
            local_138.fpclass = local_188.fpclass;
            local_188.data._M_elems[1] = local_1e8.data._M_elems[0];
            local_188.data._M_elems[2] = local_1e8.data._M_elems[1];
            local_188.data._M_elems[3] = local_1e8.data._M_elems[2];
            local_188.data._M_elems[4] = local_1e8.data._M_elems[3];
            local_188.data._M_elems[5] = local_1e8.data._M_elems[4];
            local_188.data._M_elems[6] = local_1e8.data._M_elems[5];
            local_188.data._M_elems[7] = local_1e8.data._M_elems[6];
            local_188.data._M_elems[8] = local_1e8.data._M_elems[7];
            local_188.data._M_elems[9] = local_1e8.data._M_elems[8];
            local_188.data._M_elems[10] = local_1e8.data._M_elems[9];
            local_188.data._M_elems[0xb] = local_1e8.data._M_elems[10];
            local_188.data._M_elems[0xc] = local_1e8.data._M_elems[0xb];
            local_138.data._M_elems[0] = local_188.data._M_elems[0];
            local_138.data._M_elems[1] = local_1e8.data._M_elems[0];
            local_138.data._M_elems[2] = local_1e8.data._M_elems[1];
            local_138.data._M_elems._56_5_ = local_188.data._M_elems._56_5_;
            local_138.data._M_elems[0xf]._1_3_ = local_188.data._M_elems[0xf]._1_3_;
            local_138.exp = local_188.exp;
            local_138.neg = local_188.neg;
            clearDualBounds(this,(this->
                                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).thedesc.colstat.data[lVar23 + -2],
                            (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_188,
                            (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_138);
            local_1e8.data._M_elems[0xe] = local_138.data._M_elems[0xe];
            fVar17 = local_138.fpclass;
            if (this->theRep *
                (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data[lVar23 + -2] < 1) {
              pnVar4 = (this->thePvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_1e8.data._M_elems[0] = local_138.data._M_elems[0];
              local_1e8.data._M_elems[0xd] = local_138.data._M_elems[0xd];
              local_1e8.data._M_elems[0xf] =
                   (uint)(CONCAT35(local_138.data._M_elems[0xf]._1_3_,local_138.data._M_elems._56_5_
                                  ) >> 0x20);
              local_1e8.data._M_elems[9] = local_138.data._M_elems[9];
              local_1e8.data._M_elems[10] = local_138.data._M_elems[10];
              local_1e8.data._M_elems[0xb] = local_138.data._M_elems[0xb];
              local_1e8.data._M_elems[0xc] = local_138.data._M_elems[0xc];
              local_1e8.data._M_elems[5] = local_138.data._M_elems[5];
              local_1e8.data._M_elems[6] = local_138.data._M_elems[6];
              local_1e8.data._M_elems[7] = local_138.data._M_elems[7];
              local_1e8.data._M_elems[8] = local_138.data._M_elems[8];
              local_1e8.data._M_elems[1] = local_138.data._M_elems[1];
              local_1e8.data._M_elems[2] = local_138.data._M_elems[2];
              local_1e8.data._M_elems[3] = local_138.data._M_elems[3];
              local_1e8.data._M_elems[4] = local_138.data._M_elems[4];
              local_1e8.exp = local_138.exp;
              local_1e8.neg =
                   (bool)((local_138.data._M_elems[0] != 0 || fVar17 != cpp_dec_float_finite) ^
                         local_138.neg);
              local_1e8.fpclass = local_138.fpclass;
              local_1e8.prec_elem = local_138.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (&local_1e8,&local_80);
              if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -8) == 2) ||
                  (local_1e8.fpclass == cpp_dec_float_NaN)) ||
                 (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems +
                                      lVar21),&local_1e8), -1 < iVar15)) {
                pnVar4 = (this->theUCbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                local_e8.data._M_elems[1] = local_138.data._M_elems[1];
                local_e8.data._M_elems[0] = local_138.data._M_elems[0];
                local_e8.data._M_elems[3] = local_138.data._M_elems[3];
                local_e8.data._M_elems[2] = local_138.data._M_elems[2];
                local_e8.data._M_elems[5] = local_138.data._M_elems[5];
                local_e8.data._M_elems[4] = local_138.data._M_elems[4];
                local_e8.data._M_elems[7] = local_138.data._M_elems[7];
                local_e8.data._M_elems[6] = local_138.data._M_elems[6];
                local_e8.data._M_elems[9] = local_138.data._M_elems[9];
                local_e8.data._M_elems[8] = local_138.data._M_elems[8];
                local_e8.data._M_elems[0xb] = local_138.data._M_elems[0xb];
                local_e8.data._M_elems[10] = local_138.data._M_elems[10];
                local_e8.data._M_elems[0xd] = local_138.data._M_elems[0xd];
                local_e8.data._M_elems[0xc] = local_138.data._M_elems[0xc];
                local_e8.data._M_elems[0xf]._1_3_ = local_138.data._M_elems[0xf]._1_3_;
                local_e8.data._M_elems._56_5_ = local_138.data._M_elems._56_5_;
                local_e8.exp = local_138.exp;
                local_e8.neg = local_138.neg;
                local_e8.fpclass = local_138.fpclass;
                local_e8.prec_elem = local_138.prec_elem;
                if (local_138.fpclass != cpp_dec_float_finite || local_138.data._M_elems[0] != 0) {
                  local_e8.neg = (bool)(local_138.neg ^ 1);
                }
                puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21);
                local_1e8.fpclass = cpp_dec_float_finite;
                local_1e8.prec_elem = 0x10;
                local_1e8.data._M_elems[0] = 0;
                local_1e8.data._M_elems[1] = 0;
                local_1e8.data._M_elems[2] = 0;
                local_1e8.data._M_elems[3] = 0;
                local_1e8.data._M_elems[4] = 0;
                local_1e8.data._M_elems[5] = 0;
                local_1e8.data._M_elems[6] = 0;
                local_1e8.data._M_elems[7] = 0;
                local_1e8.data._M_elems[8] = 0;
                local_1e8.data._M_elems[9] = 0;
                local_1e8.data._M_elems[10] = 0;
                local_1e8.data._M_elems[0xb] = 0;
                local_1e8.data._M_elems[0xc] = 0;
                local_1e8.data._M_elems[0xd] = 0;
                local_1e8.data._M_elems[0xe] = 0;
                local_1e8.data._M_elems[0xf] = 0;
                local_1e8.exp = 0;
                local_1e8.neg = false;
                if ((cpp_dec_float<100U,_int,_void> *)puVar18 != &local_1e8) {
                  uVar7 = *puVar18;
                  uVar8 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x48);
                  uVar9 = *(undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar21);
                  uVar10 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x38)
                  ;
                  uVar11 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x30)
                  ;
                  uVar12 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x28)
                  ;
                  uVar13 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x20)
                  ;
                  uVar14 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x18)
                  ;
                  local_1e8.data._M_elems[0xc] = (uint)uVar13;
                  local_1e8.data._M_elems[0xd] = (uint)((ulong)uVar13 >> 0x20);
                  local_1e8.data._M_elems[0xe] = (uint)uVar14;
                  local_1e8.data._M_elems[0xf] = (uint)((ulong)uVar14 >> 0x20);
                  local_1e8.data._M_elems[8] = (uint)uVar11;
                  local_1e8.data._M_elems[9] = (uint)((ulong)uVar11 >> 0x20);
                  local_1e8.data._M_elems[10] = (uint)uVar12;
                  local_1e8.data._M_elems[0xb] = (uint)((ulong)uVar12 >> 0x20);
                  local_1e8.data._M_elems[4] = (uint)uVar9;
                  local_1e8.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
                  local_1e8.data._M_elems[6] = (uint)uVar10;
                  local_1e8.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
                  local_1e8.data._M_elems[0] = (uint)uVar7;
                  local_1e8.data._M_elems[1] = (uint)((ulong)uVar7 >> 0x20);
                  local_1e8.data._M_elems[2] = (uint)uVar8;
                  local_1e8.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
                  local_1e8.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x10)
                  ;
                  local_1e8.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0xc)
                  ;
                  local_1e8._72_8_ =
                       *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -8);
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1e8,&local_e8);
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (local_190,&local_1e8);
              }
              else {
                local_1e8.data._M_elems[0] = local_138.data._M_elems[1];
                local_1e8.data._M_elems[1] = local_138.data._M_elems[2];
                local_1e8.data._M_elems[2] = local_138.data._M_elems[3];
                local_1e8.data._M_elems[3] = local_138.data._M_elems[4];
                local_1e8.data._M_elems[4] = local_138.data._M_elems[5];
                local_1e8.data._M_elems[5] = local_138.data._M_elems[6];
                local_1e8.data._M_elems[6] = local_138.data._M_elems[7];
                local_1e8.data._M_elems[7] = local_138.data._M_elems[8];
                local_1e8.data._M_elems[8] = local_138.data._M_elems[9];
                local_1e8.data._M_elems[9] = local_138.data._M_elems[10];
                local_1e8.data._M_elems[10] = local_138.data._M_elems[0xb];
                local_1e8.data._M_elems[0xb] = local_138.data._M_elems[0xc];
                local_1e8.data._M_elems[0xc] = local_138.data._M_elems[0xd];
                local_1e8.data._M_elems[0xd] = local_138.data._M_elems[0xe];
                local_1e8.data._M_elems[0xe] =
                     (uint)(CONCAT35(local_138.data._M_elems[0xf]._1_3_,
                                     local_138.data._M_elems._56_5_) >> 0x20);
                pnVar4 = (this->theUCbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                *(uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21) =
                     local_138.data._M_elems[0];
                puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x4c);
                *puVar18 = CONCAT44(local_138.data._M_elems[2],local_138.data._M_elems[1]);
                puVar18[1] = CONCAT44(local_138.data._M_elems[4],local_138.data._M_elems[3]);
                puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x3c);
                *puVar18 = CONCAT44(local_138.data._M_elems[6],local_138.data._M_elems[5]);
                puVar18[1] = CONCAT44(local_138.data._M_elems[8],local_138.data._M_elems[7]);
                puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x2c);
                *puVar18 = CONCAT44(local_138.data._M_elems[10],local_138.data._M_elems[9]);
                puVar18[1] = CONCAT44(local_138.data._M_elems[0xc],local_138.data._M_elems[0xb]);
                puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x20);
                *puVar18 = CONCAT44(local_138.data._M_elems[0xd],local_138.data._M_elems[0xc]);
                puVar18[1] = CONCAT44(local_1e8.data._M_elems[0xe],local_1e8.data._M_elems[0xd]);
                *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x10) = local_138.exp;
                *(char *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0xc) =
                     (local_138.data._M_elems[0] != 0 || local_138.fpclass != cpp_dec_float_finite)
                     ^ local_138.neg;
                *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -8) =
                     local_138._72_8_;
                if (((local_138.fpclass != cpp_dec_float_NaN) &&
                    (local_188.fpclass != cpp_dec_float_NaN)) &&
                   (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare(&local_138,&local_188), iVar15 == 0)) {
                  local_1e8.data._M_elems[0xd] = local_188.data._M_elems[0xe];
                  local_1e8.data._M_elems[0xe] =
                       (uint)(CONCAT35(local_188.data._M_elems[0xf]._1_3_,
                                       local_188.data._M_elems._56_5_) >> 0x20);
                  pnVar4 = (this->theLCbound).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  *(uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21) =
                       local_188.data._M_elems[0];
                  puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x4c)
                  ;
                  *puVar18 = CONCAT44(local_188.data._M_elems[2],local_188.data._M_elems[1]);
                  puVar18[1] = CONCAT44(local_188.data._M_elems[4],local_188.data._M_elems[3]);
                  puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x3c)
                  ;
                  *puVar18 = CONCAT44(local_188.data._M_elems[6],local_188.data._M_elems[5]);
                  puVar18[1] = CONCAT44(local_188.data._M_elems[8],local_188.data._M_elems[7]);
                  puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x2c)
                  ;
                  *puVar18 = CONCAT44(local_188.data._M_elems[10],local_188.data._M_elems[9]);
                  puVar18[1] = CONCAT44(local_188.data._M_elems[0xc],local_188.data._M_elems[0xb]);
                  puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x20)
                  ;
                  *puVar18 = CONCAT44(local_188.data._M_elems[0xd],local_188.data._M_elems[0xc]);
                  puVar18[1] = CONCAT44(local_1e8.data._M_elems[0xe],local_1e8.data._M_elems[0xd]);
                  *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x10) = local_188.exp
                  ;
                  *(char *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0xc) =
                       (local_188.data._M_elems[0] != 0 || local_188.fpclass != cpp_dec_float_finite
                       ) ^ local_188.neg;
                  *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -8) =
                       local_188._72_8_;
                }
              }
              pnVar4 = (this->thePvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_1e8.data._M_elems[0] = local_188.data._M_elems[0];
              local_1e8.data._M_elems[0xd] = local_188.data._M_elems[0xd];
              local_1e8.data._M_elems[0xe] = local_188.data._M_elems[0xe];
              local_1e8.data._M_elems[0xf] =
                   (uint)(CONCAT35(local_188.data._M_elems[0xf]._1_3_,local_188.data._M_elems._56_5_
                                  ) >> 0x20);
              local_1e8.data._M_elems[9] = local_188.data._M_elems[9];
              local_1e8.data._M_elems[10] = local_188.data._M_elems[10];
              local_1e8.data._M_elems[0xb] = local_188.data._M_elems[0xb];
              local_1e8.data._M_elems[0xc] = local_188.data._M_elems[0xc];
              local_1e8.data._M_elems[5] = local_188.data._M_elems[5];
              local_1e8.data._M_elems[6] = local_188.data._M_elems[6];
              local_1e8.data._M_elems[7] = local_188.data._M_elems[7];
              local_1e8.data._M_elems[8] = local_188.data._M_elems[8];
              local_1e8.data._M_elems[1] = local_188.data._M_elems[1];
              local_1e8.data._M_elems[2] = local_188.data._M_elems[2];
              local_1e8.data._M_elems[3] = local_188.data._M_elems[3];
              local_1e8.data._M_elems[4] = local_188.data._M_elems[4];
              local_1e8.exp = local_188.exp;
              local_1e8.neg =
                   (bool)((local_188.data._M_elems[0] != 0 ||
                          local_188.fpclass != cpp_dec_float_finite) ^ local_188.neg);
              local_1e8.fpclass = local_188.fpclass;
              local_1e8.prec_elem = local_188.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_1e8,&local_80);
              if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -8) == 2) ||
                  (local_1e8.fpclass == cpp_dec_float_NaN)) ||
                 (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems +
                                      lVar21),&local_1e8), iVar15 < 1)) {
                local_e8.data._M_elems[1] = local_188.data._M_elems[1];
                local_e8.data._M_elems[0] = local_188.data._M_elems[0];
                local_e8.data._M_elems[3] = local_188.data._M_elems[3];
                local_e8.data._M_elems[2] = local_188.data._M_elems[2];
                local_e8.data._M_elems[5] = local_188.data._M_elems[5];
                local_e8.data._M_elems[4] = local_188.data._M_elems[4];
                local_e8.data._M_elems[7] = local_188.data._M_elems[7];
                local_e8.data._M_elems[6] = local_188.data._M_elems[6];
                local_e8.data._M_elems[9] = local_188.data._M_elems[9];
                local_e8.data._M_elems[8] = local_188.data._M_elems[8];
                local_e8.data._M_elems[0xb] = local_188.data._M_elems[0xb];
                local_e8.data._M_elems[10] = local_188.data._M_elems[10];
                local_e8.data._M_elems[0xd] = local_188.data._M_elems[0xd];
                local_e8.data._M_elems[0xc] = local_188.data._M_elems[0xc];
                local_e8.data._M_elems[0xf]._1_3_ = local_188.data._M_elems[0xf]._1_3_;
                local_e8.data._M_elems._56_5_ = local_188.data._M_elems._56_5_;
                local_e8.exp = local_188.exp;
                local_e8.neg = local_188.neg;
                fVar17 = local_188.fpclass;
                iVar20 = local_188.prec_elem;
                local_e8.fpclass = local_188.fpclass;
                local_e8.prec_elem = local_188.prec_elem;
                if (local_188.data._M_elems[0] != 0 || fVar17 != cpp_dec_float_finite) {
LAB_0039a2f3:
                  local_e8.neg = (bool)(local_188.neg ^ 1);
                  local_e8.exp = local_188.exp;
                  local_e8._72_8_ = local_188._72_8_;
                }
LAB_0039a2ff:
                pcVar22 = (cpp_dec_float<100U,_int,_void> *)
                          ((long)(this->theLCbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar21);
                local_1e8.fpclass = cpp_dec_float_finite;
                local_1e8.prec_elem = 0x10;
                local_1e8.data._M_elems[0] = 0;
                local_1e8.data._M_elems[1] = 0;
                local_1e8.data._M_elems[2] = 0;
                local_1e8.data._M_elems[3] = 0;
                local_1e8.data._M_elems[4] = 0;
                local_1e8.data._M_elems[5] = 0;
                local_1e8.data._M_elems[6] = 0;
                local_1e8.data._M_elems[7] = 0;
                local_1e8.data._M_elems[8] = 0;
                local_1e8.data._M_elems[9] = 0;
                local_1e8.data._M_elems[10] = 0;
                local_1e8.data._M_elems[0xb] = 0;
                local_1e8.data._M_elems[0xc] = 0;
                local_1e8.data._M_elems[0xd] = 0;
                local_1e8.data._M_elems[0xe] = 0;
                local_1e8.data._M_elems[0xf] = 0;
                local_1e8.exp = 0;
                local_1e8.neg = false;
                local_188.exp = local_e8.exp;
                local_188._72_8_ = local_e8._72_8_;
                if (pcVar22 != &local_1e8) {
                  local_1e8.data._M_elems[0xc] = local_188.data._M_elems[0xc];
                  local_1e8.data._M_elems[0xd] = local_188.data._M_elems[0xd];
                  local_1e8.data._M_elems[0xe] = local_188.data._M_elems[0xe];
                  local_1e8.data._M_elems[0xf] =
                       (uint)(CONCAT35(local_188.data._M_elems[0xf]._1_3_,
                                       local_188.data._M_elems._56_5_) >> 0x20);
                  local_1e8.data._M_elems[8] = local_188.data._M_elems[8];
                  local_1e8.data._M_elems[9] = local_188.data._M_elems[9];
                  local_1e8.data._M_elems[10] = local_188.data._M_elems[10];
                  local_1e8.data._M_elems[0xb] = local_188.data._M_elems[0xb];
                  local_1e8.data._M_elems[4] = local_188.data._M_elems[4];
                  local_1e8.data._M_elems[5] = local_188.data._M_elems[5];
                  local_1e8.data._M_elems[6] = local_188.data._M_elems[6];
                  local_1e8.data._M_elems[7] = local_188.data._M_elems[7];
                  local_1e8.data._M_elems[0] = local_188.data._M_elems[0];
                  local_1e8.data._M_elems[1] = local_188.data._M_elems[1];
                  local_1e8.data._M_elems[2] = local_188.data._M_elems[2];
                  local_1e8.data._M_elems[3] = local_188.data._M_elems[3];
                  local_1e8.neg = local_e8.neg;
                  local_1e8.prec_elem = iVar20;
                  local_1e8.fpclass = fVar17;
                  local_1e8.exp = local_e8.exp;
                  goto LAB_0039a387;
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1e8,&local_e8);
                if (local_1e8.data._M_elems[0] != 0 || local_1e8.fpclass != cpp_dec_float_finite) {
                  local_1e8.neg = (bool)(local_1e8.neg ^ 1);
                }
                goto LAB_0039a38c;
              }
              local_1e8.data._M_elems[0] = local_188.data._M_elems[1];
              local_1e8.data._M_elems[1] = local_188.data._M_elems[2];
              local_1e8.data._M_elems[2] = local_188.data._M_elems[3];
              local_1e8.data._M_elems[3] = local_188.data._M_elems[4];
              local_1e8.data._M_elems[4] = local_188.data._M_elems[5];
              local_1e8.data._M_elems[5] = local_188.data._M_elems[6];
              local_1e8.data._M_elems[6] = local_188.data._M_elems[7];
              local_1e8.data._M_elems[7] = local_188.data._M_elems[8];
              local_1e8.data._M_elems[8] = local_188.data._M_elems[9];
              local_1e8.data._M_elems[9] = local_188.data._M_elems[10];
              local_1e8.data._M_elems[10] = local_188.data._M_elems[0xb];
              local_1e8.data._M_elems[0xb] = local_188.data._M_elems[0xc];
              local_1e8.data._M_elems[0xc] = local_188.data._M_elems[0xd];
              local_1e8.data._M_elems[0xd] = local_188.data._M_elems[0xe];
              local_1e8.data._M_elems[0xe] =
                   (uint)(CONCAT35(local_188.data._M_elems[0xf]._1_3_,local_188.data._M_elems._56_5_
                                  ) >> 0x20);
              pnVar4 = (this->theLCbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              *(uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21) =
                   local_188.data._M_elems[0];
              puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x4c);
              *puVar18 = CONCAT44(local_188.data._M_elems[2],local_188.data._M_elems[1]);
              puVar18[1] = CONCAT44(local_188.data._M_elems[4],local_188.data._M_elems[3]);
              puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x3c);
              *puVar18 = CONCAT44(local_188.data._M_elems[6],local_188.data._M_elems[5]);
              puVar18[1] = CONCAT44(local_188.data._M_elems[8],local_188.data._M_elems[7]);
              puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x2c);
              *puVar18 = CONCAT44(local_188.data._M_elems[10],local_188.data._M_elems[9]);
              puVar18[1] = CONCAT44(local_188.data._M_elems[0xc],local_188.data._M_elems[0xb]);
              puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x20);
              *puVar18 = CONCAT44(local_188.data._M_elems[0xd],local_188.data._M_elems[0xc]);
              puVar18[1] = CONCAT44(local_1e8.data._M_elems[0xe],local_1e8.data._M_elems[0xd]);
              *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x10) = local_188.exp;
              *(char *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0xc) =
                   (local_188.data._M_elems[0] != 0 || local_188.fpclass != cpp_dec_float_finite) ^
                   local_188.neg;
              *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -8) =
                   local_188._72_8_;
              if (((local_138.fpclass != cpp_dec_float_NaN) &&
                  (local_188.fpclass != cpp_dec_float_NaN)) &&
                 (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     (&local_138,&local_188), iVar15 == 0)) {
                local_1e8.data._M_elems[0xd] = local_138.data._M_elems[0xe];
                local_1e8.data._M_elems[0xe] =
                     (uint)(CONCAT35(local_138.data._M_elems[0xf]._1_3_,
                                     local_138.data._M_elems._56_5_) >> 0x20);
                pnVar4 = (this->theUCbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                *(uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21) =
                     local_138.data._M_elems[0];
                puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x4c);
                *puVar18 = CONCAT44(local_138.data._M_elems[2],local_138.data._M_elems[1]);
                puVar18[1] = CONCAT44(local_138.data._M_elems[4],local_138.data._M_elems[3]);
                puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x3c);
                *puVar18 = CONCAT44(local_138.data._M_elems[6],local_138.data._M_elems[5]);
                puVar18[1] = CONCAT44(local_138.data._M_elems[8],local_138.data._M_elems[7]);
                puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x2c);
                *puVar18 = CONCAT44(local_138.data._M_elems[10],local_138.data._M_elems[9]);
                puVar18[1] = CONCAT44(local_138.data._M_elems[0xc],local_138.data._M_elems[0xb]);
                puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x20);
                *puVar18 = CONCAT44(local_138.data._M_elems[0xd],local_138.data._M_elems[0xc]);
                puVar18[1] = CONCAT44(local_1e8.data._M_elems[0xe],local_1e8.data._M_elems[0xd]);
                *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x10) = local_138.exp;
                *(char *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0xc) =
                     (local_138.data._M_elems[0] != 0 || local_138.fpclass != cpp_dec_float_finite)
                     ^ local_138.neg;
                *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -8) =
                     local_138._72_8_;
              }
            }
            else {
              pnVar4 = (this->theUCbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_1e8.data._M_elems[0] = local_138.data._M_elems[0];
              local_1e8.data._M_elems[1] = local_138.data._M_elems[1];
              local_1e8.data._M_elems[2] = local_138.data._M_elems[2];
              local_1e8.data._M_elems[3] = local_138.data._M_elems[3];
              local_1e8.data._M_elems[0xc] = local_138.data._M_elems[0xc];
              local_1e8.data._M_elems[0xd] = local_138.data._M_elems[0xd];
              local_1e8.data._M_elems[0xf] =
                   (uint)(CONCAT35(local_138.data._M_elems[0xf]._1_3_,local_138.data._M_elems._56_5_
                                  ) >> 0x20);
              local_1e8.data._M_elems[8] = local_138.data._M_elems[8];
              local_1e8.data._M_elems[9] = local_138.data._M_elems[9];
              local_1e8.data._M_elems[10] = local_138.data._M_elems[10];
              local_1e8.data._M_elems[0xb] = local_138.data._M_elems[0xb];
              local_1e8.data._M_elems[4] = local_138.data._M_elems[4];
              local_1e8.data._M_elems[5] = local_138.data._M_elems[5];
              local_1e8.data._M_elems[6] = local_138.data._M_elems[6];
              local_1e8.data._M_elems[7] = local_138.data._M_elems[7];
              local_1e8.exp = local_138.exp;
              local_1e8.neg = local_138.neg;
              local_1e8.fpclass = local_138.fpclass;
              local_1e8.prec_elem = local_138.prec_elem;
              if (local_138.data._M_elems[0] != 0 || fVar17 != cpp_dec_float_finite) {
                local_1e8.neg = (bool)(local_138.neg ^ 1);
              }
              if (((fVar17 == cpp_dec_float_NaN) ||
                  (*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -8) == 2)) ||
                 (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar4[-1].m_backend.data._M_elems + lVar21),&local_1e8
                                     ), iVar15 < 1)) {
                pnVar4 = (this->theLCbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                local_1e8.data._M_elems[0] = local_188.data._M_elems[0];
                local_1e8.data._M_elems[1] = local_188.data._M_elems[1];
                local_1e8.data._M_elems[2] = local_188.data._M_elems[2];
                local_1e8.data._M_elems[3] = local_188.data._M_elems[3];
                local_1e8.data._M_elems[0xc] = local_188.data._M_elems[0xc];
                local_1e8.data._M_elems[0xd] = local_188.data._M_elems[0xd];
                local_1e8.data._M_elems[0xe] = local_188.data._M_elems[0xe];
                local_1e8.data._M_elems[0xf] =
                     (uint)(CONCAT35(local_188.data._M_elems[0xf]._1_3_,
                                     local_188.data._M_elems._56_5_) >> 0x20);
                local_1e8.data._M_elems[8] = local_188.data._M_elems[8];
                local_1e8.data._M_elems[9] = local_188.data._M_elems[9];
                local_1e8.data._M_elems[10] = local_188.data._M_elems[10];
                local_1e8.data._M_elems[0xb] = local_188.data._M_elems[0xb];
                local_1e8.data._M_elems[4] = local_188.data._M_elems[4];
                local_1e8.data._M_elems[5] = local_188.data._M_elems[5];
                local_1e8.data._M_elems[6] = local_188.data._M_elems[6];
                local_1e8.data._M_elems[7] = local_188.data._M_elems[7];
                local_1e8.exp = local_188.exp;
                local_1e8.neg = local_188.neg;
                local_1e8.fpclass = local_188.fpclass;
                local_1e8.prec_elem = local_188.prec_elem;
                if (local_188.data._M_elems[0] != 0 || local_188.fpclass != cpp_dec_float_finite) {
                  local_1e8.neg = (bool)(local_188.neg ^ 1);
                }
                if (((local_188.fpclass != cpp_dec_float_NaN) &&
                    (*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -8) != 2)) &&
                   (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare((cpp_dec_float<100U,_int,_void> *)
                                     ((long)pnVar4[-1].m_backend.data._M_elems + lVar21),&local_1e8)
                   , iVar15 < 0)) {
                  local_e8.data._M_elems[1] = local_188.data._M_elems[1];
                  local_e8.data._M_elems[0] = local_188.data._M_elems[0];
                  local_e8.data._M_elems[3] = local_188.data._M_elems[3];
                  local_e8.data._M_elems[2] = local_188.data._M_elems[2];
                  local_e8.data._M_elems[5] = local_188.data._M_elems[5];
                  local_e8.data._M_elems[4] = local_188.data._M_elems[4];
                  local_e8.data._M_elems[7] = local_188.data._M_elems[7];
                  local_e8.data._M_elems[6] = local_188.data._M_elems[6];
                  local_e8.data._M_elems[9] = local_188.data._M_elems[9];
                  local_e8.data._M_elems[8] = local_188.data._M_elems[8];
                  local_e8.data._M_elems[0xb] = local_188.data._M_elems[0xb];
                  local_e8.data._M_elems[10] = local_188.data._M_elems[10];
                  local_e8.data._M_elems[0xd] = local_188.data._M_elems[0xd];
                  local_e8.data._M_elems[0xc] = local_188.data._M_elems[0xc];
                  local_e8.data._M_elems[0xf]._1_3_ = local_188.data._M_elems[0xf]._1_3_;
                  local_e8.data._M_elems._56_5_ = local_188.data._M_elems._56_5_;
                  local_e8.exp = local_188.exp;
                  local_e8.neg = local_188.neg;
                  fVar17 = local_188.fpclass;
                  iVar20 = local_188.prec_elem;
                  local_e8.fpclass = local_188.fpclass;
                  local_e8.prec_elem = local_188.prec_elem;
                  if (local_188.data._M_elems[0] != 0 || fVar17 != cpp_dec_float_finite)
                  goto LAB_0039a2f3;
                  goto LAB_0039a2ff;
                }
              }
              else {
                pnVar4 = (this->theUCbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                local_e8.data._M_elems[1] = local_138.data._M_elems[1];
                local_e8.data._M_elems[0] = local_138.data._M_elems[0];
                local_e8.data._M_elems[3] = local_138.data._M_elems[3];
                local_e8.data._M_elems[2] = local_138.data._M_elems[2];
                local_e8.data._M_elems[5] = local_138.data._M_elems[5];
                local_e8.data._M_elems[4] = local_138.data._M_elems[4];
                local_e8.data._M_elems[7] = local_138.data._M_elems[7];
                local_e8.data._M_elems[6] = local_138.data._M_elems[6];
                local_e8.data._M_elems[9] = local_138.data._M_elems[9];
                local_e8.data._M_elems[8] = local_138.data._M_elems[8];
                local_e8.data._M_elems[0xb] = local_138.data._M_elems[0xb];
                local_e8.data._M_elems[10] = local_138.data._M_elems[10];
                local_e8.data._M_elems[0xd] = local_138.data._M_elems[0xd];
                local_e8.data._M_elems[0xc] = local_138.data._M_elems[0xc];
                local_e8.data._M_elems[0xf]._1_3_ = local_138.data._M_elems[0xf]._1_3_;
                local_e8.data._M_elems._56_5_ = local_138.data._M_elems._56_5_;
                local_e8.exp = local_138.exp;
                local_e8.neg = local_138.neg;
                local_e8.fpclass = local_138.fpclass;
                local_e8.prec_elem = local_138.prec_elem;
                if (local_138.fpclass != cpp_dec_float_finite || local_138.data._M_elems[0] != 0) {
                  local_e8.neg = (bool)(local_138.neg ^ 1);
                }
                puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21);
                local_1e8.fpclass = cpp_dec_float_finite;
                local_1e8.prec_elem = 0x10;
                local_1e8.data._M_elems[0] = 0;
                local_1e8.data._M_elems[1] = 0;
                local_1e8.data._M_elems[2] = 0;
                local_1e8.data._M_elems[3] = 0;
                local_1e8.data._M_elems[4] = 0;
                local_1e8.data._M_elems[5] = 0;
                local_1e8.data._M_elems[6] = 0;
                local_1e8.data._M_elems[7] = 0;
                local_1e8.data._M_elems[8] = 0;
                local_1e8.data._M_elems[9] = 0;
                local_1e8.data._M_elems[10] = 0;
                local_1e8.data._M_elems[0xb] = 0;
                local_1e8.data._M_elems[0xc] = 0;
                local_1e8.data._M_elems[0xd] = 0;
                local_1e8.data._M_elems[0xe] = 0;
                local_1e8.data._M_elems[0xf] = 0;
                local_1e8.exp = 0;
                local_1e8.neg = false;
                if ((cpp_dec_float<100U,_int,_void> *)puVar18 != &local_1e8) {
                  uVar7 = *puVar18;
                  uVar8 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x48);
                  uVar9 = *(undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar21);
                  uVar10 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x38)
                  ;
                  uVar11 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x30)
                  ;
                  uVar12 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x28)
                  ;
                  uVar13 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x20)
                  ;
                  uVar14 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x18)
                  ;
                  local_1e8.data._M_elems[0xc] = (uint)uVar13;
                  local_1e8.data._M_elems[0xd] = (uint)((ulong)uVar13 >> 0x20);
                  local_1e8.data._M_elems[0xe] = (uint)uVar14;
                  local_1e8.data._M_elems[0xf] = (uint)((ulong)uVar14 >> 0x20);
                  local_1e8.data._M_elems[8] = (uint)uVar11;
                  local_1e8.data._M_elems[9] = (uint)((ulong)uVar11 >> 0x20);
                  local_1e8.data._M_elems[10] = (uint)uVar12;
                  local_1e8.data._M_elems[0xb] = (uint)((ulong)uVar12 >> 0x20);
                  local_1e8.data._M_elems[4] = (uint)uVar9;
                  local_1e8.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
                  local_1e8.data._M_elems[6] = (uint)uVar10;
                  local_1e8.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
                  local_1e8.data._M_elems[0] = (uint)uVar7;
                  local_1e8.data._M_elems[1] = (uint)((ulong)uVar7 >> 0x20);
                  local_1e8.data._M_elems[2] = (uint)uVar8;
                  local_1e8.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
                  local_1e8.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x10)
                  ;
                  local_1e8.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0xc)
                  ;
                  local_1e8._72_8_ =
                       *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -8);
                }
                pcVar22 = &local_e8;
LAB_0039a387:
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1e8,pcVar22);
LAB_0039a38c:
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (local_190,&local_1e8);
              }
            }
            lVar23 = lVar23 + -1;
            lVar21 = lVar21 + -0x50;
          } while (1 < lVar23);
        }
      }
      else {
        if (0 < (int)uVar2) {
          lVar21 = uVar16 + 1;
          lVar23 = uVar16 * 0x50;
          do {
            pnVar4 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .right.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar23);
            uVar7 = *puVar18;
            uVar8 = puVar18[1];
            puVar18 = (undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar23);
            uVar9 = *puVar18;
            uVar10 = puVar18[1];
            puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x30);
            uVar11 = *puVar18;
            uVar12 = puVar18[1];
            puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x20);
            uVar13 = *puVar18;
            uVar14 = puVar18[1];
            local_138.data._M_elems[0xc] = (uint)uVar13;
            local_138.data._M_elems[0xd] = (uint)((ulong)uVar13 >> 0x20);
            local_138.data._M_elems._56_5_ = SUB85(uVar14,0);
            local_138.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
            local_138.data._M_elems[8] = (uint)uVar11;
            local_138.data._M_elems[9] = (uint)((ulong)uVar11 >> 0x20);
            local_138.data._M_elems[10] = (uint)uVar12;
            local_138.data._M_elems[0xb] = (uint)((ulong)uVar12 >> 0x20);
            local_138.data._M_elems[4] = (uint)uVar9;
            local_138.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
            local_138.data._M_elems[6] = (uint)uVar10;
            local_138.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
            pcVar22 = &local_138;
            local_138.data._M_elems[0] = (uint)uVar7;
            local_138.data._M_elems[1] = (uint)((ulong)uVar7 >> 0x20);
            local_138.data._M_elems[2] = (uint)uVar8;
            local_138.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
            local_138.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x10);
            local_138.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0xc);
            local_138._72_8_ =
                 *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -8);
            pnVar4 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .left.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar23);
            uVar7 = *puVar18;
            uVar8 = puVar18[1];
            puVar18 = (undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar23);
            uVar9 = *puVar18;
            uVar10 = puVar18[1];
            puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x30);
            uVar11 = *puVar18;
            uVar12 = puVar18[1];
            puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x20);
            uVar13 = *puVar18;
            uVar14 = puVar18[1];
            local_188.data._M_elems[0xc] = (uint)uVar13;
            local_188.data._M_elems[0xd] = (uint)((ulong)uVar13 >> 0x20);
            local_188.data._M_elems._56_5_ = SUB85(uVar14,0);
            local_188.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
            local_188.data._M_elems[8] = (uint)uVar11;
            local_188.data._M_elems[9] = (uint)((ulong)uVar11 >> 0x20);
            local_188.data._M_elems[10] = (uint)uVar12;
            local_188.data._M_elems[0xb] = (uint)((ulong)uVar12 >> 0x20);
            local_188.data._M_elems[4] = (uint)uVar9;
            local_188.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
            local_188.data._M_elems[6] = (uint)uVar10;
            local_188.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
            local_188.data._M_elems[0] = (uint)uVar7;
            local_188.data._M_elems[1] = (uint)((ulong)uVar7 >> 0x20);
            local_188.data._M_elems[2] = (uint)uVar8;
            local_188.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
            local_188.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x10);
            local_188.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0xc);
            local_188._72_8_ =
                 *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -8);
            if (((local_138.fpclass == cpp_dec_float_NaN) ||
                (local_188.fpclass == cpp_dec_float_NaN)) ||
               (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar22,&local_188), iVar15 != 0)) {
              if (this->theRep *
                  (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.rowstat.data[lVar21 + -2] < 1) {
                pnVar4 = (this->thePvec->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                local_1e8.data._M_elems[0xc] = local_138.data._M_elems[0xc];
                local_1e8.data._M_elems[0xd] = local_138.data._M_elems[0xd];
                local_1e8.data._M_elems[0xe] = local_138.data._M_elems[0xe];
                local_1e8.data._M_elems[0xf] =
                     (uint)(CONCAT35(local_138.data._M_elems[0xf]._1_3_,
                                     local_138.data._M_elems._56_5_) >> 0x20);
                local_1e8.data._M_elems[8] = local_138.data._M_elems[8];
                local_1e8.data._M_elems[9] = local_138.data._M_elems[9];
                local_1e8.data._M_elems[10] = local_138.data._M_elems[10];
                local_1e8.data._M_elems[0xb] = local_138.data._M_elems[0xb];
                local_1e8.data._M_elems[4] = local_138.data._M_elems[4];
                local_1e8.data._M_elems[5] = local_138.data._M_elems[5];
                local_1e8.data._M_elems[6] = local_138.data._M_elems[6];
                local_1e8.data._M_elems[7] = local_138.data._M_elems[7];
                local_1e8.data._M_elems[0] = local_138.data._M_elems[0];
                local_1e8.data._M_elems[1] = local_138.data._M_elems[1];
                local_1e8.data._M_elems[2] = local_138.data._M_elems[2];
                local_1e8.data._M_elems[3] = local_138.data._M_elems[3];
                local_1e8.exp = local_138.exp;
                local_1e8.neg = local_138.neg;
                local_1e8.fpclass = local_138.fpclass;
                local_1e8.prec_elem = local_138.prec_elem;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (&local_1e8,&local_80);
                if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -8) == 2) ||
                    (local_1e8.fpclass == cpp_dec_float_NaN)) ||
                   (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare((cpp_dec_float<100U,_int,_void> *)
                                     ((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems +
                                     lVar23),&local_1e8), -1 < iVar15)) {
                  pnVar4 = (this->theURbound).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar23);
                  local_1e8.fpclass = cpp_dec_float_finite;
                  local_1e8.prec_elem = 0x10;
                  local_1e8.data._M_elems[0] = 0;
                  local_1e8.data._M_elems[1] = 0;
                  local_1e8.data._M_elems[2] = 0;
                  local_1e8.data._M_elems[3] = 0;
                  local_1e8.data._M_elems[4] = 0;
                  local_1e8.data._M_elems[5] = 0;
                  local_1e8.data._M_elems[6] = 0;
                  local_1e8.data._M_elems[7] = 0;
                  local_1e8.data._M_elems[8] = 0;
                  local_1e8.data._M_elems[9] = 0;
                  local_1e8.data._M_elems[10] = 0;
                  local_1e8.data._M_elems[0xb] = 0;
                  local_1e8.data._M_elems[0xc] = 0;
                  local_1e8.data._M_elems[0xd] = 0;
                  local_1e8.data._M_elems[0xe] = 0;
                  local_1e8.data._M_elems[0xf] = 0;
                  local_1e8.exp = 0;
                  local_1e8.neg = false;
                  if ((cpp_dec_float<100U,_int,_void> *)puVar18 != &local_1e8) {
                    uVar7 = *puVar18;
                    uVar8 = *(undefined8 *)
                             ((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x48);
                    uVar9 = *(undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar23);
                    uVar10 = *(undefined8 *)
                              ((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x38);
                    uVar11 = *(undefined8 *)
                              ((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x30);
                    uVar12 = *(undefined8 *)
                              ((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x28);
                    uVar13 = *(undefined8 *)
                              ((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x20);
                    uVar14 = *(undefined8 *)
                              ((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x18);
                    local_1e8.data._M_elems[0xc] = (uint)uVar13;
                    local_1e8.data._M_elems[0xd] = (uint)((ulong)uVar13 >> 0x20);
                    local_1e8.data._M_elems[0xe] = (uint)uVar14;
                    local_1e8.data._M_elems[0xf] = (uint)((ulong)uVar14 >> 0x20);
                    local_1e8.data._M_elems[8] = (uint)uVar11;
                    local_1e8.data._M_elems[9] = (uint)((ulong)uVar11 >> 0x20);
                    local_1e8.data._M_elems[10] = (uint)uVar12;
                    local_1e8.data._M_elems[0xb] = (uint)((ulong)uVar12 >> 0x20);
                    local_1e8.data._M_elems[4] = (uint)uVar9;
                    local_1e8.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
                    local_1e8.data._M_elems[6] = (uint)uVar10;
                    local_1e8.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
                    local_1e8.data._M_elems[0] = (uint)uVar7;
                    local_1e8.data._M_elems[1] = (uint)((ulong)uVar7 >> 0x20);
                    local_1e8.data._M_elems[2] = (uint)uVar8;
                    local_1e8.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
                    local_1e8.exp =
                         *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x10);
                    local_1e8.neg =
                         *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0xc);
                    local_1e8._72_8_ =
                         *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -8);
                  }
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            (&local_1e8,&local_138);
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                            (local_190,&local_1e8);
                }
                else {
                  pnVar4 = (this->theURbound).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x20)
                  ;
                  *puVar18 = CONCAT44(local_138.data._M_elems[0xd],local_138.data._M_elems[0xc]);
                  puVar18[1] = CONCAT35(local_138.data._M_elems[0xf]._1_3_,
                                        local_138.data._M_elems._56_5_);
                  puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x30)
                  ;
                  *puVar18 = CONCAT44(local_138.data._M_elems[9],local_138.data._M_elems[8]);
                  puVar18[1] = CONCAT44(local_138.data._M_elems[0xb],local_138.data._M_elems[10]);
                  puVar18 = (undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar23);
                  *puVar18 = CONCAT44(local_138.data._M_elems[5],local_138.data._M_elems[4]);
                  puVar18[1] = CONCAT44(local_138.data._M_elems[7],local_138.data._M_elems[6]);
                  puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar23);
                  *puVar18 = CONCAT44(local_138.data._M_elems[1],local_138.data._M_elems[0]);
                  puVar18[1] = CONCAT44(local_138.data._M_elems[3],local_138.data._M_elems[2]);
                  *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x10) = local_138.exp
                  ;
                  *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0xc) = local_138.neg
                  ;
                  *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -8) =
                       local_138._72_8_;
                }
                pnVar4 = (this->thePvec->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                local_1e8.data._M_elems[0xc] = local_188.data._M_elems[0xc];
                local_1e8.data._M_elems[0xd] = local_188.data._M_elems[0xd];
                local_1e8.data._M_elems[0xe] = local_188.data._M_elems[0xe];
                local_1e8.data._M_elems[0xf] =
                     (uint)(CONCAT35(local_188.data._M_elems[0xf]._1_3_,
                                     local_188.data._M_elems._56_5_) >> 0x20);
                local_1e8.data._M_elems[8] = local_188.data._M_elems[8];
                local_1e8.data._M_elems[9] = local_188.data._M_elems[9];
                local_1e8.data._M_elems[10] = local_188.data._M_elems[10];
                local_1e8.data._M_elems[0xb] = local_188.data._M_elems[0xb];
                local_1e8.data._M_elems[4] = local_188.data._M_elems[4];
                local_1e8.data._M_elems[5] = local_188.data._M_elems[5];
                local_1e8.data._M_elems[6] = local_188.data._M_elems[6];
                local_1e8.data._M_elems[7] = local_188.data._M_elems[7];
                local_1e8.data._M_elems[0] = local_188.data._M_elems[0];
                local_1e8.data._M_elems[1] = local_188.data._M_elems[1];
                local_1e8.data._M_elems[2] = local_188.data._M_elems[2];
                local_1e8.data._M_elems[3] = local_188.data._M_elems[3];
                local_1e8.exp = local_188.exp;
                local_1e8.neg = local_188.neg;
                local_1e8.fpclass = local_188.fpclass;
                local_1e8.prec_elem = local_188.prec_elem;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1e8,&local_80);
                if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -8) == 2) ||
                    (local_1e8.fpclass == cpp_dec_float_NaN)) ||
                   (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare((cpp_dec_float<100U,_int,_void> *)
                                     ((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems +
                                     lVar23),&local_1e8), iVar15 < 1)) {
                  pcVar22 = (cpp_dec_float<100U,_int,_void> *)
                            ((long)(this->theLRbound).val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                   _M_elems + lVar23);
                  local_1e8.fpclass = cpp_dec_float_finite;
                  local_1e8.prec_elem = 0x10;
                  local_1e8.data._M_elems[0] = 0;
                  local_1e8.data._M_elems[1] = 0;
                  local_1e8.data._M_elems[2] = 0;
                  local_1e8.data._M_elems[3] = 0;
                  local_1e8.data._M_elems[4] = 0;
                  local_1e8.data._M_elems[5] = 0;
                  local_1e8.data._M_elems[6] = 0;
                  local_1e8.data._M_elems[7] = 0;
                  local_1e8.data._M_elems[8] = 0;
                  local_1e8.data._M_elems[9] = 0;
                  local_1e8.data._M_elems[10] = 0;
                  local_1e8.data._M_elems[0xb] = 0;
                  local_1e8.data._M_elems[0xc] = 0;
                  local_1e8.data._M_elems[0xd] = 0;
                  local_1e8.data._M_elems[0xe] = 0;
                  local_1e8.data._M_elems[0xf] = 0;
                  local_1e8.exp = 0;
                  local_1e8.neg = false;
                  if (pcVar22 == &local_1e8) {
                    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                              (&local_1e8,&local_188);
                    if (local_1e8.data._M_elems[0] != 0 || local_1e8.fpclass != cpp_dec_float_finite
                       ) goto LAB_0039999d;
                  }
                  else {
                    local_1e8.data._M_elems[0xc] = local_188.data._M_elems[0xc];
                    local_1e8.data._M_elems[0xd] = local_188.data._M_elems[0xd];
                    local_1e8.data._M_elems[0xe] = local_188.data._M_elems[0xe];
                    local_1e8.data._M_elems[0xf] =
                         (uint)(CONCAT35(local_188.data._M_elems[0xf]._1_3_,
                                         local_188.data._M_elems._56_5_) >> 0x20);
                    local_1e8.data._M_elems[8] = local_188.data._M_elems[8];
                    local_1e8.data._M_elems[9] = local_188.data._M_elems[9];
                    local_1e8.data._M_elems[10] = local_188.data._M_elems[10];
                    local_1e8.data._M_elems[0xb] = local_188.data._M_elems[0xb];
                    local_1e8.data._M_elems[4] = local_188.data._M_elems[4];
                    local_1e8.data._M_elems[5] = local_188.data._M_elems[5];
                    local_1e8.data._M_elems[6] = local_188.data._M_elems[6];
                    local_1e8.data._M_elems[7] = local_188.data._M_elems[7];
                    local_1e8.data._M_elems[0] = local_188.data._M_elems[0];
                    local_1e8.data._M_elems[1] = local_188.data._M_elems[1];
                    local_1e8.data._M_elems[2] = local_188.data._M_elems[2];
                    local_1e8.data._M_elems[3] = local_188.data._M_elems[3];
                    local_1e8.exp = local_188.exp;
                    local_1e8.neg = local_188.neg;
                    local_1e8.fpclass = local_188.fpclass;
                    local_1e8.prec_elem = local_188.prec_elem;
                    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                              (&local_1e8,pcVar22);
                  }
                  goto LAB_003999a2;
                }
                pnVar4 = (this->theLRbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x20);
                *puVar18 = CONCAT44(local_188.data._M_elems[0xd],local_188.data._M_elems[0xc]);
                puVar18[1] = CONCAT35(local_188.data._M_elems[0xf]._1_3_,
                                      local_188.data._M_elems._56_5_);
                puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x30);
                *puVar18 = CONCAT44(local_188.data._M_elems[9],local_188.data._M_elems[8]);
                puVar18[1] = CONCAT44(local_188.data._M_elems[0xb],local_188.data._M_elems[10]);
                puVar18 = (undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar23);
                *puVar18 = CONCAT44(local_188.data._M_elems[5],local_188.data._M_elems[4]);
                puVar18[1] = CONCAT44(local_188.data._M_elems[7],local_188.data._M_elems[6]);
                puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar23);
                *puVar18 = CONCAT44(local_188.data._M_elems[1],local_188.data._M_elems[0]);
                puVar18[1] = CONCAT44(local_188.data._M_elems[3],local_188.data._M_elems[2]);
                *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x10) = local_188.exp;
                *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0xc) = local_188.neg;
                *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -8) =
                     local_188._72_8_;
              }
              else {
                pnVar4 = (this->theURbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -8) != 2) &&
                    (local_138.fpclass != cpp_dec_float_NaN)) &&
                   (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare((cpp_dec_float<100U,_int,_void> *)
                                     ((long)pnVar4[-1].m_backend.data._M_elems + lVar23),pcVar22),
                   0 < iVar15)) goto LAB_003997aa;
                pnVar4 = (this->theLRbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -8) != 2) &&
                    (local_188.fpclass != cpp_dec_float_NaN)) &&
                   (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare((cpp_dec_float<100U,_int,_void> *)
                                     ((long)pnVar4[-1].m_backend.data._M_elems + lVar23),&local_188)
                   , iVar15 < 0)) goto LAB_00399835;
              }
            }
            else {
              pnVar4 = (this->theURbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -8) == 2) ||
                  (local_138.fpclass == cpp_dec_float_NaN)) ||
                 (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar4[-1].m_backend.data._M_elems + lVar23),pcVar22),
                 iVar15 < 1)) {
LAB_00399835:
                pcVar22 = (cpp_dec_float<100U,_int,_void> *)
                          ((long)(this->theLRbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar23);
                local_1e8.fpclass = cpp_dec_float_finite;
                local_1e8.prec_elem = 0x10;
                local_1e8.data._M_elems[0] = 0;
                local_1e8.data._M_elems[1] = 0;
                local_1e8.data._M_elems[2] = 0;
                local_1e8.data._M_elems[3] = 0;
                local_1e8.data._M_elems[4] = 0;
                local_1e8.data._M_elems[5] = 0;
                local_1e8.data._M_elems[6] = 0;
                local_1e8.data._M_elems[7] = 0;
                local_1e8.data._M_elems[8] = 0;
                local_1e8.data._M_elems[9] = 0;
                local_1e8.data._M_elems[10] = 0;
                local_1e8.data._M_elems[0xb] = 0;
                local_1e8.data._M_elems[0xc] = 0;
                local_1e8.data._M_elems[0xd] = 0;
                local_1e8.data._M_elems[0xe] = 0;
                local_1e8.data._M_elems[0xf] = 0;
                local_1e8.exp = 0;
                local_1e8.neg = false;
                if (pcVar22 != &local_1e8) {
                  local_1e8.data._M_elems[0xc] = local_188.data._M_elems[0xc];
                  local_1e8.data._M_elems[0xd] = local_188.data._M_elems[0xd];
                  local_1e8.data._M_elems[0xe] = local_188.data._M_elems[0xe];
                  local_1e8.data._M_elems[0xf] =
                       (uint)(CONCAT35(local_188.data._M_elems[0xf]._1_3_,
                                       local_188.data._M_elems._56_5_) >> 0x20);
                  local_1e8.data._M_elems[8] = local_188.data._M_elems[8];
                  local_1e8.data._M_elems[9] = local_188.data._M_elems[9];
                  local_1e8.data._M_elems[10] = local_188.data._M_elems[10];
                  local_1e8.data._M_elems[0xb] = local_188.data._M_elems[0xb];
                  local_1e8.data._M_elems[4] = local_188.data._M_elems[4];
                  local_1e8.data._M_elems[5] = local_188.data._M_elems[5];
                  local_1e8.data._M_elems[6] = local_188.data._M_elems[6];
                  local_1e8.data._M_elems[7] = local_188.data._M_elems[7];
                  local_1e8.data._M_elems[0] = local_188.data._M_elems[0];
                  local_1e8.data._M_elems[1] = local_188.data._M_elems[1];
                  local_1e8.data._M_elems[2] = local_188.data._M_elems[2];
                  local_1e8.data._M_elems[3] = local_188.data._M_elems[3];
                  local_1e8.exp = local_188.exp;
                  local_1e8.neg = local_188.neg;
                  local_1e8.fpclass = local_188.fpclass;
                  local_1e8.prec_elem = local_188.prec_elem;
                  goto LAB_003998ce;
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1e8,&local_188);
                if (local_1e8.data._M_elems[0] != 0 || local_1e8.fpclass != cpp_dec_float_finite) {
LAB_0039999d:
                  local_1e8.neg = (bool)(local_1e8.neg ^ 1);
                }
              }
              else {
LAB_003997aa:
                pnVar4 = (this->theURbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar23);
                local_1e8.fpclass = cpp_dec_float_finite;
                local_1e8.prec_elem = 0x10;
                local_1e8.data._M_elems[0] = 0;
                local_1e8.data._M_elems[1] = 0;
                local_1e8.data._M_elems[2] = 0;
                local_1e8.data._M_elems[3] = 0;
                local_1e8.data._M_elems[4] = 0;
                local_1e8.data._M_elems[5] = 0;
                local_1e8.data._M_elems[6] = 0;
                local_1e8.data._M_elems[7] = 0;
                local_1e8.data._M_elems[8] = 0;
                local_1e8.data._M_elems[9] = 0;
                local_1e8.data._M_elems[10] = 0;
                local_1e8.data._M_elems[0xb] = 0;
                local_1e8.data._M_elems[0xc] = 0;
                local_1e8.data._M_elems[0xd] = 0;
                local_1e8.data._M_elems[0xe] = 0;
                local_1e8.data._M_elems[0xf] = 0;
                local_1e8.exp = 0;
                local_1e8.neg = false;
                if ((cpp_dec_float<100U,_int,_void> *)puVar18 != &local_1e8) {
                  uVar7 = *puVar18;
                  uVar8 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x48);
                  uVar9 = *(undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar23);
                  uVar10 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x38)
                  ;
                  uVar11 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x30)
                  ;
                  uVar12 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x28)
                  ;
                  uVar13 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x20)
                  ;
                  uVar14 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x18)
                  ;
                  local_1e8.data._M_elems[0xc] = (uint)uVar13;
                  local_1e8.data._M_elems[0xd] = (uint)((ulong)uVar13 >> 0x20);
                  local_1e8.data._M_elems[0xe] = (uint)uVar14;
                  local_1e8.data._M_elems[0xf] = (uint)((ulong)uVar14 >> 0x20);
                  local_1e8.data._M_elems[8] = (uint)uVar11;
                  local_1e8.data._M_elems[9] = (uint)((ulong)uVar11 >> 0x20);
                  local_1e8.data._M_elems[10] = (uint)uVar12;
                  local_1e8.data._M_elems[0xb] = (uint)((ulong)uVar12 >> 0x20);
                  local_1e8.data._M_elems[4] = (uint)uVar9;
                  local_1e8.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
                  local_1e8.data._M_elems[6] = (uint)uVar10;
                  local_1e8.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
                  local_1e8.data._M_elems[0] = (uint)uVar7;
                  local_1e8.data._M_elems[1] = (uint)((ulong)uVar7 >> 0x20);
                  local_1e8.data._M_elems[2] = (uint)uVar8;
                  local_1e8.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
                  local_1e8.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0x10)
                  ;
                  local_1e8.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -0xc)
                  ;
                  local_1e8._72_8_ =
                       *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar23 + -8);
                }
LAB_003998ce:
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1e8,pcVar22);
              }
LAB_003999a2:
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (local_190,&local_1e8);
            }
            lVar21 = lVar21 + -1;
            lVar23 = lVar23 + -0x50;
          } while (1 < lVar21);
        }
        lVar21 = (long)(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum;
        if (0 < lVar21) {
          lVar23 = lVar21 + 1;
          lVar21 = lVar21 * 0x50;
          do {
            pnVar4 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .up.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21);
            uVar7 = *puVar18;
            uVar8 = puVar18[1];
            puVar18 = (undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar21);
            uVar9 = *puVar18;
            uVar10 = puVar18[1];
            puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x30);
            uVar11 = *puVar18;
            uVar12 = puVar18[1];
            puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x20);
            uVar13 = *puVar18;
            uVar14 = puVar18[1];
            local_138.data._M_elems[0xc] = (uint)uVar13;
            local_138.data._M_elems[0xd] = (uint)((ulong)uVar13 >> 0x20);
            local_138.data._M_elems._56_5_ = SUB85(uVar14,0);
            local_138.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
            local_138.data._M_elems[8] = (uint)uVar11;
            local_138.data._M_elems[9] = (uint)((ulong)uVar11 >> 0x20);
            local_138.data._M_elems[10] = (uint)uVar12;
            local_138.data._M_elems[0xb] = (uint)((ulong)uVar12 >> 0x20);
            local_138.data._M_elems[4] = (uint)uVar9;
            local_138.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
            local_138.data._M_elems[6] = (uint)uVar10;
            local_138.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
            pcVar22 = &local_138;
            local_138.data._M_elems[0] = (uint)uVar7;
            local_138.data._M_elems[1] = (uint)((ulong)uVar7 >> 0x20);
            local_138.data._M_elems[2] = (uint)uVar8;
            local_138.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
            local_138.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x10);
            local_138.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0xc);
            local_138._72_8_ =
                 *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -8);
            pnVar4 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .low.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21);
            uVar7 = *puVar18;
            uVar8 = puVar18[1];
            puVar18 = (undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar21);
            uVar9 = *puVar18;
            uVar10 = puVar18[1];
            puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x30);
            uVar11 = *puVar18;
            uVar12 = puVar18[1];
            puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x20);
            uVar13 = *puVar18;
            uVar14 = puVar18[1];
            local_188.data._M_elems[0xc] = (uint)uVar13;
            local_188.data._M_elems[0xd] = (uint)((ulong)uVar13 >> 0x20);
            local_188.data._M_elems._56_5_ = SUB85(uVar14,0);
            local_188.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
            local_188.data._M_elems[8] = (uint)uVar11;
            local_188.data._M_elems[9] = (uint)((ulong)uVar11 >> 0x20);
            local_188.data._M_elems[10] = (uint)uVar12;
            local_188.data._M_elems[0xb] = (uint)((ulong)uVar12 >> 0x20);
            local_188.data._M_elems[4] = (uint)uVar9;
            local_188.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
            local_188.data._M_elems[6] = (uint)uVar10;
            local_188.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
            local_188.data._M_elems[0] = (uint)uVar7;
            local_188.data._M_elems[1] = (uint)((ulong)uVar7 >> 0x20);
            local_188.data._M_elems[2] = (uint)uVar8;
            local_188.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
            local_188.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x10);
            local_188.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0xc);
            local_188._72_8_ =
                 *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -8);
            if (((local_138.fpclass == cpp_dec_float_NaN) ||
                (local_188.fpclass == cpp_dec_float_NaN)) ||
               (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar22,&local_188), iVar15 != 0)) {
              if (this->theRep *
                  (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.colstat.data[lVar23 + -2] < 1) {
                pnVar4 = (this->theCoPvec->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                local_1e8.data._M_elems[0xc] = local_138.data._M_elems[0xc];
                local_1e8.data._M_elems[0xd] = local_138.data._M_elems[0xd];
                local_1e8.data._M_elems[0xe] = local_138.data._M_elems[0xe];
                local_1e8.data._M_elems[0xf] =
                     (uint)(CONCAT35(local_138.data._M_elems[0xf]._1_3_,
                                     local_138.data._M_elems._56_5_) >> 0x20);
                local_1e8.data._M_elems[8] = local_138.data._M_elems[8];
                local_1e8.data._M_elems[9] = local_138.data._M_elems[9];
                local_1e8.data._M_elems[10] = local_138.data._M_elems[10];
                local_1e8.data._M_elems[0xb] = local_138.data._M_elems[0xb];
                local_1e8.data._M_elems[4] = local_138.data._M_elems[4];
                local_1e8.data._M_elems[5] = local_138.data._M_elems[5];
                local_1e8.data._M_elems[6] = local_138.data._M_elems[6];
                local_1e8.data._M_elems[7] = local_138.data._M_elems[7];
                local_1e8.data._M_elems[0] = local_138.data._M_elems[0];
                local_1e8.data._M_elems[1] = local_138.data._M_elems[1];
                local_1e8.data._M_elems[2] = local_138.data._M_elems[2];
                local_1e8.data._M_elems[3] = local_138.data._M_elems[3];
                local_1e8.exp = local_138.exp;
                local_1e8.neg = local_138.neg;
                local_1e8.fpclass = local_138.fpclass;
                local_1e8.prec_elem = local_138.prec_elem;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (&local_1e8,&local_80);
                if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -8) == 2) ||
                    (local_1e8.fpclass == cpp_dec_float_NaN)) ||
                   (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare((cpp_dec_float<100U,_int,_void> *)
                                     ((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems +
                                     lVar21),&local_1e8), -1 < iVar15)) {
                  pnVar4 = (this->theUCbound).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21);
                  local_1e8.fpclass = cpp_dec_float_finite;
                  local_1e8.prec_elem = 0x10;
                  local_1e8.data._M_elems[0] = 0;
                  local_1e8.data._M_elems[1] = 0;
                  local_1e8.data._M_elems[2] = 0;
                  local_1e8.data._M_elems[3] = 0;
                  local_1e8.data._M_elems[4] = 0;
                  local_1e8.data._M_elems[5] = 0;
                  local_1e8.data._M_elems[6] = 0;
                  local_1e8.data._M_elems[7] = 0;
                  local_1e8.data._M_elems[8] = 0;
                  local_1e8.data._M_elems[9] = 0;
                  local_1e8.data._M_elems[10] = 0;
                  local_1e8.data._M_elems[0xb] = 0;
                  local_1e8.data._M_elems[0xc] = 0;
                  local_1e8.data._M_elems[0xd] = 0;
                  local_1e8.data._M_elems[0xe] = 0;
                  local_1e8.data._M_elems[0xf] = 0;
                  local_1e8.exp = 0;
                  local_1e8.neg = false;
                  if ((cpp_dec_float<100U,_int,_void> *)puVar18 != &local_1e8) {
                    uVar7 = *puVar18;
                    uVar8 = *(undefined8 *)
                             ((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x48);
                    uVar9 = *(undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar21);
                    uVar10 = *(undefined8 *)
                              ((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x38);
                    uVar11 = *(undefined8 *)
                              ((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x30);
                    uVar12 = *(undefined8 *)
                              ((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x28);
                    uVar13 = *(undefined8 *)
                              ((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x20);
                    uVar14 = *(undefined8 *)
                              ((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x18);
                    local_1e8.data._M_elems[0xc] = (uint)uVar13;
                    local_1e8.data._M_elems[0xd] = (uint)((ulong)uVar13 >> 0x20);
                    local_1e8.data._M_elems[0xe] = (uint)uVar14;
                    local_1e8.data._M_elems[0xf] = (uint)((ulong)uVar14 >> 0x20);
                    local_1e8.data._M_elems[8] = (uint)uVar11;
                    local_1e8.data._M_elems[9] = (uint)((ulong)uVar11 >> 0x20);
                    local_1e8.data._M_elems[10] = (uint)uVar12;
                    local_1e8.data._M_elems[0xb] = (uint)((ulong)uVar12 >> 0x20);
                    local_1e8.data._M_elems[4] = (uint)uVar9;
                    local_1e8.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
                    local_1e8.data._M_elems[6] = (uint)uVar10;
                    local_1e8.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
                    local_1e8.data._M_elems[0] = (uint)uVar7;
                    local_1e8.data._M_elems[1] = (uint)((ulong)uVar7 >> 0x20);
                    local_1e8.data._M_elems[2] = (uint)uVar8;
                    local_1e8.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
                    local_1e8.exp =
                         *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x10);
                    local_1e8.neg =
                         *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0xc);
                    local_1e8._72_8_ =
                         *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -8);
                  }
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            (&local_1e8,&local_138);
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                            (local_190,&local_1e8);
                }
                else {
                  pnVar4 = (this->theUCbound).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x20)
                  ;
                  *puVar18 = CONCAT44(local_138.data._M_elems[0xd],local_138.data._M_elems[0xc]);
                  puVar18[1] = CONCAT35(local_138.data._M_elems[0xf]._1_3_,
                                        local_138.data._M_elems._56_5_);
                  puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x30)
                  ;
                  *puVar18 = CONCAT44(local_138.data._M_elems[9],local_138.data._M_elems[8]);
                  puVar18[1] = CONCAT44(local_138.data._M_elems[0xb],local_138.data._M_elems[10]);
                  puVar18 = (undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar21);
                  *puVar18 = CONCAT44(local_138.data._M_elems[5],local_138.data._M_elems[4]);
                  puVar18[1] = CONCAT44(local_138.data._M_elems[7],local_138.data._M_elems[6]);
                  puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21);
                  *puVar18 = CONCAT44(local_138.data._M_elems[1],local_138.data._M_elems[0]);
                  puVar18[1] = CONCAT44(local_138.data._M_elems[3],local_138.data._M_elems[2]);
                  *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x10) = local_138.exp
                  ;
                  *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0xc) = local_138.neg
                  ;
                  *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -8) =
                       local_138._72_8_;
                }
                pnVar4 = (this->theCoPvec->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                local_1e8.data._M_elems[0xc] = local_188.data._M_elems[0xc];
                local_1e8.data._M_elems[0xd] = local_188.data._M_elems[0xd];
                local_1e8.data._M_elems[0xe] = local_188.data._M_elems[0xe];
                local_1e8.data._M_elems[0xf] =
                     (uint)(CONCAT35(local_188.data._M_elems[0xf]._1_3_,
                                     local_188.data._M_elems._56_5_) >> 0x20);
                local_1e8.data._M_elems[8] = local_188.data._M_elems[8];
                local_1e8.data._M_elems[9] = local_188.data._M_elems[9];
                local_1e8.data._M_elems[10] = local_188.data._M_elems[10];
                local_1e8.data._M_elems[0xb] = local_188.data._M_elems[0xb];
                local_1e8.data._M_elems[4] = local_188.data._M_elems[4];
                local_1e8.data._M_elems[5] = local_188.data._M_elems[5];
                local_1e8.data._M_elems[6] = local_188.data._M_elems[6];
                local_1e8.data._M_elems[7] = local_188.data._M_elems[7];
                local_1e8.data._M_elems[0] = local_188.data._M_elems[0];
                local_1e8.data._M_elems[1] = local_188.data._M_elems[1];
                local_1e8.data._M_elems[2] = local_188.data._M_elems[2];
                local_1e8.data._M_elems[3] = local_188.data._M_elems[3];
                local_1e8.exp = local_188.exp;
                local_1e8.neg = local_188.neg;
                local_1e8.fpclass = local_188.fpclass;
                local_1e8.prec_elem = local_188.prec_elem;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1e8,&local_80);
                if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -8) == 2) ||
                    (local_1e8.fpclass == cpp_dec_float_NaN)) ||
                   (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare((cpp_dec_float<100U,_int,_void> *)
                                     ((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems +
                                     lVar21),&local_1e8), iVar15 < 1)) {
                  pcVar22 = (cpp_dec_float<100U,_int,_void> *)
                            ((long)(this->theLCbound).val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                   _M_elems + lVar21);
                  local_1e8.fpclass = cpp_dec_float_finite;
                  local_1e8.prec_elem = 0x10;
                  local_1e8.data._M_elems[0] = 0;
                  local_1e8.data._M_elems[1] = 0;
                  local_1e8.data._M_elems[2] = 0;
                  local_1e8.data._M_elems[3] = 0;
                  local_1e8.data._M_elems[4] = 0;
                  local_1e8.data._M_elems[5] = 0;
                  local_1e8.data._M_elems[6] = 0;
                  local_1e8.data._M_elems[7] = 0;
                  local_1e8.data._M_elems[8] = 0;
                  local_1e8.data._M_elems[9] = 0;
                  local_1e8.data._M_elems[10] = 0;
                  local_1e8.data._M_elems[0xb] = 0;
                  local_1e8.data._M_elems[0xc] = 0;
                  local_1e8.data._M_elems[0xd] = 0;
                  local_1e8.data._M_elems[0xe] = 0;
                  local_1e8.data._M_elems[0xf] = 0;
                  local_1e8.exp = 0;
                  local_1e8.neg = false;
                  if (pcVar22 == &local_1e8) {
                    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                              (&local_1e8,&local_188);
                    if (local_1e8.data._M_elems[0] != 0 || local_1e8.fpclass != cpp_dec_float_finite
                       ) goto LAB_0039ab5c;
                  }
                  else {
                    local_1e8.data._M_elems[0xc] = local_188.data._M_elems[0xc];
                    local_1e8.data._M_elems[0xd] = local_188.data._M_elems[0xd];
                    local_1e8.data._M_elems[0xe] = local_188.data._M_elems[0xe];
                    local_1e8.data._M_elems[0xf] =
                         (uint)(CONCAT35(local_188.data._M_elems[0xf]._1_3_,
                                         local_188.data._M_elems._56_5_) >> 0x20);
                    local_1e8.data._M_elems[8] = local_188.data._M_elems[8];
                    local_1e8.data._M_elems[9] = local_188.data._M_elems[9];
                    local_1e8.data._M_elems[10] = local_188.data._M_elems[10];
                    local_1e8.data._M_elems[0xb] = local_188.data._M_elems[0xb];
                    local_1e8.data._M_elems[4] = local_188.data._M_elems[4];
                    local_1e8.data._M_elems[5] = local_188.data._M_elems[5];
                    local_1e8.data._M_elems[6] = local_188.data._M_elems[6];
                    local_1e8.data._M_elems[7] = local_188.data._M_elems[7];
                    local_1e8.data._M_elems[0] = local_188.data._M_elems[0];
                    local_1e8.data._M_elems[1] = local_188.data._M_elems[1];
                    local_1e8.data._M_elems[2] = local_188.data._M_elems[2];
                    local_1e8.data._M_elems[3] = local_188.data._M_elems[3];
                    local_1e8.exp = local_188.exp;
                    local_1e8.neg = local_188.neg;
                    local_1e8.fpclass = local_188.fpclass;
                    local_1e8.prec_elem = local_188.prec_elem;
                    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                              (&local_1e8,pcVar22);
                  }
                  goto LAB_0039ab61;
                }
                pnVar4 = (this->theLCbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x20);
                *puVar18 = CONCAT44(local_188.data._M_elems[0xd],local_188.data._M_elems[0xc]);
                puVar18[1] = CONCAT35(local_188.data._M_elems[0xf]._1_3_,
                                      local_188.data._M_elems._56_5_);
                puVar18 = (undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x30);
                *puVar18 = CONCAT44(local_188.data._M_elems[9],local_188.data._M_elems[8]);
                puVar18[1] = CONCAT44(local_188.data._M_elems[0xb],local_188.data._M_elems[10]);
                puVar18 = (undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar21);
                *puVar18 = CONCAT44(local_188.data._M_elems[5],local_188.data._M_elems[4]);
                puVar18[1] = CONCAT44(local_188.data._M_elems[7],local_188.data._M_elems[6]);
                puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21);
                *puVar18 = CONCAT44(local_188.data._M_elems[1],local_188.data._M_elems[0]);
                puVar18[1] = CONCAT44(local_188.data._M_elems[3],local_188.data._M_elems[2]);
                *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x10) = local_188.exp;
                *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0xc) = local_188.neg;
                *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -8) =
                     local_188._72_8_;
              }
              else {
                pnVar4 = (this->theUCbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -8) != 2) &&
                    (local_138.fpclass != cpp_dec_float_NaN)) &&
                   (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare((cpp_dec_float<100U,_int,_void> *)
                                     ((long)pnVar4[-1].m_backend.data._M_elems + lVar21),pcVar22),
                   0 < iVar15)) goto LAB_0039a969;
                pnVar4 = (this->theLCbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -8) != 2) &&
                    (local_188.fpclass != cpp_dec_float_NaN)) &&
                   (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare((cpp_dec_float<100U,_int,_void> *)
                                     ((long)pnVar4[-1].m_backend.data._M_elems + lVar21),&local_188)
                   , iVar15 < 0)) goto LAB_0039a9f4;
              }
            }
            else {
              pnVar4 = (this->theUCbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -8) == 2) ||
                  (local_138.fpclass == cpp_dec_float_NaN)) ||
                 (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)
                                      ((long)pnVar4[-1].m_backend.data._M_elems + lVar21),pcVar22),
                 iVar15 < 1)) {
LAB_0039a9f4:
                pcVar22 = (cpp_dec_float<100U,_int,_void> *)
                          ((long)(this->theLCbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar21);
                local_1e8.fpclass = cpp_dec_float_finite;
                local_1e8.prec_elem = 0x10;
                local_1e8.data._M_elems[0] = 0;
                local_1e8.data._M_elems[1] = 0;
                local_1e8.data._M_elems[2] = 0;
                local_1e8.data._M_elems[3] = 0;
                local_1e8.data._M_elems[4] = 0;
                local_1e8.data._M_elems[5] = 0;
                local_1e8.data._M_elems[6] = 0;
                local_1e8.data._M_elems[7] = 0;
                local_1e8.data._M_elems[8] = 0;
                local_1e8.data._M_elems[9] = 0;
                local_1e8.data._M_elems[10] = 0;
                local_1e8.data._M_elems[0xb] = 0;
                local_1e8.data._M_elems[0xc] = 0;
                local_1e8.data._M_elems[0xd] = 0;
                local_1e8.data._M_elems[0xe] = 0;
                local_1e8.data._M_elems[0xf] = 0;
                local_1e8.exp = 0;
                local_1e8.neg = false;
                if (pcVar22 != &local_1e8) {
                  local_1e8.data._M_elems[0xc] = local_188.data._M_elems[0xc];
                  local_1e8.data._M_elems[0xd] = local_188.data._M_elems[0xd];
                  local_1e8.data._M_elems[0xe] = local_188.data._M_elems[0xe];
                  local_1e8.data._M_elems[0xf] =
                       (uint)(CONCAT35(local_188.data._M_elems[0xf]._1_3_,
                                       local_188.data._M_elems._56_5_) >> 0x20);
                  local_1e8.data._M_elems[8] = local_188.data._M_elems[8];
                  local_1e8.data._M_elems[9] = local_188.data._M_elems[9];
                  local_1e8.data._M_elems[10] = local_188.data._M_elems[10];
                  local_1e8.data._M_elems[0xb] = local_188.data._M_elems[0xb];
                  local_1e8.data._M_elems[4] = local_188.data._M_elems[4];
                  local_1e8.data._M_elems[5] = local_188.data._M_elems[5];
                  local_1e8.data._M_elems[6] = local_188.data._M_elems[6];
                  local_1e8.data._M_elems[7] = local_188.data._M_elems[7];
                  local_1e8.data._M_elems[0] = local_188.data._M_elems[0];
                  local_1e8.data._M_elems[1] = local_188.data._M_elems[1];
                  local_1e8.data._M_elems[2] = local_188.data._M_elems[2];
                  local_1e8.data._M_elems[3] = local_188.data._M_elems[3];
                  local_1e8.exp = local_188.exp;
                  local_1e8.neg = local_188.neg;
                  local_1e8.fpclass = local_188.fpclass;
                  local_1e8.prec_elem = local_188.prec_elem;
                  goto LAB_0039aa8d;
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1e8,&local_188);
                if (local_1e8.data._M_elems[0] != 0 || local_1e8.fpclass != cpp_dec_float_finite) {
LAB_0039ab5c:
                  local_1e8.neg = (bool)(local_1e8.neg ^ 1);
                }
              }
              else {
LAB_0039a969:
                pnVar4 = (this->theUCbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar18 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar21);
                local_1e8.fpclass = cpp_dec_float_finite;
                local_1e8.prec_elem = 0x10;
                local_1e8.data._M_elems[0] = 0;
                local_1e8.data._M_elems[1] = 0;
                local_1e8.data._M_elems[2] = 0;
                local_1e8.data._M_elems[3] = 0;
                local_1e8.data._M_elems[4] = 0;
                local_1e8.data._M_elems[5] = 0;
                local_1e8.data._M_elems[6] = 0;
                local_1e8.data._M_elems[7] = 0;
                local_1e8.data._M_elems[8] = 0;
                local_1e8.data._M_elems[9] = 0;
                local_1e8.data._M_elems[10] = 0;
                local_1e8.data._M_elems[0xb] = 0;
                local_1e8.data._M_elems[0xc] = 0;
                local_1e8.data._M_elems[0xd] = 0;
                local_1e8.data._M_elems[0xe] = 0;
                local_1e8.data._M_elems[0xf] = 0;
                local_1e8.exp = 0;
                local_1e8.neg = false;
                if ((cpp_dec_float<100U,_int,_void> *)puVar18 != &local_1e8) {
                  uVar7 = *puVar18;
                  uVar8 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x48);
                  uVar9 = *(undefined8 *)((long)(&(pnVar4->m_backend).data + -1) + lVar21);
                  uVar10 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x38)
                  ;
                  uVar11 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x30)
                  ;
                  uVar12 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x28)
                  ;
                  uVar13 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x20)
                  ;
                  uVar14 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x18)
                  ;
                  local_1e8.data._M_elems[0xc] = (uint)uVar13;
                  local_1e8.data._M_elems[0xd] = (uint)((ulong)uVar13 >> 0x20);
                  local_1e8.data._M_elems[0xe] = (uint)uVar14;
                  local_1e8.data._M_elems[0xf] = (uint)((ulong)uVar14 >> 0x20);
                  local_1e8.data._M_elems[8] = (uint)uVar11;
                  local_1e8.data._M_elems[9] = (uint)((ulong)uVar11 >> 0x20);
                  local_1e8.data._M_elems[10] = (uint)uVar12;
                  local_1e8.data._M_elems[0xb] = (uint)((ulong)uVar12 >> 0x20);
                  local_1e8.data._M_elems[4] = (uint)uVar9;
                  local_1e8.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
                  local_1e8.data._M_elems[6] = (uint)uVar10;
                  local_1e8.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
                  local_1e8.data._M_elems[0] = (uint)uVar7;
                  local_1e8.data._M_elems[1] = (uint)((ulong)uVar7 >> 0x20);
                  local_1e8.data._M_elems[2] = (uint)uVar8;
                  local_1e8.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
                  local_1e8.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0x10)
                  ;
                  local_1e8.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -0xc)
                  ;
                  local_1e8._72_8_ =
                       *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar21 + -8);
                }
LAB_0039aa8d:
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_1e8,pcVar22);
              }
LAB_0039ab61:
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (local_190,&local_1e8);
            }
            lVar23 = lVar23 + -1;
            lVar21 = lVar21 + -0x50;
          } while (1 < lVar23);
        }
      }
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::unShift(void)
{
   SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "DSHIFT07 = " << "unshifting ..." << std::endl;);

   if(isInitialized())
   {
      int i;
      R t_up, t_low;
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

      theShift = 0;

      if(type() == ENTER)
      {
         R eps = entertol();

         if(rep() == COLUMN)
         {
            for(i = dim(); i-- > 0;)
            {
               SPxId l_id = this->baseId(i);
               int l_num = this->number(l_id);

               if(l_id.type() == SPxId::ROW_ID)
               {
                  t_up = -this->lhs(l_num);
                  t_low = -this->rhs(l_num);
               }
               else
               {
                  assert(l_id.type() == SPxId::COL_ID);
                  t_up = this->upper(l_num);
                  t_low = this->lower(l_num);
               }

               if(t_up != t_low)
               {
                  if((*theFvec)[i] < t_up + eps)  // check allowed violation
                     theUBbound[i] = t_up; // reset shifted bound to original
                  else if((*theFvec)[i] > t_up)  // shifted bound is required for feasibility
                     theShift += theUBbound[i] - t_up;

                  if((*theFvec)[i] > t_low - eps)  // check allowed violation
                     theLBbound[i] = t_low; // reset shifted bound to original
                  else if((*theFvec)[i] < t_low)  // shifted bound is required for feasibility
                     theShift -= theLBbound[i] - t_low;
               }
               else
               {
                  if(theUBbound[i] > t_up)
                     theShift += theUBbound[i] - t_up;
                  else if(theLBbound[i] < t_low)
                     theShift += t_low - theLBbound[i];
               }
            }

            for(i = this->nRows(); i-- > 0;)
            {
               if(!isBasic(ds.rowStatus(i)))
               {
                  t_up = -this->lhs(i);
                  t_low = -this->rhs(i);

                  if(theURbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theURbound[i] - t_up;

                  if(t_low > theLRbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLRbound[i];
               }
            }

            for(i = this->nCols(); i-- > 0;)
            {
               if(!isBasic(ds.colStatus(i)))
               {
                  t_up = this->upper(i);
                  t_low = this->lower(i);

                  if(theUCbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theUCbound[i] - t_up;

                  if(t_low > theLCbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLCbound[i];
               }
            }
         }
         else
         {
            assert(rep() == ROW);

            for(i = dim(); i-- > 0;)
            {
               SPxId l_id = this->baseId(i);
               int l_num = this->number(l_id);
               t_up = t_low = 0;

               if(l_id.type() == SPxId::ROW_ID)
                  clearDualBounds(ds.rowStatus(l_num), t_up, t_low);
               else
                  clearDualBounds(ds.colStatus(l_num), t_up, t_low);

               if(theUBbound[i] != theLBbound[i])
               {
                  if(theUBbound[i] > t_up)
                     theShift += theUBbound[i] - t_up;
                  else
                     theShift -= theUBbound[i] - t_up;
               }
               else
               {
                  /* if the basic (primal or dual) variable is fixed (e.g., basis status P_FREE in row representation)
                   * then shiftFvec() and shiftPvec() do not relax the bounds, but shift both, hence they may be outside
                   * of [t_low,t_up] */
                  assert(theLBbound[i] == theUBbound[i] || theUBbound[i] >= t_up);
                  assert(theLBbound[i] == theUBbound[i] || theLBbound[i] <= t_low);

                  if((*theFvec)[i] < t_up - eps)
                     theUBbound[i] = t_up;
                  else if((*theFvec)[i] > t_up)
                     theShift += theUBbound[i] - t_up;

                  if((*theFvec)[i] > t_low + eps)
                     theLBbound[i] = t_low;
                  else if((*theFvec)[i] < t_low)
                     theShift -= theLBbound[i] - t_low;
               }
            }

            for(i = this->nRows(); i-- > 0;)
            {
               if(!isBasic(ds.rowStatus(i)))
               {
                  t_up = t_low = 0;
                  clearDualBounds(ds.rowStatus(i), t_up, t_low);

                  if(theURbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theURbound[i] - t_up;

                  if(t_low > theLRbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLRbound[i];
               }
            }

            for(i = this->nCols(); i-- > 0;)
            {
               if(!isBasic(ds.colStatus(i)))
               {
                  t_up = t_low = 0;
                  clearDualBounds(ds.colStatus(i), t_up, t_low);

                  if(theUCbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theUCbound[i] - t_up;

                  if(t_low > theLCbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLCbound[i];
               }
            }
         }
      }
      else
      {
         assert(type() == LEAVE);

         R eps = leavetol();

         if(rep() == COLUMN)
         {
            for(i = this->nRows(); i-- > 0;)
            {
               t_up = t_low = this->maxRowObj(i);
               clearDualBounds(ds.rowStatus(i), t_up, t_low);

               if(!isBasic(ds.rowStatus(i)))
               {
                  if((*theCoPvec)[i] < t_up + eps)
                  {
                     theURbound[i] = t_up; // reset bound to original value

                     if(t_up == t_low)
                        theLRbound[i] = t_low; // for fixed rows we change both bounds
                  }
                  else
                     theShift += theURbound[i] - t_up;

                  if((*theCoPvec)[i] > t_low - eps)
                  {
                     theLRbound[i] = t_low; // reset bound to original value

                     if(t_up == t_low)
                        theURbound[i] = t_up; // for fixed rows we change both bounds
                  }
                  else
                     theShift += t_low - theLRbound[i];
               }
               else if(theURbound[i] > t_up)
                  theShift += theURbound[i] - t_up;
               else if(theLRbound[i] < t_low)
                  theShift += t_low - theLRbound[i];
            }

            for(i = this->nCols(); i-- > 0;)
            {
               t_up = t_low = -this->maxObj(i);
               clearDualBounds(ds.colStatus(i), t_low, t_up);

               if(!isBasic(ds.colStatus(i)))
               {
                  if((*thePvec)[i] < -t_up + eps)
                  {
                     theUCbound[i] = -t_up; // reset bound to original value

                     if(t_up == t_low)
                        theLCbound[i] = -t_low; // for fixed variables we change both bounds
                  }
                  else
                     theShift += theUCbound[i] - (-t_up);

                  if((*thePvec)[i] > -t_low - eps)
                  {
                     theLCbound[i] = -t_low; // reset bound to original value

                     if(t_up == t_low)
                        theUCbound[i] = -t_up; // for fixed variables we change both bounds
                  }
                  else
                     theShift += (-t_low) - theLCbound[i];
               }
               else if(theUCbound[i] > -t_up)
                  theShift += theUCbound[i] - (-t_up);
               else if(theLCbound[i] < -t_low)
                  theShift += (-t_low) - theLCbound[i];
            }
         }
         else
         {
            assert(rep() == ROW);

            for(i = this->nRows(); i-- > 0;)
            {
               t_up = this->rhs(i);
               t_low = this->lhs(i);

               if(t_up == t_low)
               {
                  if(theURbound[i] > t_up)
                     theShift += theURbound[i] - t_up;
                  else
                     theShift += t_low - theLRbound[i];
               }
               else if(!isBasic(ds.rowStatus(i)))
               {
                  if((*thePvec)[i] < t_up + eps)
                     theURbound[i] = t_up; // reset bound to original value
                  else
                     theShift += theURbound[i] - t_up;

                  if((*thePvec)[i] > t_low - eps)
                     theLRbound[i] = t_low; // reset bound to original value
                  else
                     theShift += t_low - theLRbound[i];
               }
               else if(theURbound[i] > t_up)
                  theShift += theURbound[i] - t_up;
               else if(theLRbound[i] < t_low)
                  theShift += t_low - theLRbound[i];
            }

            for(i = this->nCols(); i-- > 0;)
            {
               t_up = this->upper(i);
               t_low = this->lower(i);

               if(t_up == t_low)
               {
                  if(theUCbound[i] > t_up)
                     theShift += theUCbound[i] - t_up;
                  else
                     theShift += t_low - theLCbound[i];
               }
               else if(!isBasic(ds.colStatus(i)))
               {
                  if((*theCoPvec)[i] < t_up + eps)
                     theUCbound[i] = t_up; // reset bound to original value
                  else
                     theShift += theUCbound[i] - t_up;

                  if((*theCoPvec)[i] > t_low - eps)
                     theLCbound[i] = t_low; // reset bound to original value
                  else
                     theShift += t_low - theLCbound[i];
               }
               else if(theUCbound[i] > t_up)
                  theShift += theUCbound[i] - t_up;
               else if(theLCbound[i] < t_low)
                  theShift += t_low - theLCbound[i];
            }
         }
      }
   }
}